

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  RTCRayQueryContext *pRVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  bool bVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  bool bVar73;
  undefined1 auVar74 [12];
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  uint uVar97;
  ulong uVar98;
  byte bVar99;
  ulong uVar100;
  long lVar101;
  uint uVar102;
  long lVar103;
  ulong uVar104;
  ulong uVar105;
  float fVar106;
  float fVar137;
  float fVar138;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar140;
  undefined1 auVar122 [32];
  float fVar139;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar141;
  float fVar178;
  float fVar180;
  vint4 bi_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar142;
  float fVar143;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar186;
  float fVar210;
  float fVar211;
  vint4 bi;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar217;
  float fVar230;
  float fVar231;
  vint4 ai_1;
  undefined1 auVar218 [16];
  float fVar232;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [28];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar233;
  float fVar249;
  float fVar251;
  vint4 ai_2;
  undefined1 auVar234 [16];
  float fVar252;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar250;
  float fVar254;
  float fVar255;
  undefined1 auVar244 [28];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar247 [32];
  float fVar253;
  undefined1 auVar248 [64];
  float fVar256;
  float fVar257;
  float fVar268;
  float fVar270;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar272;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar277;
  float fVar288;
  float fVar290;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [16];
  float fVar292;
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar284 [32];
  undefined1 auVar282 [16];
  float fVar289;
  float fVar291;
  float fVar293;
  float fVar295;
  float fVar297;
  float fVar299;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar300;
  float fVar313;
  float fVar314;
  vint4 ai;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  float fVar325;
  undefined1 auVar308 [32];
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar323;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  float s;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar341 [16];
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  float fVar380;
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  float t;
  undefined1 auVar381 [16];
  float fVar385;
  undefined1 auVar382 [32];
  float fVar384;
  undefined1 auVar383 [64];
  float fVar386;
  float fVar387;
  float fVar392;
  float fVar394;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  float fVar393;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  float fVar406;
  float fVar416;
  float fVar420;
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  float fVar407;
  float fVar422;
  float fVar423;
  float fVar425;
  float fVar427;
  float fVar429;
  undefined1 auVar411 [32];
  float fVar417;
  float fVar421;
  float fVar424;
  float fVar426;
  float fVar428;
  float fVar430;
  undefined1 auVar412 [32];
  float fVar408;
  float fVar418;
  undefined1 auVar413 [32];
  float fVar419;
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  float fVar431;
  float fVar435;
  float fVar436;
  undefined1 auVar432 [16];
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  float fVar442;
  float fVar444;
  float fVar445;
  float fVar446;
  float fVar447;
  float fVar448;
  float fVar449;
  undefined1 auVar443 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_cc9;
  float local_ca0;
  undefined1 local_c40 [8];
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 local_ad0 [8];
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined8 *local_a10;
  undefined8 *local_a08;
  undefined1 (*local_a00) [32];
  ulong local_9f8;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  Primitive *local_870;
  ulong local_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  ulong local_720;
  undefined1 auStack_718 [24];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640 [4];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620 [4];
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  uint local_4e0;
  uint uStack_4dc;
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar9 = prim[1];
  uVar105 = (ulong)(byte)PVar9;
  lVar101 = uVar105 * 0x25;
  auVar149 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar149 = vinsertps_avx(auVar149,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar141 = *(float *)(prim + lVar101 + 0x12);
  auVar149 = vsubps_avx(auVar149,*(undefined1 (*) [16])(prim + lVar101 + 6));
  auVar144._0_4_ = fVar141 * auVar149._0_4_;
  auVar144._4_4_ = fVar141 * auVar149._4_4_;
  auVar144._8_4_ = fVar141 * auVar149._8_4_;
  auVar144._12_4_ = fVar141 * auVar149._12_4_;
  auVar301._0_4_ = fVar141 * auVar16._0_4_;
  auVar301._4_4_ = fVar141 * auVar16._4_4_;
  auVar301._8_4_ = fVar141 * auVar16._8_4_;
  auVar301._12_4_ = fVar141 * auVar16._12_4_;
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 6)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xf + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar105 + 6)));
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1a + 6)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1b + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1c + 6)));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar155 = vshufps_avx(auVar301,auVar301,0);
  auVar158 = vshufps_avx(auVar301,auVar301,0x55);
  auVar19 = vshufps_avx(auVar301,auVar301,0xaa);
  fVar141 = auVar19._0_4_;
  fVar143 = auVar19._4_4_;
  fVar179 = auVar19._8_4_;
  fVar181 = auVar19._12_4_;
  fVar233 = auVar158._0_4_;
  fVar249 = auVar158._4_4_;
  fVar251 = auVar158._8_4_;
  fVar252 = auVar158._12_4_;
  fVar217 = auVar155._0_4_;
  fVar230 = auVar155._4_4_;
  fVar231 = auVar155._8_4_;
  fVar232 = auVar155._12_4_;
  auVar388._0_4_ = fVar217 * auVar149._0_4_ + fVar233 * auVar16._0_4_ + fVar141 * auVar17._0_4_;
  auVar388._4_4_ = fVar230 * auVar149._4_4_ + fVar249 * auVar16._4_4_ + fVar143 * auVar17._4_4_;
  auVar388._8_4_ = fVar231 * auVar149._8_4_ + fVar251 * auVar16._8_4_ + fVar179 * auVar17._8_4_;
  auVar388._12_4_ = fVar232 * auVar149._12_4_ + fVar252 * auVar16._12_4_ + fVar181 * auVar17._12_4_;
  auVar409._0_4_ = fVar217 * auVar18._0_4_ + fVar233 * auVar152._0_4_ + auVar159._0_4_ * fVar141;
  auVar409._4_4_ = fVar230 * auVar18._4_4_ + fVar249 * auVar152._4_4_ + auVar159._4_4_ * fVar143;
  auVar409._8_4_ = fVar231 * auVar18._8_4_ + fVar251 * auVar152._8_4_ + auVar159._8_4_ * fVar179;
  auVar409._12_4_ = fVar232 * auVar18._12_4_ + fVar252 * auVar152._12_4_ + auVar159._12_4_ * fVar181
  ;
  auVar302._0_4_ = fVar217 * auVar117._0_4_ + fVar233 * auVar116._0_4_ + auVar196._0_4_ * fVar141;
  auVar302._4_4_ = fVar230 * auVar117._4_4_ + fVar249 * auVar116._4_4_ + auVar196._4_4_ * fVar143;
  auVar302._8_4_ = fVar231 * auVar117._8_4_ + fVar251 * auVar116._8_4_ + auVar196._8_4_ * fVar179;
  auVar302._12_4_ =
       fVar232 * auVar117._12_4_ + fVar252 * auVar116._12_4_ + auVar196._12_4_ * fVar181;
  auVar155 = vshufps_avx(auVar144,auVar144,0);
  auVar158 = vshufps_avx(auVar144,auVar144,0x55);
  auVar19 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar141 = auVar19._0_4_;
  fVar143 = auVar19._4_4_;
  fVar179 = auVar19._8_4_;
  fVar181 = auVar19._12_4_;
  fVar233 = auVar158._0_4_;
  fVar249 = auVar158._4_4_;
  fVar251 = auVar158._8_4_;
  fVar252 = auVar158._12_4_;
  fVar217 = auVar155._0_4_;
  fVar230 = auVar155._4_4_;
  fVar231 = auVar155._8_4_;
  fVar232 = auVar155._12_4_;
  auVar187._0_4_ = fVar217 * auVar149._0_4_ + fVar233 * auVar16._0_4_ + fVar141 * auVar17._0_4_;
  auVar187._4_4_ = fVar230 * auVar149._4_4_ + fVar249 * auVar16._4_4_ + fVar143 * auVar17._4_4_;
  auVar187._8_4_ = fVar231 * auVar149._8_4_ + fVar251 * auVar16._8_4_ + fVar179 * auVar17._8_4_;
  auVar187._12_4_ = fVar232 * auVar149._12_4_ + fVar252 * auVar16._12_4_ + fVar181 * auVar17._12_4_;
  auVar145._0_4_ = fVar217 * auVar18._0_4_ + auVar159._0_4_ * fVar141 + fVar233 * auVar152._0_4_;
  auVar145._4_4_ = fVar230 * auVar18._4_4_ + auVar159._4_4_ * fVar143 + fVar249 * auVar152._4_4_;
  auVar145._8_4_ = fVar231 * auVar18._8_4_ + auVar159._8_4_ * fVar179 + fVar251 * auVar152._8_4_;
  auVar145._12_4_ = fVar232 * auVar18._12_4_ + auVar159._12_4_ * fVar181 + fVar252 * auVar152._12_4_
  ;
  auVar107._0_4_ = fVar217 * auVar117._0_4_ + fVar233 * auVar116._0_4_ + auVar196._0_4_ * fVar141;
  auVar107._4_4_ = fVar230 * auVar117._4_4_ + fVar249 * auVar116._4_4_ + auVar196._4_4_ * fVar143;
  auVar107._8_4_ = fVar231 * auVar117._8_4_ + fVar251 * auVar116._8_4_ + auVar196._8_4_ * fVar179;
  auVar107._12_4_ =
       fVar232 * auVar117._12_4_ + fVar252 * auVar116._12_4_ + auVar196._12_4_ * fVar181;
  auVar278._8_4_ = 0x7fffffff;
  auVar278._0_8_ = 0x7fffffff7fffffff;
  auVar278._12_4_ = 0x7fffffff;
  auVar149 = vandps_avx(auVar388,auVar278);
  auVar234._8_4_ = 0x219392ef;
  auVar234._0_8_ = 0x219392ef219392ef;
  auVar234._12_4_ = 0x219392ef;
  auVar149 = vcmpps_avx(auVar149,auVar234,1);
  auVar16 = vblendvps_avx(auVar388,auVar234,auVar149);
  auVar149 = vandps_avx(auVar409,auVar278);
  auVar149 = vcmpps_avx(auVar149,auVar234,1);
  auVar17 = vblendvps_avx(auVar409,auVar234,auVar149);
  auVar149 = vandps_avx(auVar302,auVar278);
  auVar149 = vcmpps_avx(auVar149,auVar234,1);
  auVar149 = vblendvps_avx(auVar302,auVar234,auVar149);
  auVar18 = vrcpps_avx(auVar16);
  fVar217 = auVar18._0_4_;
  auVar218._0_4_ = fVar217 * auVar16._0_4_;
  fVar230 = auVar18._4_4_;
  auVar218._4_4_ = fVar230 * auVar16._4_4_;
  fVar231 = auVar18._8_4_;
  auVar218._8_4_ = fVar231 * auVar16._8_4_;
  fVar232 = auVar18._12_4_;
  auVar218._12_4_ = fVar232 * auVar16._12_4_;
  auVar303._8_4_ = 0x3f800000;
  auVar303._0_8_ = &DAT_3f8000003f800000;
  auVar303._12_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar303,auVar218);
  fVar217 = fVar217 + fVar217 * auVar16._0_4_;
  fVar230 = fVar230 + fVar230 * auVar16._4_4_;
  fVar231 = fVar231 + fVar231 * auVar16._8_4_;
  fVar232 = fVar232 + fVar232 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar17);
  fVar233 = auVar16._0_4_;
  auVar258._0_4_ = fVar233 * auVar17._0_4_;
  fVar249 = auVar16._4_4_;
  auVar258._4_4_ = fVar249 * auVar17._4_4_;
  fVar251 = auVar16._8_4_;
  auVar258._8_4_ = fVar251 * auVar17._8_4_;
  fVar252 = auVar16._12_4_;
  auVar258._12_4_ = fVar252 * auVar17._12_4_;
  auVar16 = vsubps_avx(auVar303,auVar258);
  fVar233 = fVar233 + fVar233 * auVar16._0_4_;
  fVar249 = fVar249 + fVar249 * auVar16._4_4_;
  fVar251 = fVar251 + fVar251 * auVar16._8_4_;
  fVar252 = fVar252 + fVar252 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar149);
  fVar256 = auVar16._0_4_;
  auVar279._0_4_ = fVar256 * auVar149._0_4_;
  fVar268 = auVar16._4_4_;
  auVar279._4_4_ = fVar268 * auVar149._4_4_;
  fVar270 = auVar16._8_4_;
  auVar279._8_4_ = fVar270 * auVar149._8_4_;
  fVar272 = auVar16._12_4_;
  auVar279._12_4_ = fVar272 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar303,auVar279);
  fVar256 = fVar256 + fVar256 * auVar149._0_4_;
  fVar268 = fVar268 + fVar268 * auVar149._4_4_;
  fVar270 = fVar270 + fVar270 * auVar149._8_4_;
  fVar272 = fVar272 + fVar272 * auVar149._12_4_;
  auVar149 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar101 + 0x16)) *
                           *(float *)(prim + lVar101 + 0x1a)));
  auVar17 = vshufps_avx(auVar149,auVar149,0);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar105 * 7 + 6);
  auVar149 = vpmovsxwd_avx(auVar149);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar149);
  fVar141 = auVar17._0_4_;
  fVar143 = auVar17._4_4_;
  fVar179 = auVar17._8_4_;
  fVar181 = auVar17._12_4_;
  auVar304._0_4_ = auVar16._0_4_ * fVar141 + auVar149._0_4_;
  auVar304._4_4_ = auVar16._4_4_ * fVar143 + auVar149._4_4_;
  auVar304._8_4_ = auVar16._8_4_ * fVar179 + auVar149._8_4_;
  auVar304._12_4_ = auVar16._12_4_ * fVar181 + auVar149._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar105 * 9 + 6);
  auVar149 = vpmovsxwd_avx(auVar17);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar105 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar149);
  auVar326._0_4_ = auVar16._0_4_ * fVar141 + auVar149._0_4_;
  auVar326._4_4_ = auVar16._4_4_ * fVar143 + auVar149._4_4_;
  auVar326._8_4_ = auVar16._8_4_ * fVar179 + auVar149._8_4_;
  auVar326._12_4_ = auVar16._12_4_ * fVar181 + auVar149._12_4_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar105 * 0x12 + 6);
  auVar149 = vpmovsxwd_avx(auVar152);
  auVar149 = vcvtdq2ps_avx(auVar149);
  uVar98 = (ulong)(uint)((int)(uVar105 * 5) << 2);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar105 * 2 + uVar98 + 6);
  auVar16 = vpmovsxwd_avx(auVar159);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar149);
  auVar341._0_4_ = auVar16._0_4_ * fVar141 + auVar149._0_4_;
  auVar341._4_4_ = auVar16._4_4_ * fVar143 + auVar149._4_4_;
  auVar341._8_4_ = auVar16._8_4_ * fVar179 + auVar149._8_4_;
  auVar341._12_4_ = auVar16._12_4_ * fVar181 + auVar149._12_4_;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar98 + 6);
  auVar149 = vpmovsxwd_avx(auVar117);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar105 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar116);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar149);
  auVar375._0_4_ = auVar16._0_4_ * fVar141 + auVar149._0_4_;
  auVar375._4_4_ = auVar16._4_4_ * fVar143 + auVar149._4_4_;
  auVar375._8_4_ = auVar16._8_4_ * fVar179 + auVar149._8_4_;
  auVar375._12_4_ = auVar16._12_4_ * fVar181 + auVar149._12_4_;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar105 * 0x1d + 6);
  auVar149 = vpmovsxwd_avx(auVar196);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar105 + (ulong)(byte)PVar9 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar155);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vsubps_avx(auVar16,auVar149);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar9 * 0x20 - uVar105) + 6);
  auVar16 = vpmovsxwd_avx(auVar158);
  auVar381._0_4_ = auVar17._0_4_ * fVar141 + auVar149._0_4_;
  auVar381._4_4_ = auVar17._4_4_ * fVar143 + auVar149._4_4_;
  auVar381._8_4_ = auVar17._8_4_ * fVar179 + auVar149._8_4_;
  auVar381._12_4_ = auVar17._12_4_ * fVar181 + auVar149._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar105 * 0x23 + 6);
  auVar17 = vpmovsxwd_avx(auVar19);
  auVar149 = vcvtdq2ps_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar17);
  auVar16 = vsubps_avx(auVar16,auVar149);
  auVar280._0_4_ = auVar149._0_4_ + auVar16._0_4_ * fVar141;
  auVar280._4_4_ = auVar149._4_4_ + auVar16._4_4_ * fVar143;
  auVar280._8_4_ = auVar149._8_4_ + auVar16._8_4_ * fVar179;
  auVar280._12_4_ = auVar149._12_4_ + auVar16._12_4_ * fVar181;
  auVar149 = vsubps_avx(auVar304,auVar187);
  auVar305._0_4_ = fVar217 * auVar149._0_4_;
  auVar305._4_4_ = fVar230 * auVar149._4_4_;
  auVar305._8_4_ = fVar231 * auVar149._8_4_;
  auVar305._12_4_ = fVar232 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar326,auVar187);
  auVar188._0_4_ = fVar217 * auVar149._0_4_;
  auVar188._4_4_ = fVar230 * auVar149._4_4_;
  auVar188._8_4_ = fVar231 * auVar149._8_4_;
  auVar188._12_4_ = fVar232 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar341,auVar145);
  auVar219._0_4_ = fVar233 * auVar149._0_4_;
  auVar219._4_4_ = fVar249 * auVar149._4_4_;
  auVar219._8_4_ = fVar251 * auVar149._8_4_;
  auVar219._12_4_ = fVar252 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar375,auVar145);
  auVar146._0_4_ = fVar233 * auVar149._0_4_;
  auVar146._4_4_ = fVar249 * auVar149._4_4_;
  auVar146._8_4_ = fVar251 * auVar149._8_4_;
  auVar146._12_4_ = fVar252 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar381,auVar107);
  auVar235._0_4_ = fVar256 * auVar149._0_4_;
  auVar235._4_4_ = fVar268 * auVar149._4_4_;
  auVar235._8_4_ = fVar270 * auVar149._8_4_;
  auVar235._12_4_ = fVar272 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar280,auVar107);
  auVar108._0_4_ = fVar256 * auVar149._0_4_;
  auVar108._4_4_ = fVar268 * auVar149._4_4_;
  auVar108._8_4_ = fVar270 * auVar149._8_4_;
  auVar108._12_4_ = fVar272 * auVar149._12_4_;
  auVar149 = vpminsd_avx(auVar305,auVar188);
  auVar16 = vpminsd_avx(auVar219,auVar146);
  auVar149 = vmaxps_avx(auVar149,auVar16);
  auVar16 = vpminsd_avx(auVar235,auVar108);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar327._4_4_ = uVar7;
  auVar327._0_4_ = uVar7;
  auVar327._8_4_ = uVar7;
  auVar327._12_4_ = uVar7;
  auVar16 = vmaxps_avx(auVar16,auVar327);
  auVar149 = vmaxps_avx(auVar149,auVar16);
  local_5f0._0_4_ = auVar149._0_4_ * 0.99999964;
  local_5f0._4_4_ = auVar149._4_4_ * 0.99999964;
  local_5f0._8_4_ = auVar149._8_4_ * 0.99999964;
  local_5f0._12_4_ = auVar149._12_4_ * 0.99999964;
  auVar149 = vpmaxsd_avx(auVar305,auVar188);
  auVar16 = vpmaxsd_avx(auVar219,auVar146);
  auVar149 = vminps_avx(auVar149,auVar16);
  auVar16 = vpmaxsd_avx(auVar235,auVar108);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar189._4_4_ = uVar7;
  auVar189._0_4_ = uVar7;
  auVar189._8_4_ = uVar7;
  auVar189._12_4_ = uVar7;
  auVar16 = vminps_avx(auVar16,auVar189);
  auVar149 = vminps_avx(auVar149,auVar16);
  auVar109._0_4_ = auVar149._0_4_ * 1.0000004;
  auVar109._4_4_ = auVar149._4_4_ * 1.0000004;
  auVar109._8_4_ = auVar149._8_4_ * 1.0000004;
  auVar109._12_4_ = auVar149._12_4_ * 1.0000004;
  auVar149 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar16 = vpcmpgtd_avx(auVar149,_DAT_01ff0cf0);
  auVar149 = vcmpps_avx(local_5f0,auVar109,2);
  auVar149 = vandps_avx(auVar149,auVar16);
  uVar96 = vmovmskps_avx(auVar149);
  local_cc9 = uVar96 != 0;
  if (uVar96 == 0) {
    return local_cc9;
  }
  auVar129._16_16_ = mm_lookupmask_ps._240_16_;
  auVar129._0_16_ = mm_lookupmask_ps._240_16_;
  uVar96 = uVar96 & 0xff;
  local_420 = vblendps_avx(auVar129,ZEXT832(0) << 0x20,0x80);
  uVar97 = 1 << ((byte)k & 0x1f);
  local_a00 = (undefined1 (*) [32])&local_500;
  local_a08 = (undefined8 *)(mm_lookupmask_ps + ((uVar97 & 0xf) << 4));
  local_a10 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar97 >> 4) * 0x10);
  local_870 = prim;
LAB_01076984:
  local_868 = (ulong)uVar96;
  lVar101 = 0;
  if (local_868 != 0) {
    for (; (uVar96 >> lVar101 & 1) == 0; lVar101 = lVar101 + 1) {
    }
  }
  uVar100 = (ulong)*(uint *)(local_870 + 2);
  pGVar10 = (context->scene->geometries).items[uVar100].ptr;
  uVar105 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                            (ulong)*(uint *)(local_870 + lVar101 * 4 + 6) *
                            pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar141 = (pGVar10->time_range).lower;
  fVar141 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar141) / ((pGVar10->time_range).upper - fVar141));
  auVar149 = vroundss_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),9);
  auVar149 = vminss_avx(auVar149,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar149 = vmaxss_avx(ZEXT816(0) << 0x20,auVar149);
  fVar141 = fVar141 - auVar149._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar103 = (long)(int)auVar149._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + lVar103);
  lVar13 = *(long *)(_Var11 + 0x10 + lVar103);
  auVar149 = vshufps_avx(ZEXT416((uint)(1.0 - fVar141)),ZEXT416((uint)(1.0 - fVar141)),0);
  pfVar1 = (float *)(lVar12 + lVar13 * uVar105);
  fVar217 = auVar149._0_4_;
  fVar230 = auVar149._4_4_;
  fVar231 = auVar149._8_4_;
  fVar232 = auVar149._12_4_;
  pfVar2 = (float *)(lVar12 + lVar13 * (uVar105 + 1));
  pfVar3 = (float *)(lVar12 + lVar13 * (uVar105 + 2));
  pfVar4 = (float *)(lVar12 + lVar13 * (uVar105 + 3));
  lVar12 = *(long *)(_Var11 + 0x38 + lVar103);
  lVar13 = *(long *)(_Var11 + 0x48 + lVar103);
  auVar149 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
  pfVar5 = (float *)(lVar12 + uVar105 * lVar13);
  fVar233 = auVar149._0_4_;
  fVar249 = auVar149._4_4_;
  fVar251 = auVar149._8_4_;
  fVar252 = auVar149._12_4_;
  pfVar6 = (float *)(lVar12 + (uVar105 + 1) * lVar13);
  auVar220._0_4_ = fVar233 * *pfVar5 + fVar217 * *pfVar1;
  auVar220._4_4_ = fVar249 * pfVar5[1] + fVar230 * pfVar1[1];
  auVar220._8_4_ = fVar251 * pfVar5[2] + fVar231 * pfVar1[2];
  auVar220._12_4_ = fVar252 * pfVar5[3] + fVar232 * pfVar1[3];
  auVar149 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar16 = vinsertps_avx(auVar149,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar141 = *(float *)(ray + k * 4 + 0x80);
  auVar389._4_4_ = fVar141;
  auVar389._0_4_ = fVar141;
  auVar389._8_4_ = fVar141;
  auVar389._12_4_ = fVar141;
  fStack_ab0 = fVar141;
  _local_ac0 = auVar389;
  fStack_aac = fVar141;
  fStack_aa8 = fVar141;
  fStack_aa4 = fVar141;
  fVar143 = *(float *)(ray + k * 4 + 0xa0);
  auVar410._4_4_ = fVar143;
  auVar410._0_4_ = fVar143;
  auVar410._8_4_ = fVar143;
  auVar410._12_4_ = fVar143;
  fStack_8b0 = fVar143;
  _local_8c0 = auVar410;
  fStack_8ac = fVar143;
  fStack_8a8 = fVar143;
  fStack_8a4 = fVar143;
  auVar190._0_4_ = fVar217 * *pfVar2 + fVar233 * *pfVar6;
  auVar190._4_4_ = fVar230 * pfVar2[1] + fVar249 * pfVar6[1];
  auVar190._8_4_ = fVar231 * pfVar2[2] + fVar251 * pfVar6[2];
  auVar190._12_4_ = fVar232 * pfVar2[3] + fVar252 * pfVar6[3];
  auVar149 = vunpcklps_avx(auVar389,auVar410);
  fVar179 = *(float *)(ray + k * 4 + 0xc0);
  auVar432._4_4_ = fVar179;
  auVar432._0_4_ = fVar179;
  auVar432._8_4_ = fVar179;
  auVar432._12_4_ = fVar179;
  fStack_8d0 = fVar179;
  _local_8e0 = auVar432;
  fStack_8cc = fVar179;
  fStack_8c8 = fVar179;
  fStack_8c4 = fVar179;
  _local_970 = vinsertps_avx(auVar149,auVar432,0x28);
  auVar110._0_4_ = (auVar220._0_4_ + auVar190._0_4_) * 0.5;
  auVar110._4_4_ = (auVar220._4_4_ + auVar190._4_4_) * 0.5;
  auVar110._8_4_ = (auVar220._8_4_ + auVar190._8_4_) * 0.5;
  auVar110._12_4_ = (auVar220._12_4_ + auVar190._12_4_) * 0.5;
  auVar149 = vsubps_avx(auVar110,auVar16);
  auVar149 = vdpps_avx(auVar149,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar383 = ZEXT1664(local_980);
  pfVar1 = (float *)(lVar12 + (uVar105 + 2) * lVar13);
  auVar147._0_4_ = fVar217 * *pfVar3 + fVar233 * *pfVar1;
  auVar147._4_4_ = fVar230 * pfVar3[1] + fVar249 * pfVar1[1];
  auVar147._8_4_ = fVar231 * pfVar3[2] + fVar251 * pfVar1[2];
  auVar147._12_4_ = fVar232 * pfVar3[3] + fVar252 * pfVar1[3];
  auVar17 = vrcpss_avx(local_980,local_980);
  fVar181 = auVar149._0_4_ * (2.0 - local_980._0_4_ * auVar17._0_4_) * auVar17._0_4_;
  auVar334 = ZEXT464((uint)fVar181);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar181),0);
  auVar281._0_4_ = auVar16._0_4_ + local_970._0_4_ * auVar17._0_4_;
  auVar281._4_4_ = auVar16._4_4_ + local_970._4_4_ * auVar17._4_4_;
  auVar281._8_4_ = auVar16._8_4_ + local_970._8_4_ * auVar17._8_4_;
  auVar281._12_4_ = auVar16._12_4_ + local_970._12_4_ * auVar17._12_4_;
  auVar149 = vblendps_avx(auVar281,_DAT_01feba10,8);
  _local_ad0 = vsubps_avx(auVar220,auVar149);
  _local_ae0 = vsubps_avx(auVar147,auVar149);
  pfVar1 = (float *)(lVar12 + lVar13 * (uVar105 + 3));
  auVar148._0_4_ = fVar217 * *pfVar4 + fVar233 * *pfVar1;
  auVar148._4_4_ = fVar230 * pfVar4[1] + fVar249 * pfVar1[1];
  auVar148._8_4_ = fVar231 * pfVar4[2] + fVar251 * pfVar1[2];
  auVar148._12_4_ = fVar232 * pfVar4[3] + fVar252 * pfVar1[3];
  auVar248 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  _local_af0 = vsubps_avx(auVar190,auVar149);
  _local_b00 = vsubps_avx(auVar148,auVar149);
  auVar149 = vshufps_avx(_local_ad0,_local_ad0,0);
  register0x00001250 = auVar149;
  _local_300 = auVar149;
  auVar149 = vshufps_avx(_local_ad0,_local_ad0,0x55);
  register0x00001250 = auVar149;
  _local_1a0 = auVar149;
  auVar149 = vshufps_avx(_local_ad0,_local_ad0,0xaa);
  register0x00001250 = auVar149;
  _local_1c0 = auVar149;
  auVar149 = vshufps_avx(_local_ad0,_local_ad0,0xff);
  register0x00001290 = auVar149;
  _local_1e0 = auVar149;
  auVar149 = vshufps_avx(_local_af0,_local_af0,0);
  register0x00001290 = auVar149;
  _local_320 = auVar149;
  auVar149 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001290 = auVar149;
  _local_340 = auVar149;
  auVar149 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar149;
  _local_360 = auVar149;
  auVar149 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar149;
  _local_380 = auVar149;
  auVar16 = vshufps_avx(_local_ae0,_local_ae0,0);
  auVar149 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001290 = auVar149;
  _local_3a0 = auVar149;
  auVar149 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001290 = auVar149;
  _local_3c0 = auVar149;
  auVar149 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar149;
  _local_3e0 = auVar149;
  auVar149 = vshufps_avx(_local_b00,_local_b00,0);
  local_820._16_16_ = auVar149;
  local_820._0_16_ = auVar149;
  auVar379 = ZEXT3264(local_820);
  auVar18 = vshufps_avx(_local_b00,_local_b00,0x55);
  auVar149 = vshufps_avx(_local_b00,_local_b00,0xaa);
  register0x00001290 = auVar149;
  _local_400 = auVar149;
  auVar149 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar149;
  _local_200 = auVar149;
  auVar149 = ZEXT416((uint)(fVar141 * fVar141 + fVar143 * fVar143 + fVar179 * fVar179));
  auVar149 = vshufps_avx(auVar149,auVar149,0);
  local_220._16_16_ = auVar149;
  local_220._0_16_ = auVar149;
  fVar141 = *(float *)(ray + k * 4 + 0x60);
  local_890 = ZEXT416((uint)fVar181);
  auVar149 = vshufps_avx(ZEXT416((uint)(fVar141 - fVar181)),ZEXT416((uint)(fVar141 - fVar181)),0);
  local_260._16_16_ = auVar149;
  local_260._0_16_ = auVar149;
  auVar149 = vpshufd_avx(ZEXT416(*(uint *)(local_870 + 2)),0);
  local_460._16_16_ = auVar149;
  local_460._0_16_ = auVar149;
  auVar149 = vpshufd_avx(ZEXT416(*(uint *)(local_870 + lVar101 * 4 + 6)),0);
  local_480._16_16_ = auVar149;
  local_480._0_16_ = auVar149;
  register0x00001210 = auVar17;
  _local_9a0 = auVar17;
  uVar98 = 0;
  uVar104 = 0;
  uVar105 = 1;
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_220,auVar122);
  auVar149 = vsqrtss_avx(local_980,local_980);
  auVar17 = vsqrtss_avx(local_980,local_980);
  local_880 = ZEXT816(0x3f80000000000000);
  local_9f8 = uVar100;
  do {
    auVar152 = vmovshdup_avx(local_880);
    fVar233 = auVar152._0_4_ - local_880._0_4_;
    auVar152 = vshufps_avx(local_880,local_880,0);
    local_9c0._16_16_ = auVar152;
    local_9c0._0_16_ = auVar152;
    auVar159 = vshufps_avx(ZEXT416((uint)fVar233),ZEXT416((uint)fVar233),0);
    local_900._16_16_ = auVar159;
    local_900._0_16_ = auVar159;
    fVar142 = auVar159._0_4_;
    fVar178 = auVar159._4_4_;
    fVar180 = auVar159._8_4_;
    fVar182 = auVar159._12_4_;
    fVar106 = auVar152._0_4_;
    auVar226._0_4_ = fVar106 + fVar142 * 0.0;
    fVar137 = auVar152._4_4_;
    auVar226._4_4_ = fVar137 + fVar178 * 0.14285715;
    fVar138 = auVar152._8_4_;
    auVar226._8_4_ = fVar138 + fVar180 * 0.2857143;
    fStack_c24 = auVar152._12_4_;
    auVar226._12_4_ = fStack_c24 + fVar182 * 0.42857146;
    auVar226._16_4_ = fVar106 + fVar142 * 0.5714286;
    auVar226._20_4_ = fVar137 + fVar178 * 0.71428573;
    auVar226._24_4_ = fVar138 + fVar180 * 0.8571429;
    auVar226._28_4_ = fStack_c24 + fVar182;
    auVar129 = vsubps_avx(auVar248._0_32_,auVar226);
    local_c40._4_4_ = auVar226._4_4_ * auVar226._4_4_;
    local_c40._0_4_ = auVar226._0_4_ * auVar226._0_4_;
    fStack_c38 = auVar226._8_4_ * auVar226._8_4_;
    fStack_c34 = auVar226._12_4_ * auVar226._12_4_;
    fStack_c30 = auVar226._16_4_ * auVar226._16_4_;
    fStack_c2c = auVar226._20_4_ * auVar226._20_4_;
    fStack_c28 = auVar226._24_4_ * auVar226._24_4_;
    fVar251 = auVar226._0_4_ * 3.0;
    fVar252 = auVar226._4_4_ * 3.0;
    fVar268 = auVar226._8_4_ * 3.0;
    fVar270 = auVar226._12_4_ * 3.0;
    fVar272 = auVar226._16_4_ * 3.0;
    fVar253 = auVar226._20_4_ * 3.0;
    fVar255 = auVar226._24_4_ * 3.0;
    fVar324 = auVar248._28_4_ + -5.0;
    fVar143 = auVar129._0_4_;
    auVar335._0_4_ = fVar143 * fVar143;
    fVar179 = auVar129._4_4_;
    auVar335._4_4_ = fVar179 * fVar179;
    fVar181 = auVar129._8_4_;
    auVar335._8_4_ = fVar181 * fVar181;
    fVar217 = auVar129._12_4_;
    auVar335._12_4_ = fVar217 * fVar217;
    fVar230 = auVar129._16_4_;
    auVar335._16_4_ = fVar230 * fVar230;
    fVar231 = auVar129._20_4_;
    auVar335._20_4_ = fVar231 * fVar231;
    fVar232 = auVar129._24_4_;
    auVar335._28_36_ = auVar334._28_36_;
    auVar335._24_4_ = fVar232 * fVar232;
    fVar249 = auVar129._28_4_;
    fVar256 = (auVar335._0_4_ * (fVar143 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar288 = (auVar335._4_4_ * (fVar179 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar290 = (auVar335._8_4_ * (fVar181 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar292 = (auVar335._12_4_ * (fVar217 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar294 = (auVar335._16_4_ * (fVar230 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar296 = (auVar335._20_4_ * (fVar231 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar298 = (auVar335._24_4_ * (fVar232 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar336 = -fVar143 * auVar226._0_4_ * auVar226._0_4_ * 0.5;
    fVar342 = -fVar179 * auVar226._4_4_ * auVar226._4_4_ * 0.5;
    fVar347 = -fVar181 * auVar226._8_4_ * auVar226._8_4_ * 0.5;
    fVar352 = -fVar217 * auVar226._12_4_ * auVar226._12_4_ * 0.5;
    fVar357 = -fVar230 * auVar226._16_4_ * auVar226._16_4_ * 0.5;
    fVar362 = -fVar231 * auVar226._20_4_ * auVar226._20_4_ * 0.5;
    fVar367 = -fVar232 * auVar226._24_4_ * auVar226._24_4_ * 0.5;
    fVar419 = auVar18._0_4_;
    fVar250 = auVar18._4_4_;
    fVar394 = auVar18._8_4_;
    fVar397 = auVar18._12_4_;
    fVar254 = auVar16._0_4_;
    fVar139 = auVar16._4_4_;
    fVar140 = auVar16._8_4_;
    fVar422 = auVar16._12_4_;
    fVar380 = auVar379._28_4_ + fVar422;
    fVar385 = auVar383._28_4_ + fVar422;
    fVar406 = (auVar226._0_4_ * auVar226._0_4_ * (fVar251 + -5.0) + 2.0) * 0.5;
    fVar416 = (auVar226._4_4_ * auVar226._4_4_ * (fVar252 + -5.0) + 2.0) * 0.5;
    fVar420 = (auVar226._8_4_ * auVar226._8_4_ * (fVar268 + -5.0) + 2.0) * 0.5;
    fVar423 = (auVar226._12_4_ * auVar226._12_4_ * (fVar270 + -5.0) + 2.0) * 0.5;
    fVar425 = (auVar226._16_4_ * auVar226._16_4_ * (fVar272 + -5.0) + 2.0) * 0.5;
    fVar427 = (auVar226._20_4_ * auVar226._20_4_ * (fVar253 + -5.0) + 2.0) * 0.5;
    fVar429 = (auVar226._24_4_ * auVar226._24_4_ * (fVar255 + -5.0) + 2.0) * 0.5;
    fVar386 = -auVar226._0_4_ * fVar143 * fVar143 * 0.5;
    fVar392 = -auVar226._4_4_ * fVar179 * fVar179 * 0.5;
    fVar395 = -auVar226._8_4_ * fVar181 * fVar181 * 0.5;
    fVar398 = -auVar226._12_4_ * fVar217 * fVar217 * 0.5;
    fVar400 = -auVar226._16_4_ * fVar230 * fVar230 * 0.5;
    fVar402 = -auVar226._20_4_ * fVar231 * fVar231 * 0.5;
    fVar404 = -auVar226._24_4_ * fVar232 * fVar232 * 0.5;
    fVar337 = fVar386 * (float)local_300._0_4_ +
              fVar406 * (float)local_320._0_4_ + auVar379._0_4_ * fVar336 + fVar254 * fVar256;
    fVar343 = fVar392 * (float)local_300._4_4_ +
              fVar416 * (float)local_320._4_4_ + auVar379._4_4_ * fVar342 + fVar139 * fVar288;
    fVar348 = fVar395 * fStack_2f8 +
              fVar420 * fStack_318 + auVar379._8_4_ * fVar347 + fVar140 * fVar290;
    fVar353 = fVar398 * fStack_2f4 +
              fVar423 * fStack_314 + auVar379._12_4_ * fVar352 + fVar422 * fVar292;
    fVar358 = fVar400 * fStack_2f0 +
              fVar425 * fStack_310 + auVar379._16_4_ * fVar357 + fVar254 * fVar294;
    fVar363 = fVar402 * fStack_2ec +
              fVar427 * fStack_30c + auVar379._20_4_ * fVar362 + fVar139 * fVar296;
    fVar368 = fVar404 * fStack_2e8 +
              fVar429 * fStack_308 + auVar379._24_4_ * fVar367 + fVar140 * fVar298;
    fVar372 = fVar422 + 2.0 + -fVar249 + fVar380;
    fVar338 = (float)local_1a0._0_4_ * fVar386 +
              fVar406 * (float)local_340._0_4_ +
              fVar419 * fVar336 + fVar256 * (float)local_3a0._0_4_;
    fVar344 = (float)local_1a0._4_4_ * fVar392 +
              fVar416 * (float)local_340._4_4_ +
              fVar250 * fVar342 + fVar288 * (float)local_3a0._4_4_;
    fVar349 = fStack_198 * fVar395 + fVar420 * fStack_338 + fVar394 * fVar347 + fVar290 * fStack_398
    ;
    fVar354 = fStack_194 * fVar398 + fVar423 * fStack_334 + fVar397 * fVar352 + fVar292 * fStack_394
    ;
    fVar359 = fStack_190 * fVar400 + fVar425 * fStack_330 + fVar419 * fVar357 + fVar294 * fStack_390
    ;
    fVar364 = fStack_18c * fVar402 + fVar427 * fStack_32c + fVar250 * fVar362 + fVar296 * fStack_38c
    ;
    fVar369 = fStack_188 * fVar404 + fVar429 * fStack_328 + fVar394 * fVar367 + fVar298 * fStack_388
    ;
    fVar373 = fVar372 + fVar380 + fVar385;
    fVar186 = (float)local_1c0._0_4_ * fVar386 +
              fVar406 * (float)local_360._0_4_ +
              fVar336 * (float)local_400._0_4_ + fVar256 * (float)local_3c0._0_4_;
    fVar210 = (float)local_1c0._4_4_ * fVar392 +
              fVar416 * (float)local_360._4_4_ +
              fVar342 * (float)local_400._4_4_ + fVar288 * (float)local_3c0._4_4_;
    fVar211 = fStack_1b8 * fVar395 +
              fVar420 * fStack_358 + fVar347 * fStack_3f8 + fVar290 * fStack_3b8;
    fVar212 = fStack_1b4 * fVar398 +
              fVar423 * fStack_354 + fVar352 * fStack_3f4 + fVar292 * fStack_3b4;
    fVar213 = fStack_1b0 * fVar400 +
              fVar425 * fStack_350 + fVar357 * fStack_3f0 + fVar294 * fStack_3b0;
    fVar214 = fStack_1ac * fVar402 +
              fVar427 * fStack_34c + fVar362 * fStack_3ec + fVar296 * fStack_3ac;
    fVar215 = fStack_1a8 * fVar404 +
              fVar429 * fStack_348 + fVar367 * fStack_3e8 + fVar298 * fStack_3a8;
    fVar216 = fVar373 + fVar385 + fVar397 + fVar422;
    local_920._0_4_ =
         (float)local_1e0._0_4_ * fVar386 +
         fVar406 * (float)local_380._0_4_ +
         fVar336 * (float)local_200._0_4_ + fVar256 * (float)local_3e0._0_4_;
    local_920._4_4_ =
         (float)local_1e0._4_4_ * fVar392 +
         fVar416 * (float)local_380._4_4_ +
         fVar342 * (float)local_200._4_4_ + fVar288 * (float)local_3e0._4_4_;
    local_920._8_4_ =
         fStack_1d8 * fVar395 + fVar420 * fStack_378 + fVar347 * fStack_1f8 + fVar290 * fStack_3d8;
    local_920._12_4_ =
         fStack_1d4 * fVar398 + fVar423 * fStack_374 + fVar352 * fStack_1f4 + fVar292 * fStack_3d4;
    local_920._16_4_ =
         fStack_1d0 * fVar400 + fVar425 * fStack_370 + fVar357 * fStack_1f0 + fVar294 * fStack_3d0;
    local_920._20_4_ =
         fStack_1cc * fVar402 + fVar427 * fStack_36c + fVar362 * fStack_1ec + fVar296 * fStack_3cc;
    local_920._24_4_ =
         fStack_1c8 * fVar404 + fVar429 * fStack_368 + fVar367 * fStack_1e8 + fVar298 * fStack_3c8;
    local_920._28_4_ = fVar373 + fVar422 + 2.0 + -fVar249 + -3.0;
    fVar374 = fVar249 + fVar249;
    auVar20._4_4_ = (fVar179 + fVar179) * auVar226._4_4_;
    auVar20._0_4_ = (fVar143 + fVar143) * auVar226._0_4_;
    auVar20._8_4_ = (fVar181 + fVar181) * auVar226._8_4_;
    auVar20._12_4_ = (fVar217 + fVar217) * auVar226._12_4_;
    auVar20._16_4_ = (fVar230 + fVar230) * auVar226._16_4_;
    auVar20._20_4_ = (fVar231 + fVar231) * auVar226._20_4_;
    auVar20._24_4_ = (fVar232 + fVar232) * auVar226._24_4_;
    auVar20._28_4_ = auVar226._28_4_ + auVar226._28_4_;
    auVar129 = vsubps_avx(auVar20,auVar335._0_32_);
    fVar336 = auVar248._28_4_ + 2.0;
    auVar21._4_4_ = (fVar179 + fVar179) * (fVar252 + 2.0);
    auVar21._0_4_ = (fVar143 + fVar143) * (fVar251 + 2.0);
    auVar21._8_4_ = (fVar181 + fVar181) * (fVar268 + 2.0);
    auVar21._12_4_ = (fVar217 + fVar217) * (fVar270 + 2.0);
    auVar21._16_4_ = (fVar230 + fVar230) * (fVar272 + 2.0);
    auVar21._20_4_ = (fVar231 + fVar231) * (fVar253 + 2.0);
    auVar21._24_4_ = (fVar232 + fVar232) * (fVar255 + 2.0);
    auVar21._28_4_ = fVar336;
    auVar287._4_4_ = fVar179 * fVar179 * 3.0;
    auVar287._0_4_ = fVar143 * fVar143 * 3.0;
    auVar287._8_4_ = fVar181 * fVar181 * 3.0;
    auVar287._12_4_ = fVar217 * fVar217 * 3.0;
    auVar287._16_4_ = fVar230 * fVar230 * 3.0;
    auVar287._20_4_ = fVar231 * fVar231 * 3.0;
    auVar287._24_4_ = fVar232 * fVar232 * 3.0;
    auVar287._28_4_ = fVar249;
    auVar122 = vsubps_avx(auVar21,auVar287);
    auVar20 = vsubps_avx(_local_c40,auVar20);
    fVar352 = auVar129._0_4_ * 0.5;
    fVar357 = auVar129._4_4_ * 0.5;
    fVar362 = auVar129._8_4_ * 0.5;
    fVar367 = auVar129._12_4_ * 0.5;
    fVar380 = auVar129._16_4_ * 0.5;
    fVar385 = auVar129._20_4_ * 0.5;
    fVar386 = auVar129._24_4_ * 0.5;
    fVar256 = (auVar226._0_4_ * fVar251 + (auVar226._0_4_ + auVar226._0_4_) * (fVar251 + -5.0)) *
              0.5;
    fVar292 = (auVar226._4_4_ * fVar252 + (auVar226._4_4_ + auVar226._4_4_) * (fVar252 + -5.0)) *
              0.5;
    fVar294 = (auVar226._8_4_ * fVar268 + (auVar226._8_4_ + auVar226._8_4_) * (fVar268 + -5.0)) *
              0.5;
    fVar296 = (auVar226._12_4_ * fVar270 + (auVar226._12_4_ + auVar226._12_4_) * (fVar270 + -5.0)) *
              0.5;
    fVar298 = (auVar226._16_4_ * fVar272 + (auVar226._16_4_ + auVar226._16_4_) * (fVar272 + -5.0)) *
              0.5;
    fVar342 = (auVar226._20_4_ * fVar253 + (auVar226._20_4_ + auVar226._20_4_) * (fVar253 + -5.0)) *
              0.5;
    fVar347 = (auVar226._24_4_ * fVar255 + (auVar226._24_4_ + auVar226._24_4_) * (fVar255 + -5.0)) *
              0.5;
    fVar143 = auVar122._0_4_ * 0.5;
    fVar179 = auVar122._4_4_ * 0.5;
    fVar181 = auVar122._8_4_ * 0.5;
    fVar217 = auVar122._12_4_ * 0.5;
    fVar230 = auVar122._16_4_ * 0.5;
    fVar249 = auVar122._20_4_ * 0.5;
    fVar251 = auVar122._24_4_ * 0.5;
    fVar231 = auVar20._0_4_ * 0.5;
    fVar232 = auVar20._4_4_ * 0.5;
    fVar252 = auVar20._8_4_ * 0.5;
    fVar270 = auVar20._12_4_ * 0.5;
    fVar272 = auVar20._16_4_ * 0.5;
    fVar253 = auVar20._20_4_ * 0.5;
    fVar255 = auVar20._24_4_ * 0.5;
    fVar325 = fVar374 + auVar129._28_4_ + fVar374 + fVar324;
    fVar336 = fVar336 + auVar226._28_4_ + fVar324 + auVar122._28_4_ + auVar20._28_4_;
    auVar152 = vpermilps_avx(ZEXT416((uint)(fVar233 * 0.04761905)),0);
    fVar288 = auVar152._0_4_;
    fVar300 = fVar288 * (fVar352 * (float)local_300._0_4_ +
                        fVar256 * (float)local_320._0_4_ +
                        fVar143 * fVar254 + auVar379._0_4_ * fVar231);
    fVar290 = auVar152._4_4_;
    fVar313 = fVar290 * (fVar357 * (float)local_300._4_4_ +
                        fVar292 * (float)local_320._4_4_ +
                        fVar179 * fVar139 + auVar379._4_4_ * fVar232);
    auVar24._4_4_ = fVar313;
    auVar24._0_4_ = fVar300;
    fVar324 = auVar152._8_4_;
    fVar314 = fVar324 * (fVar362 * fStack_2f8 +
                        fVar294 * fStack_318 + fVar181 * fVar140 + auVar379._8_4_ * fVar252);
    auVar24._8_4_ = fVar314;
    fVar268 = auVar152._12_4_;
    fVar316 = fVar268 * (fVar367 * fStack_2f4 +
                        fVar296 * fStack_314 + fVar217 * fVar422 + auVar379._12_4_ * fVar270);
    auVar24._12_4_ = fVar316;
    fVar318 = fVar288 * (fVar380 * fStack_2f0 +
                        fVar298 * fStack_310 + fVar230 * fVar254 + auVar379._16_4_ * fVar272);
    auVar24._16_4_ = fVar318;
    fVar320 = fVar290 * (fVar385 * fStack_2ec +
                        fVar342 * fStack_30c + fVar249 * fVar139 + auVar379._20_4_ * fVar253);
    auVar24._20_4_ = fVar320;
    fVar322 = fVar324 * (fVar386 * fStack_2e8 +
                        fVar347 * fStack_308 + fVar251 * fVar140 + auVar379._24_4_ * fVar255);
    auVar24._24_4_ = fVar322;
    auVar24._28_4_ = fVar325;
    fVar339 = fVar288 * ((float)local_1a0._0_4_ * fVar352 +
                        fVar256 * (float)local_340._0_4_ +
                        fVar143 * (float)local_3a0._0_4_ + fVar231 * fVar419);
    fVar345 = fVar290 * ((float)local_1a0._4_4_ * fVar357 +
                        fVar292 * (float)local_340._4_4_ +
                        fVar179 * (float)local_3a0._4_4_ + fVar232 * fVar250);
    local_940._4_4_ = fVar345;
    local_940._0_4_ = fVar339;
    fVar350 = fVar324 * (fStack_198 * fVar362 +
                        fVar294 * fStack_338 + fVar181 * fStack_398 + fVar252 * fVar394);
    local_940._8_4_ = fVar350;
    fVar355 = fVar268 * (fStack_194 * fVar367 +
                        fVar296 * fStack_334 + fVar217 * fStack_394 + fVar270 * fVar397);
    local_940._12_4_ = fVar355;
    fVar360 = fVar288 * (fStack_190 * fVar380 +
                        fVar298 * fStack_330 + fVar230 * fStack_390 + fVar272 * fVar419);
    local_940._16_4_ = fVar360;
    fVar365 = fVar290 * (fStack_18c * fVar385 +
                        fVar342 * fStack_32c + fVar249 * fStack_38c + fVar253 * fVar250);
    local_940._20_4_ = fVar365;
    fVar370 = fVar324 * (fStack_188 * fVar386 +
                        fVar347 * fStack_328 + fVar251 * fStack_388 + fVar255 * fVar394);
    local_940._24_4_ = fVar370;
    local_940._28_4_ = fVar374;
    fVar387 = fVar288 * ((float)local_1c0._0_4_ * fVar352 +
                        fVar143 * (float)local_3c0._0_4_ + fVar231 * (float)local_400._0_4_ +
                        fVar256 * (float)local_360._0_4_);
    fVar393 = fVar290 * ((float)local_1c0._4_4_ * fVar357 +
                        fVar179 * (float)local_3c0._4_4_ + fVar232 * (float)local_400._4_4_ +
                        fVar292 * (float)local_360._4_4_);
    auVar330._4_4_ = fVar393;
    auVar330._0_4_ = fVar387;
    fVar396 = fVar324 * (fStack_1b8 * fVar362 +
                        fVar181 * fStack_3b8 + fVar252 * fStack_3f8 + fVar294 * fStack_358);
    auVar330._8_4_ = fVar396;
    fVar399 = fVar268 * (fStack_1b4 * fVar367 +
                        fVar217 * fStack_3b4 + fVar270 * fStack_3f4 + fVar296 * fStack_354);
    auVar330._12_4_ = fVar399;
    fVar401 = fVar288 * (fStack_1b0 * fVar380 +
                        fVar230 * fStack_3b0 + fVar272 * fStack_3f0 + fVar298 * fStack_350);
    auVar330._16_4_ = fVar401;
    fVar403 = fVar290 * (fStack_1ac * fVar385 +
                        fVar249 * fStack_3ac + fVar253 * fStack_3ec + fVar342 * fStack_34c);
    auVar330._20_4_ = fVar403;
    fVar405 = fVar324 * (fStack_1a8 * fVar386 +
                        fVar251 * fStack_3a8 + fVar255 * fStack_3e8 + fVar347 * fStack_348);
    auVar330._24_4_ = fVar405;
    auVar330._28_4_ = -auVar226._28_4_;
    fVar231 = fVar288 * ((float)local_1e0._0_4_ * fVar352 +
                        fVar256 * (float)local_380._0_4_ +
                        fVar143 * (float)local_3e0._0_4_ + (float)local_200._0_4_ * fVar231);
    fVar232 = fVar290 * ((float)local_1e0._4_4_ * fVar357 +
                        fVar292 * (float)local_380._4_4_ +
                        fVar179 * (float)local_3e0._4_4_ + (float)local_200._4_4_ * fVar232);
    auVar22._4_4_ = fVar232;
    auVar22._0_4_ = fVar231;
    fVar256 = fVar324 * (fStack_1d8 * fVar362 +
                        fVar294 * fStack_378 + fVar181 * fStack_3d8 + fStack_1f8 * fVar252);
    auVar22._8_4_ = fVar256;
    fVar268 = fVar268 * (fStack_1d4 * fVar367 +
                        fVar296 * fStack_374 + fVar217 * fStack_3d4 + fStack_1f4 * fVar270);
    auVar22._12_4_ = fVar268;
    fVar288 = fVar288 * (fStack_1d0 * fVar380 +
                        fVar298 * fStack_370 + fVar230 * fStack_3d0 + fStack_1f0 * fVar272);
    auVar22._16_4_ = fVar288;
    fVar290 = fVar290 * (fStack_1cc * fVar385 +
                        fVar342 * fStack_36c + fVar249 * fStack_3cc + fStack_1ec * fVar253);
    auVar22._20_4_ = fVar290;
    fVar324 = fVar324 * (fStack_1c8 * fVar386 +
                        fVar347 * fStack_368 + fVar251 * fStack_3c8 + fStack_1e8 * fVar255);
    auVar22._24_4_ = fVar324;
    auVar22._28_4_ = fVar336;
    auVar81._4_4_ = fVar344;
    auVar81._0_4_ = fVar338;
    auVar81._8_4_ = fVar349;
    auVar81._12_4_ = fVar354;
    auVar81._16_4_ = fVar359;
    auVar81._20_4_ = fVar364;
    auVar81._24_4_ = fVar369;
    auVar81._28_4_ = fVar373;
    auVar129 = vperm2f128_avx(auVar81,auVar81,1);
    auVar129 = vshufps_avx(auVar129,auVar81,0x30);
    local_a80 = vshufps_avx(auVar81,auVar129,0x29);
    auVar83._4_4_ = fVar210;
    auVar83._0_4_ = fVar186;
    auVar83._8_4_ = fVar211;
    auVar83._12_4_ = fVar212;
    auVar83._16_4_ = fVar213;
    auVar83._20_4_ = fVar214;
    auVar83._24_4_ = fVar215;
    auVar83._28_4_ = fVar216;
    auVar129 = vperm2f128_avx(auVar83,auVar83,1);
    auVar129 = vshufps_avx(auVar129,auVar83,0x30);
    _local_aa0 = vshufps_avx(auVar83,auVar129,0x29);
    auVar122 = vsubps_avx(local_920,auVar22);
    auVar129 = vperm2f128_avx(auVar122,auVar122,1);
    auVar129 = vshufps_avx(auVar129,auVar122,0x30);
    _local_7e0 = vshufps_avx(auVar122,auVar129,0x29);
    auVar20 = vsubps_avx(local_a80,auVar81);
    auVar21 = vsubps_avx(_local_aa0,auVar83);
    fVar179 = auVar20._0_4_;
    fVar233 = auVar20._4_4_;
    auVar329._4_4_ = fVar393 * fVar233;
    auVar329._0_4_ = fVar387 * fVar179;
    fVar270 = auVar20._8_4_;
    auVar329._8_4_ = fVar396 * fVar270;
    fVar292 = auVar20._12_4_;
    auVar329._12_4_ = fVar399 * fVar292;
    fVar342 = auVar20._16_4_;
    auVar329._16_4_ = fVar401 * fVar342;
    fVar380 = auVar20._20_4_;
    auVar329._20_4_ = fVar403 * fVar380;
    fVar394 = auVar20._24_4_;
    auVar329._24_4_ = fVar405 * fVar394;
    auVar329._28_4_ = auVar122._28_4_;
    fVar181 = auVar21._0_4_;
    fVar249 = auVar21._4_4_;
    auVar23._4_4_ = fVar345 * fVar249;
    auVar23._0_4_ = fVar339 * fVar181;
    fVar272 = auVar21._8_4_;
    auVar23._8_4_ = fVar350 * fVar272;
    fVar294 = auVar21._12_4_;
    auVar23._12_4_ = fVar355 * fVar294;
    fVar347 = auVar21._16_4_;
    auVar23._16_4_ = fVar360 * fVar347;
    fVar385 = auVar21._20_4_;
    auVar23._20_4_ = fVar365 * fVar385;
    fVar395 = auVar21._24_4_;
    auVar23._24_4_ = fVar370 * fVar395;
    auVar23._28_4_ = auVar129._28_4_;
    auVar287 = vsubps_avx(auVar23,auVar329);
    auVar85._4_4_ = fVar343;
    auVar85._0_4_ = fVar337;
    auVar85._8_4_ = fVar348;
    auVar85._12_4_ = fVar353;
    auVar85._16_4_ = fVar358;
    auVar85._20_4_ = fVar363;
    auVar85._24_4_ = fVar368;
    auVar85._28_4_ = fVar372;
    auVar129 = vperm2f128_avx(auVar85,auVar85,1);
    auVar129 = vshufps_avx(auVar129,auVar85,0x30);
    auVar21 = vshufps_avx(auVar85,auVar129,0x29);
    auVar22 = vsubps_avx(auVar21,auVar85);
    auVar415._4_4_ = fVar249 * fVar313;
    auVar415._0_4_ = fVar181 * fVar300;
    auVar415._8_4_ = fVar272 * fVar314;
    auVar415._12_4_ = fVar294 * fVar316;
    auVar415._16_4_ = fVar347 * fVar318;
    auVar415._20_4_ = fVar385 * fVar320;
    auVar415._24_4_ = fVar395 * fVar322;
    auVar415._28_4_ = auVar21._28_4_;
    fVar217 = auVar22._0_4_;
    fVar251 = auVar22._4_4_;
    auVar25._4_4_ = fVar393 * fVar251;
    auVar25._0_4_ = fVar387 * fVar217;
    fVar253 = auVar22._8_4_;
    auVar25._8_4_ = fVar396 * fVar253;
    fVar296 = auVar22._12_4_;
    auVar25._12_4_ = fVar399 * fVar296;
    fVar352 = auVar22._16_4_;
    auVar25._16_4_ = fVar401 * fVar352;
    fVar386 = auVar22._20_4_;
    auVar25._20_4_ = fVar403 * fVar386;
    fVar398 = auVar22._24_4_;
    auVar25._24_4_ = fVar405 * fVar398;
    auVar25._28_4_ = local_aa0._28_4_;
    auVar329 = vsubps_avx(auVar25,auVar415);
    auVar26._4_4_ = fVar345 * fVar251;
    auVar26._0_4_ = fVar339 * fVar217;
    auVar26._8_4_ = fVar350 * fVar253;
    auVar26._12_4_ = fVar355 * fVar296;
    auVar26._16_4_ = fVar360 * fVar352;
    auVar26._20_4_ = fVar365 * fVar386;
    auVar26._24_4_ = fVar370 * fVar398;
    auVar26._28_4_ = local_aa0._28_4_;
    auVar27._4_4_ = fVar313 * fVar233;
    auVar27._0_4_ = fVar300 * fVar179;
    auVar27._8_4_ = fVar314 * fVar270;
    auVar27._12_4_ = fVar316 * fVar292;
    auVar27._16_4_ = fVar318 * fVar342;
    auVar27._20_4_ = fVar320 * fVar380;
    auVar27._24_4_ = fVar322 * fVar394;
    auVar27._28_4_ = fVar216;
    auVar23 = vsubps_avx(auVar27,auVar26);
    fVar143 = auVar23._28_4_;
    fVar362 = auVar329._28_4_ + fVar143;
    auVar227._0_4_ = fVar217 * fVar217 + fVar179 * fVar179 + fVar181 * fVar181;
    auVar227._4_4_ = fVar251 * fVar251 + fVar233 * fVar233 + fVar249 * fVar249;
    auVar227._8_4_ = fVar253 * fVar253 + fVar270 * fVar270 + fVar272 * fVar272;
    auVar227._12_4_ = fVar296 * fVar296 + fVar292 * fVar292 + fVar294 * fVar294;
    auVar227._16_4_ = fVar352 * fVar352 + fVar342 * fVar342 + fVar347 * fVar347;
    auVar227._20_4_ = fVar386 * fVar386 + fVar380 * fVar380 + fVar385 * fVar385;
    auVar227._24_4_ = fVar398 * fVar398 + fVar394 * fVar394 + fVar395 * fVar395;
    auVar227._28_4_ = fVar143 + fVar143 + fVar362;
    auVar129 = vrcpps_avx(auVar227);
    fVar367 = auVar129._0_4_;
    fVar250 = auVar129._4_4_;
    auVar28._4_4_ = fVar250 * auVar227._4_4_;
    auVar28._0_4_ = fVar367 * auVar227._0_4_;
    fVar392 = auVar129._8_4_;
    auVar28._8_4_ = fVar392 * auVar227._8_4_;
    fVar402 = auVar129._12_4_;
    auVar28._12_4_ = fVar402 * auVar227._12_4_;
    fVar404 = auVar129._16_4_;
    auVar28._16_4_ = fVar404 * auVar227._16_4_;
    fVar254 = auVar129._20_4_;
    auVar28._20_4_ = fVar254 * auVar227._20_4_;
    fVar406 = auVar129._24_4_;
    auVar28._24_4_ = fVar406 * auVar227._24_4_;
    auVar28._28_4_ = fVar216;
    auVar411._8_4_ = 0x3f800000;
    auVar411._0_8_ = &DAT_3f8000003f800000;
    auVar411._12_4_ = 0x3f800000;
    auVar411._16_4_ = 0x3f800000;
    auVar411._20_4_ = 0x3f800000;
    auVar411._24_4_ = 0x3f800000;
    auVar411._28_4_ = 0x3f800000;
    auVar415 = vsubps_avx(auVar411,auVar28);
    fVar367 = auVar415._0_4_ * fVar367 + fVar367;
    fVar250 = auVar415._4_4_ * fVar250 + fVar250;
    fVar392 = auVar415._8_4_ * fVar392 + fVar392;
    fVar402 = auVar415._12_4_ * fVar402 + fVar402;
    fVar404 = auVar415._16_4_ * fVar404 + fVar404;
    fVar254 = auVar415._20_4_ * fVar254 + fVar254;
    fVar406 = auVar415._24_4_ * fVar406 + fVar406;
    auVar122 = vperm2f128_avx(local_940,local_940,1);
    auVar122 = vshufps_avx(auVar122,local_940,0x30);
    auVar122 = vshufps_avx(local_940,auVar122,0x29);
    auVar20 = vperm2f128_avx(auVar330,auVar330,1);
    auVar20 = vshufps_avx(auVar20,auVar330,0x30);
    local_7c0 = vshufps_avx(auVar330,auVar20,0x29);
    fVar407 = local_7c0._0_4_;
    fVar417 = local_7c0._4_4_;
    auVar29._4_4_ = fVar417 * fVar233;
    auVar29._0_4_ = fVar407 * fVar179;
    fVar421 = local_7c0._8_4_;
    auVar29._8_4_ = fVar421 * fVar270;
    fVar424 = local_7c0._12_4_;
    auVar29._12_4_ = fVar424 * fVar292;
    fVar426 = local_7c0._16_4_;
    auVar29._16_4_ = fVar426 * fVar342;
    fVar428 = local_7c0._20_4_;
    auVar29._20_4_ = fVar428 * fVar380;
    fVar430 = local_7c0._24_4_;
    auVar29._24_4_ = fVar430 * fVar394;
    auVar29._28_4_ = auVar20._28_4_;
    fVar340 = auVar122._0_4_;
    fVar346 = auVar122._4_4_;
    auVar30._4_4_ = fVar346 * fVar249;
    auVar30._0_4_ = fVar340 * fVar181;
    fVar351 = auVar122._8_4_;
    auVar30._8_4_ = fVar351 * fVar272;
    fVar356 = auVar122._12_4_;
    auVar30._12_4_ = fVar356 * fVar294;
    fVar361 = auVar122._16_4_;
    auVar30._16_4_ = fVar361 * fVar347;
    fVar366 = auVar122._20_4_;
    auVar30._20_4_ = fVar366 * fVar385;
    fVar371 = auVar122._24_4_;
    auVar30._24_4_ = fVar371 * fVar395;
    auVar30._28_4_ = -auVar226._28_4_;
    auVar330 = vsubps_avx(auVar30,auVar29);
    auVar122 = vperm2f128_avx(auVar24,auVar24,1);
    auVar122 = vshufps_avx(auVar122,auVar24,0x30);
    auVar20 = vshufps_avx(auVar24,auVar122,0x29);
    fVar230 = auVar20._0_4_;
    fVar252 = auVar20._4_4_;
    auVar31._4_4_ = fVar249 * fVar252;
    auVar31._0_4_ = fVar181 * fVar230;
    fVar255 = auVar20._8_4_;
    auVar31._8_4_ = fVar272 * fVar255;
    fVar298 = auVar20._12_4_;
    auVar31._12_4_ = fVar294 * fVar298;
    fVar357 = auVar20._16_4_;
    auVar31._16_4_ = fVar347 * fVar357;
    fVar419 = auVar20._20_4_;
    auVar31._20_4_ = fVar385 * fVar419;
    fVar400 = auVar20._24_4_;
    auVar31._24_4_ = fVar395 * fVar400;
    auVar31._28_4_ = auVar122._28_4_;
    auVar32._4_4_ = fVar417 * fVar251;
    auVar32._0_4_ = fVar407 * fVar217;
    auVar32._8_4_ = fVar421 * fVar253;
    auVar32._12_4_ = fVar424 * fVar296;
    auVar32._16_4_ = fVar426 * fVar352;
    auVar32._20_4_ = fVar428 * fVar386;
    uVar96 = local_7c0._28_4_;
    auVar32._24_4_ = fVar430 * fVar398;
    auVar32._28_4_ = uVar96;
    auVar24 = vsubps_avx(auVar32,auVar31);
    auVar33._4_4_ = fVar346 * fVar251;
    auVar33._0_4_ = fVar340 * fVar217;
    auVar33._8_4_ = fVar351 * fVar253;
    auVar33._12_4_ = fVar356 * fVar296;
    auVar33._16_4_ = fVar361 * fVar352;
    auVar33._20_4_ = fVar366 * fVar386;
    auVar33._24_4_ = fVar371 * fVar398;
    auVar33._28_4_ = uVar96;
    auVar34._4_4_ = fVar252 * fVar233;
    auVar34._0_4_ = fVar230 * fVar179;
    auVar34._8_4_ = fVar255 * fVar270;
    auVar34._12_4_ = fVar298 * fVar292;
    auVar34._16_4_ = fVar357 * fVar342;
    auVar34._20_4_ = fVar419 * fVar380;
    auVar34._24_4_ = fVar400 * fVar394;
    auVar34._28_4_ = fStack_1c4;
    auVar122 = vsubps_avx(auVar34,auVar33);
    fVar143 = auVar122._28_4_;
    auVar35._4_4_ =
         (auVar287._4_4_ * auVar287._4_4_ +
         auVar329._4_4_ * auVar329._4_4_ + auVar23._4_4_ * auVar23._4_4_) * fVar250;
    auVar35._0_4_ =
         (auVar287._0_4_ * auVar287._0_4_ +
         auVar329._0_4_ * auVar329._0_4_ + auVar23._0_4_ * auVar23._0_4_) * fVar367;
    auVar35._8_4_ =
         (auVar287._8_4_ * auVar287._8_4_ +
         auVar329._8_4_ * auVar329._8_4_ + auVar23._8_4_ * auVar23._8_4_) * fVar392;
    auVar35._12_4_ =
         (auVar287._12_4_ * auVar287._12_4_ +
         auVar329._12_4_ * auVar329._12_4_ + auVar23._12_4_ * auVar23._12_4_) * fVar402;
    auVar35._16_4_ =
         (auVar287._16_4_ * auVar287._16_4_ +
         auVar329._16_4_ * auVar329._16_4_ + auVar23._16_4_ * auVar23._16_4_) * fVar404;
    auVar35._20_4_ =
         (auVar287._20_4_ * auVar287._20_4_ +
         auVar329._20_4_ * auVar329._20_4_ + auVar23._20_4_ * auVar23._20_4_) * fVar254;
    auVar35._24_4_ =
         (auVar287._24_4_ * auVar287._24_4_ +
         auVar329._24_4_ * auVar329._24_4_ + auVar23._24_4_ * auVar23._24_4_) * fVar406;
    auVar35._28_4_ = auVar287._28_4_ + fVar362;
    auVar36._4_4_ =
         (auVar330._4_4_ * auVar330._4_4_ +
         auVar24._4_4_ * auVar24._4_4_ + auVar122._4_4_ * auVar122._4_4_) * fVar250;
    auVar36._0_4_ =
         (auVar330._0_4_ * auVar330._0_4_ +
         auVar24._0_4_ * auVar24._0_4_ + auVar122._0_4_ * auVar122._0_4_) * fVar367;
    auVar36._8_4_ =
         (auVar330._8_4_ * auVar330._8_4_ +
         auVar24._8_4_ * auVar24._8_4_ + auVar122._8_4_ * auVar122._8_4_) * fVar392;
    auVar36._12_4_ =
         (auVar330._12_4_ * auVar330._12_4_ +
         auVar24._12_4_ * auVar24._12_4_ + auVar122._12_4_ * auVar122._12_4_) * fVar402;
    auVar36._16_4_ =
         (auVar330._16_4_ * auVar330._16_4_ +
         auVar24._16_4_ * auVar24._16_4_ + auVar122._16_4_ * auVar122._16_4_) * fVar404;
    auVar36._20_4_ =
         (auVar330._20_4_ * auVar330._20_4_ +
         auVar24._20_4_ * auVar24._20_4_ + auVar122._20_4_ * auVar122._20_4_) * fVar254;
    auVar36._24_4_ =
         (auVar330._24_4_ * auVar330._24_4_ +
         auVar24._24_4_ * auVar24._24_4_ + auVar122._24_4_ * auVar122._24_4_) * fVar406;
    auVar36._28_4_ = auVar415._28_4_ + auVar129._28_4_;
    auVar129 = vmaxps_avx(auVar35,auVar36);
    auVar122 = vperm2f128_avx(local_920,local_920,1);
    auVar122 = vshufps_avx(auVar122,local_920,0x30);
    local_800 = vshufps_avx(local_920,auVar122,0x29);
    auVar162._0_4_ = (float)local_920._0_4_ + fVar231;
    auVar162._4_4_ = local_920._4_4_ + fVar232;
    auVar162._8_4_ = local_920._8_4_ + fVar256;
    auVar162._12_4_ = local_920._12_4_ + fVar268;
    auVar162._16_4_ = local_920._16_4_ + fVar288;
    auVar162._20_4_ = local_920._20_4_ + fVar290;
    auVar162._24_4_ = local_920._24_4_ + fVar324;
    auVar162._28_4_ = local_920._28_4_ + fVar336;
    auVar122 = vmaxps_avx(local_920,auVar162);
    auVar20 = vmaxps_avx(_local_7e0,local_800);
    auVar122 = vmaxps_avx(auVar122,auVar20);
    auVar20 = vrsqrtps_avx(auVar227);
    fVar231 = auVar20._0_4_;
    fVar232 = auVar20._4_4_;
    fVar256 = auVar20._8_4_;
    fVar268 = auVar20._12_4_;
    fVar288 = auVar20._16_4_;
    fVar290 = auVar20._20_4_;
    fVar324 = auVar20._24_4_;
    auVar37._4_4_ = fVar232 * fVar232 * fVar232 * auVar227._4_4_ * 0.5;
    auVar37._0_4_ = fVar231 * fVar231 * fVar231 * auVar227._0_4_ * 0.5;
    auVar37._8_4_ = fVar256 * fVar256 * fVar256 * auVar227._8_4_ * 0.5;
    auVar37._12_4_ = fVar268 * fVar268 * fVar268 * auVar227._12_4_ * 0.5;
    auVar37._16_4_ = fVar288 * fVar288 * fVar288 * auVar227._16_4_ * 0.5;
    auVar37._20_4_ = fVar290 * fVar290 * fVar290 * auVar227._20_4_ * 0.5;
    auVar37._24_4_ = fVar324 * fVar324 * fVar324 * auVar227._24_4_ * 0.5;
    auVar37._28_4_ = auVar227._28_4_;
    auVar38._4_4_ = fVar232 * 1.5;
    auVar38._0_4_ = fVar231 * 1.5;
    auVar38._8_4_ = fVar256 * 1.5;
    auVar38._12_4_ = fVar268 * 1.5;
    auVar38._16_4_ = fVar288 * 1.5;
    auVar38._20_4_ = fVar290 * 1.5;
    auVar38._24_4_ = fVar324 * 1.5;
    auVar38._28_4_ = auVar20._28_4_;
    local_4a0 = vsubps_avx(auVar38,auVar37);
    auVar82._4_4_ = fVar344;
    auVar82._0_4_ = fVar338;
    auVar82._8_4_ = fVar349;
    auVar82._12_4_ = fVar354;
    auVar82._16_4_ = fVar359;
    auVar82._20_4_ = fVar364;
    auVar82._24_4_ = fVar369;
    auVar82._28_4_ = fVar373;
    auVar287 = vsubps_avx(ZEXT832(0) << 0x20,auVar82);
    auVar84._4_4_ = fVar210;
    auVar84._0_4_ = fVar186;
    auVar84._8_4_ = fVar211;
    auVar84._12_4_ = fVar212;
    auVar84._16_4_ = fVar213;
    auVar84._20_4_ = fVar214;
    auVar84._24_4_ = fVar215;
    auVar84._28_4_ = fVar216;
    local_a40 = vsubps_avx(ZEXT832(0) << 0x20,auVar84);
    fVar231 = local_a40._0_4_;
    fVar256 = local_a40._4_4_;
    fVar288 = local_a40._8_4_;
    fVar324 = local_a40._12_4_;
    fVar362 = local_a40._16_4_;
    fVar250 = local_a40._20_4_;
    fVar402 = local_a40._24_4_;
    fVar232 = auVar287._0_4_;
    fVar268 = auVar287._4_4_;
    fVar290 = auVar287._8_4_;
    fVar336 = auVar287._12_4_;
    fVar367 = auVar287._16_4_;
    fVar392 = auVar287._20_4_;
    fVar404 = auVar287._24_4_;
    local_a60 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    fVar442 = local_a60._0_4_;
    fVar444 = local_a60._4_4_;
    fVar445 = local_a60._8_4_;
    fVar446 = local_a60._12_4_;
    fVar447 = local_a60._16_4_;
    fVar448 = local_a60._20_4_;
    fVar449 = local_a60._24_4_;
    auVar390._0_4_ =
         fVar442 * (float)local_ac0._0_4_ +
         (float)local_8c0._0_4_ * fVar232 + (float)local_8e0._0_4_ * fVar231;
    auVar390._4_4_ =
         fVar444 * (float)local_ac0._4_4_ +
         (float)local_8c0._4_4_ * fVar268 + (float)local_8e0._4_4_ * fVar256;
    auVar390._8_4_ = fVar445 * fStack_ab8 + fStack_8b8 * fVar290 + fStack_8d8 * fVar288;
    auVar390._12_4_ = fVar446 * fStack_ab4 + fStack_8b4 * fVar336 + fStack_8d4 * fVar324;
    auVar390._16_4_ = fVar447 * fStack_ab0 + fStack_8b0 * fVar367 + fStack_8d0 * fVar362;
    auVar390._20_4_ = fVar448 * fStack_aac + fStack_8ac * fVar392 + fStack_8cc * fVar250;
    auVar390._24_4_ = fVar449 * fStack_aa8 + fStack_8a8 * fVar404 + fStack_8c8 * fVar402;
    auVar390._28_4_ = fVar143 + fVar143 + auVar24._28_4_ + fVar143;
    auVar412._0_4_ = fVar442 * fVar442 + fVar232 * fVar232 + fVar231 * fVar231;
    auVar412._4_4_ = fVar444 * fVar444 + fVar268 * fVar268 + fVar256 * fVar256;
    auVar412._8_4_ = fVar445 * fVar445 + fVar290 * fVar290 + fVar288 * fVar288;
    auVar412._12_4_ = fVar446 * fVar446 + fVar336 * fVar336 + fVar324 * fVar324;
    auVar412._16_4_ = fVar447 * fVar447 + fVar367 * fVar367 + fVar362 * fVar362;
    auVar412._20_4_ = fVar448 * fVar448 + fVar392 * fVar392 + fVar250 * fVar250;
    auVar412._24_4_ = fVar449 * fVar449 + fVar404 * fVar404 + fVar402 * fVar402;
    auVar412._28_4_ = fStack_1c4 + fStack_1c4 + fVar143;
    fVar257 = local_4a0._0_4_;
    fVar269 = local_4a0._4_4_;
    fVar271 = local_4a0._8_4_;
    fVar273 = local_4a0._12_4_;
    fVar274 = local_4a0._16_4_;
    fVar275 = local_4a0._20_4_;
    fVar276 = local_4a0._24_4_;
    fVar254 = (float)local_ac0._0_4_ * fVar217 * fVar257 +
              fVar257 * fVar179 * (float)local_8c0._0_4_ +
              fVar181 * fVar257 * (float)local_8e0._0_4_;
    fVar406 = (float)local_ac0._4_4_ * fVar251 * fVar269 +
              fVar269 * fVar233 * (float)local_8c0._4_4_ +
              fVar249 * fVar269 * (float)local_8e0._4_4_;
    fVar139 = fStack_ab8 * fVar253 * fVar271 +
              fVar271 * fVar270 * fStack_8b8 + fVar272 * fVar271 * fStack_8d8;
    fVar416 = fStack_ab4 * fVar296 * fVar273 +
              fVar273 * fVar292 * fStack_8b4 + fVar294 * fVar273 * fStack_8d4;
    fVar140 = fStack_ab0 * fVar352 * fVar274 +
              fVar274 * fVar342 * fStack_8b0 + fVar347 * fVar274 * fStack_8d0;
    fVar420 = fStack_aac * fVar386 * fVar275 +
              fVar275 * fVar380 * fStack_8ac + fVar385 * fVar275 * fStack_8cc;
    fVar423 = fStack_aa8 * fVar398 * fVar276 +
              fVar276 * fVar394 * fStack_8a8 + fVar395 * fVar276 * fStack_8c8;
    fVar143 = fStack_aa4 + fStack_8a4 + fStack_8c4;
    fVar431 = fVar442 * fVar217 * fVar257 +
              fVar257 * fVar179 * fVar232 + fVar181 * fVar257 * fVar231;
    fVar435 = fVar444 * fVar251 * fVar269 +
              fVar269 * fVar233 * fVar268 + fVar249 * fVar269 * fVar256;
    fVar436 = fVar445 * fVar253 * fVar271 +
              fVar271 * fVar270 * fVar290 + fVar272 * fVar271 * fVar288;
    fVar437 = fVar446 * fVar296 * fVar273 +
              fVar273 * fVar292 * fVar336 + fVar294 * fVar273 * fVar324;
    fVar438 = fVar447 * fVar352 * fVar274 +
              fVar274 * fVar342 * fVar367 + fVar347 * fVar274 * fVar362;
    fVar439 = fVar448 * fVar386 * fVar275 +
              fVar275 * fVar380 * fVar392 + fVar385 * fVar275 * fVar250;
    fVar440 = fVar449 * fVar398 * fVar276 +
              fVar276 * fVar394 * fVar404 + fVar395 * fVar276 * fVar402;
    fVar441 = fStack_8a4 + fVar143;
    auVar39._4_4_ = fVar435 * fVar406;
    auVar39._0_4_ = fVar431 * fVar254;
    auVar39._8_4_ = fVar436 * fVar139;
    auVar39._12_4_ = fVar437 * fVar416;
    auVar39._16_4_ = fVar438 * fVar140;
    auVar39._20_4_ = fVar439 * fVar420;
    auVar39._24_4_ = fVar440 * fVar423;
    auVar39._28_4_ = fVar143;
    auVar329 = vsubps_avx(auVar390,auVar39);
    auVar40._4_4_ = fVar435 * fVar435;
    auVar40._0_4_ = fVar431 * fVar431;
    auVar40._8_4_ = fVar436 * fVar436;
    auVar40._12_4_ = fVar437 * fVar437;
    auVar40._16_4_ = fVar438 * fVar438;
    auVar40._20_4_ = fVar439 * fVar439;
    auVar40._24_4_ = fVar440 * fVar440;
    auVar40._28_4_ = fStack_8a4;
    auVar23 = vsubps_avx(auVar412,auVar40);
    auVar20 = vsqrtps_avx(auVar129);
    fVar143 = (auVar20._0_4_ + auVar122._0_4_) * 1.0000002;
    fVar425 = (auVar20._4_4_ + auVar122._4_4_) * 1.0000002;
    fVar427 = (auVar20._8_4_ + auVar122._8_4_) * 1.0000002;
    fVar429 = (auVar20._12_4_ + auVar122._12_4_) * 1.0000002;
    fVar183 = (auVar20._16_4_ + auVar122._16_4_) * 1.0000002;
    fVar184 = (auVar20._20_4_ + auVar122._20_4_) * 1.0000002;
    fVar185 = (auVar20._24_4_ + auVar122._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar425 * fVar425;
    auVar41._0_4_ = fVar143 * fVar143;
    auVar41._8_4_ = fVar427 * fVar427;
    auVar41._12_4_ = fVar429 * fVar429;
    auVar41._16_4_ = fVar183 * fVar183;
    auVar41._20_4_ = fVar184 * fVar184;
    auVar41._24_4_ = fVar185 * fVar185;
    auVar41._28_4_ = auVar20._28_4_ + auVar122._28_4_;
    fVar408 = auVar329._0_4_ + auVar329._0_4_;
    fVar418 = auVar329._4_4_ + auVar329._4_4_;
    local_240._0_8_ = CONCAT44(fVar418,fVar408);
    local_240._8_4_ = auVar329._8_4_ + auVar329._8_4_;
    local_240._12_4_ = auVar329._12_4_ + auVar329._12_4_;
    local_240._16_4_ = auVar329._16_4_ + auVar329._16_4_;
    local_240._20_4_ = auVar329._20_4_ + auVar329._20_4_;
    local_240._24_4_ = auVar329._24_4_ + auVar329._24_4_;
    local_240._28_4_ = auVar329._28_4_ + auVar329._28_4_;
    auVar122 = vsubps_avx(auVar23,auVar41);
    auVar42._4_4_ = fVar406 * fVar406;
    auVar42._0_4_ = fVar254 * fVar254;
    auVar42._8_4_ = fVar139 * fVar139;
    auVar42._12_4_ = fVar416 * fVar416;
    auVar42._16_4_ = fVar140 * fVar140;
    auVar42._20_4_ = fVar420 * fVar420;
    auVar42._24_4_ = fVar423 * fVar423;
    auVar42._28_4_ = auVar22._28_4_;
    auVar334 = ZEXT3264(auVar42);
    local_4c0 = vsubps_avx(local_220,auVar42);
    auVar383 = ZEXT3264(local_4c0);
    auVar43._4_4_ = fVar418 * fVar418;
    auVar43._0_4_ = fVar408 * fVar408;
    auVar43._8_4_ = local_240._8_4_ * local_240._8_4_;
    auVar43._12_4_ = local_240._12_4_ * local_240._12_4_;
    auVar43._16_4_ = local_240._16_4_ * local_240._16_4_;
    auVar43._20_4_ = local_240._20_4_ * local_240._20_4_;
    auVar43._24_4_ = local_240._24_4_ * local_240._24_4_;
    auVar43._28_4_ = local_220._28_4_;
    fVar425 = local_4c0._0_4_;
    fVar427 = local_4c0._4_4_;
    fVar429 = local_4c0._8_4_;
    fVar183 = local_4c0._12_4_;
    fVar184 = local_4c0._16_4_;
    fVar185 = local_4c0._20_4_;
    fVar384 = local_4c0._24_4_;
    auVar44._4_4_ = fVar427 * 4.0 * auVar122._4_4_;
    auVar44._0_4_ = fVar425 * 4.0 * auVar122._0_4_;
    auVar44._8_4_ = fVar429 * 4.0 * auVar122._8_4_;
    auVar44._12_4_ = fVar183 * 4.0 * auVar122._12_4_;
    auVar44._16_4_ = fVar184 * 4.0 * auVar122._16_4_;
    auVar44._20_4_ = fVar185 * 4.0 * auVar122._20_4_;
    auVar44._24_4_ = fVar384 * 4.0 * auVar122._24_4_;
    auVar44._28_4_ = 0x40800000;
    auVar329 = vsubps_avx(auVar43,auVar44);
    auVar129 = vcmpps_avx(auVar329,ZEXT432(0) << 0x20,5);
    fVar143 = local_4c0._28_4_;
    if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar129 >> 0x7f,0) == '\0') &&
          (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar129 >> 0xbf,0) == '\0') &&
        (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar129[0x1f])
    {
      auVar123._8_4_ = 0x7f800000;
      auVar123._0_8_ = 0x7f8000007f800000;
      auVar123._12_4_ = 0x7f800000;
      auVar123._16_4_ = 0x7f800000;
      auVar123._20_4_ = 0x7f800000;
      auVar123._24_4_ = 0x7f800000;
      auVar123._28_4_ = 0x7f800000;
      auVar433._8_4_ = 0xff800000;
      auVar433._0_8_ = 0xff800000ff800000;
      auVar433._12_4_ = 0xff800000;
      auVar433._16_4_ = 0xff800000;
      auVar433._20_4_ = 0xff800000;
      auVar433._24_4_ = 0xff800000;
      auVar433._28_4_ = 0xff800000;
    }
    else {
      auVar24 = vsqrtps_avx(auVar329);
      auVar284._0_4_ = fVar425 + fVar425;
      auVar284._4_4_ = fVar427 + fVar427;
      auVar284._8_4_ = fVar429 + fVar429;
      auVar284._12_4_ = fVar183 + fVar183;
      auVar284._16_4_ = fVar184 + fVar184;
      auVar284._20_4_ = fVar185 + fVar185;
      auVar284._24_4_ = fVar384 + fVar384;
      auVar284._28_4_ = fVar143 + fVar143;
      auVar330 = vrcpps_avx(auVar284);
      auVar415 = vcmpps_avx(auVar329,ZEXT432(0) << 0x20,5);
      fVar277 = auVar330._0_4_;
      fVar289 = auVar330._4_4_;
      auVar45._4_4_ = auVar284._4_4_ * fVar289;
      auVar45._0_4_ = auVar284._0_4_ * fVar277;
      fVar291 = auVar330._8_4_;
      auVar45._8_4_ = auVar284._8_4_ * fVar291;
      fVar293 = auVar330._12_4_;
      auVar45._12_4_ = auVar284._12_4_ * fVar293;
      fVar295 = auVar330._16_4_;
      auVar45._16_4_ = auVar284._16_4_ * fVar295;
      fVar297 = auVar330._20_4_;
      auVar45._20_4_ = auVar284._20_4_ * fVar297;
      fVar299 = auVar330._24_4_;
      auVar45._24_4_ = auVar284._24_4_ * fVar299;
      auVar45._28_4_ = auVar284._28_4_;
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = &DAT_3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar124._16_4_ = 0x3f800000;
      auVar124._20_4_ = 0x3f800000;
      auVar124._24_4_ = 0x3f800000;
      auVar124._28_4_ = 0x3f800000;
      auVar329 = vsubps_avx(auVar124,auVar45);
      fVar277 = fVar277 + fVar277 * auVar329._0_4_;
      fVar289 = fVar289 + fVar289 * auVar329._4_4_;
      fVar291 = fVar291 + fVar291 * auVar329._8_4_;
      fVar293 = fVar293 + fVar293 * auVar329._12_4_;
      fVar295 = fVar295 + fVar295 * auVar329._16_4_;
      fVar297 = fVar297 + fVar297 * auVar329._20_4_;
      fVar299 = fVar299 + fVar299 * auVar329._24_4_;
      auVar308._0_8_ = CONCAT44(fVar418,fVar408) ^ 0x8000000080000000;
      auVar308._8_4_ = -local_240._8_4_;
      auVar308._12_4_ = -local_240._12_4_;
      auVar308._16_4_ = -local_240._16_4_;
      auVar308._20_4_ = -local_240._20_4_;
      auVar308._24_4_ = -local_240._24_4_;
      auVar308._28_4_ = -local_240._28_4_;
      auVar25 = vsubps_avx(auVar308,auVar24);
      fVar408 = auVar25._0_4_ * fVar277;
      fVar418 = auVar25._4_4_ * fVar289;
      auVar46._4_4_ = fVar418;
      auVar46._0_4_ = fVar408;
      fVar315 = auVar25._8_4_ * fVar291;
      auVar46._8_4_ = fVar315;
      fVar317 = auVar25._12_4_ * fVar293;
      auVar46._12_4_ = fVar317;
      fVar319 = auVar25._16_4_ * fVar295;
      auVar46._16_4_ = fVar319;
      fVar321 = auVar25._20_4_ * fVar297;
      auVar46._20_4_ = fVar321;
      fVar323 = auVar25._24_4_ * fVar299;
      auVar46._24_4_ = fVar323;
      auVar46._28_4_ = auVar25._28_4_;
      auVar24 = vsubps_avx(auVar24,local_240);
      fVar277 = auVar24._0_4_ * fVar277;
      fVar289 = auVar24._4_4_ * fVar289;
      auVar47._4_4_ = fVar289;
      auVar47._0_4_ = fVar277;
      fVar291 = auVar24._8_4_ * fVar291;
      auVar47._8_4_ = fVar291;
      fVar293 = auVar24._12_4_ * fVar293;
      auVar47._12_4_ = fVar293;
      fVar295 = auVar24._16_4_ * fVar295;
      auVar47._16_4_ = fVar295;
      fVar297 = auVar24._20_4_ * fVar297;
      auVar47._20_4_ = fVar297;
      fVar299 = auVar24._24_4_ * fVar299;
      auVar47._24_4_ = fVar299;
      auVar47._28_4_ = auVar24._28_4_;
      fStack_604 = fVar441 + auVar330._28_4_ + auVar329._28_4_;
      local_620[0] = fVar257 * (fVar431 + fVar254 * fVar408);
      local_620[1] = fVar269 * (fVar435 + fVar406 * fVar418);
      local_620[2] = fVar271 * (fVar436 + fVar139 * fVar315);
      local_620[3] = fVar273 * (fVar437 + fVar416 * fVar317);
      fStack_610 = fVar274 * (fVar438 + fVar140 * fVar319);
      fStack_60c = fVar275 * (fVar439 + fVar420 * fVar321);
      fStack_608 = fVar276 * (fVar440 + fVar423 * fVar323);
      local_640[0] = fVar257 * (fVar431 + fVar254 * fVar277);
      local_640[1] = fVar269 * (fVar435 + fVar406 * fVar289);
      local_640[2] = fVar271 * (fVar436 + fVar139 * fVar291);
      local_640[3] = fVar273 * (fVar437 + fVar416 * fVar293);
      fStack_630 = fVar274 * (fVar438 + fVar140 * fVar295);
      fStack_62c = fVar275 * (fVar439 + fVar420 * fVar297);
      fStack_628 = fVar276 * (fVar440 + fVar423 * fVar299);
      fStack_624 = fVar441 + fStack_604;
      auVar285._8_4_ = 0x7f800000;
      auVar285._0_8_ = 0x7f8000007f800000;
      auVar285._12_4_ = 0x7f800000;
      auVar285._16_4_ = 0x7f800000;
      auVar285._20_4_ = 0x7f800000;
      auVar285._24_4_ = 0x7f800000;
      auVar285._28_4_ = 0x7f800000;
      auVar123 = vblendvps_avx(auVar285,auVar46,auVar415);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar329 = vandps_avx(auVar42,auVar309);
      auVar329 = vmaxps_avx(local_440,auVar329);
      auVar334 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar48._4_4_ = auVar329._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar329._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar329._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar329._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar329._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar329._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar329._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar329._28_4_;
      auVar329 = vandps_avx(local_4c0,auVar309);
      auVar329 = vcmpps_avx(auVar329,auVar48,1);
      auVar286._8_4_ = 0xff800000;
      auVar286._0_8_ = 0xff800000ff800000;
      auVar286._12_4_ = 0xff800000;
      auVar286._16_4_ = 0xff800000;
      auVar286._20_4_ = 0xff800000;
      auVar286._24_4_ = 0xff800000;
      auVar286._28_4_ = 0xff800000;
      auVar433 = vblendvps_avx(auVar286,auVar47,auVar415);
      auVar330 = auVar415 & auVar329;
      if ((((((((auVar330 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar330 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar330 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar330 >> 0x7f,0) != '\0') ||
            (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar330 >> 0xbf,0) != '\0') ||
          (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar330[0x1f] < '\0') {
        auVar129 = vandps_avx(auVar329,auVar415);
        auVar152 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
        auVar74 = ZEXT812(0);
        auVar334 = ZEXT1264(auVar74) << 0x20;
        auVar329 = vcmpps_avx(auVar122,ZEXT1232(auVar74) << 0x20,2);
        auVar378._8_4_ = 0xff800000;
        auVar378._0_8_ = 0xff800000ff800000;
        auVar378._12_4_ = 0xff800000;
        auVar378._16_4_ = 0xff800000;
        auVar378._20_4_ = 0xff800000;
        auVar378._24_4_ = 0xff800000;
        auVar378._28_4_ = 0xff800000;
        auVar414._8_4_ = 0x7f800000;
        auVar414._0_8_ = 0x7f8000007f800000;
        auVar414._12_4_ = 0x7f800000;
        auVar414._16_4_ = 0x7f800000;
        auVar414._20_4_ = 0x7f800000;
        auVar414._24_4_ = 0x7f800000;
        auVar414._28_4_ = 0x7f800000;
        auVar122 = vblendvps_avx(auVar414,auVar378,auVar329);
        auVar159 = vpmovsxwd_avx(auVar152);
        auVar152 = vpunpckhwd_avx(auVar152,auVar152);
        auVar267._16_16_ = auVar152;
        auVar267._0_16_ = auVar159;
        auVar123 = vblendvps_avx(auVar123,auVar122,auVar267);
        auVar122 = vblendvps_avx(auVar378,auVar414,auVar329);
        auVar433 = vblendvps_avx(auVar433,auVar122,auVar267);
        auVar122 = vcmpps_avx(ZEXT1232(auVar74) << 0x20,ZEXT1232(auVar74) << 0x20,0xf);
        auVar176._0_4_ = auVar129._0_4_ ^ auVar122._0_4_;
        auVar176._4_4_ = auVar129._4_4_ ^ auVar122._4_4_;
        auVar176._8_4_ = auVar129._8_4_ ^ auVar122._8_4_;
        auVar176._12_4_ = auVar129._12_4_ ^ auVar122._12_4_;
        auVar176._16_4_ = auVar129._16_4_ ^ auVar122._16_4_;
        auVar176._20_4_ = auVar129._20_4_ ^ auVar122._20_4_;
        auVar176._24_4_ = auVar129._24_4_ ^ auVar122._24_4_;
        auVar176._28_4_ = auVar129._28_4_ ^ auVar122._28_4_;
        auVar129 = vorps_avx(auVar329,auVar176);
        auVar129 = vandps_avx(auVar415,auVar129);
      }
    }
    auVar122 = local_420 & auVar129;
    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0x7f,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar122 >> 0xbf,0) == '\0') &&
        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar122[0x1f])
    {
LAB_0107758e:
      auVar379 = ZEXT3264(local_820);
      auVar248 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      auVar152 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_890._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_890._0_4_
                                           )),0);
      auVar200._16_16_ = auVar152;
      auVar200._0_16_ = auVar152;
      auVar415 = vminps_avx(auVar200,auVar433);
      fVar295 = auVar287._28_4_;
      auVar125._0_4_ =
           (float)local_ac0._0_4_ * fVar300 +
           (float)local_8c0._0_4_ * fVar339 + (float)local_8e0._0_4_ * fVar387;
      auVar125._4_4_ =
           (float)local_ac0._4_4_ * fVar313 +
           (float)local_8c0._4_4_ * fVar345 + (float)local_8e0._4_4_ * fVar393;
      auVar125._8_4_ = fStack_ab8 * fVar314 + fStack_8b8 * fVar350 + fStack_8d8 * fVar396;
      auVar125._12_4_ = fStack_ab4 * fVar316 + fStack_8b4 * fVar355 + fStack_8d4 * fVar399;
      auVar125._16_4_ = fStack_ab0 * fVar318 + fStack_8b0 * fVar360 + fStack_8d0 * fVar401;
      auVar125._20_4_ = fStack_aac * fVar320 + fStack_8ac * fVar365 + fStack_8cc * fVar403;
      auVar125._24_4_ = fStack_aa8 * fVar322 + fStack_8a8 * fVar370 + fStack_8c8 * fVar405;
      auVar125._28_4_ = fVar325 + fVar374 + fVar295;
      auVar122 = vrcpps_avx(auVar125);
      fVar325 = auVar122._0_4_;
      fVar408 = auVar122._4_4_;
      auVar49._4_4_ = auVar125._4_4_ * fVar408;
      auVar49._0_4_ = auVar125._0_4_ * fVar325;
      fVar418 = auVar122._8_4_;
      auVar49._8_4_ = auVar125._8_4_ * fVar418;
      fVar277 = auVar122._12_4_;
      auVar49._12_4_ = auVar125._12_4_ * fVar277;
      fVar289 = auVar122._16_4_;
      auVar49._16_4_ = auVar125._16_4_ * fVar289;
      fVar291 = auVar122._20_4_;
      auVar49._20_4_ = auVar125._20_4_ * fVar291;
      fVar293 = auVar122._24_4_;
      auVar49._24_4_ = auVar125._24_4_ * fVar293;
      auVar49._28_4_ = fVar374;
      auVar328._8_4_ = 0x3f800000;
      auVar328._0_8_ = &DAT_3f8000003f800000;
      auVar328._12_4_ = 0x3f800000;
      auVar328._16_4_ = 0x3f800000;
      auVar328._20_4_ = 0x3f800000;
      auVar328._24_4_ = 0x3f800000;
      auVar328._28_4_ = 0x3f800000;
      auVar329 = vsubps_avx(auVar328,auVar49);
      auVar310._8_4_ = 0x7fffffff;
      auVar310._0_8_ = 0x7fffffff7fffffff;
      auVar310._12_4_ = 0x7fffffff;
      auVar310._16_4_ = 0x7fffffff;
      auVar310._20_4_ = 0x7fffffff;
      auVar310._24_4_ = 0x7fffffff;
      auVar310._28_4_ = 0x7fffffff;
      auVar122 = vandps_avx(auVar125,auVar310);
      auVar413._8_4_ = 0x219392ef;
      auVar413._0_8_ = 0x219392ef219392ef;
      auVar413._12_4_ = 0x219392ef;
      auVar413._16_4_ = 0x219392ef;
      auVar413._20_4_ = 0x219392ef;
      auVar413._24_4_ = 0x219392ef;
      auVar413._28_4_ = 0x219392ef;
      auVar287 = vcmpps_avx(auVar122,auVar413,1);
      auVar50._4_4_ =
           (fVar408 + fVar408 * auVar329._4_4_) *
           -(fVar313 * fVar444 + fVar345 * fVar268 + fVar393 * fVar256);
      auVar50._0_4_ =
           (fVar325 + fVar325 * auVar329._0_4_) *
           -(fVar300 * fVar442 + fVar339 * fVar232 + fVar387 * fVar231);
      auVar50._8_4_ =
           (fVar418 + fVar418 * auVar329._8_4_) *
           -(fVar314 * fVar445 + fVar350 * fVar290 + fVar396 * fVar288);
      auVar50._12_4_ =
           (fVar277 + fVar277 * auVar329._12_4_) *
           -(fVar316 * fVar446 + fVar355 * fVar336 + fVar399 * fVar324);
      auVar50._16_4_ =
           (fVar289 + fVar289 * auVar329._16_4_) *
           -(fVar318 * fVar447 + fVar360 * fVar367 + fVar401 * fVar362);
      auVar50._20_4_ =
           (fVar291 + fVar291 * auVar329._20_4_) *
           -(fVar320 * fVar448 + fVar365 * fVar392 + fVar403 * fVar250);
      auVar50._24_4_ =
           (fVar293 + fVar293 * auVar329._24_4_) *
           -(fVar322 * fVar449 + fVar370 * fVar404 + fVar405 * fVar402);
      auVar50._28_4_ = -(fVar295 + local_a40._28_4_ + fVar295);
      auVar329 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar122 = vcmpps_avx(auVar125,auVar329,1);
      auVar122 = vorps_avx(auVar287,auVar122);
      auVar382._8_4_ = 0xff800000;
      auVar382._0_8_ = 0xff800000ff800000;
      auVar382._12_4_ = 0xff800000;
      auVar382._16_4_ = 0xff800000;
      auVar382._20_4_ = 0xff800000;
      auVar382._24_4_ = 0xff800000;
      auVar382._28_4_ = 0xff800000;
      auVar383 = ZEXT3264(auVar382);
      auVar122 = vblendvps_avx(auVar50,auVar382,auVar122);
      auVar329 = vcmpps_avx(auVar125,auVar329,6);
      auVar287 = vorps_avx(auVar287,auVar329);
      auVar391._8_4_ = 0x7f800000;
      auVar391._0_8_ = 0x7f8000007f800000;
      auVar391._12_4_ = 0x7f800000;
      auVar391._16_4_ = 0x7f800000;
      auVar391._20_4_ = 0x7f800000;
      auVar391._24_4_ = 0x7f800000;
      auVar391._28_4_ = 0x7f800000;
      auVar287 = vblendvps_avx(auVar50,auVar391,auVar287);
      auVar329 = vmaxps_avx(local_260,auVar123);
      auVar329 = vmaxps_avx(auVar329,auVar122);
      auVar287 = vminps_avx(auVar415,auVar287);
      auVar330 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar122 = vsubps_avx(auVar330,local_a80);
      auVar415 = vsubps_avx(auVar330,_local_aa0);
      auVar51._4_4_ = auVar415._4_4_ * -fVar417;
      auVar51._0_4_ = auVar415._0_4_ * -fVar407;
      auVar51._8_4_ = auVar415._8_4_ * -fVar421;
      auVar51._12_4_ = auVar415._12_4_ * -fVar424;
      auVar51._16_4_ = auVar415._16_4_ * -fVar426;
      auVar51._20_4_ = auVar415._20_4_ * -fVar428;
      auVar51._24_4_ = auVar415._24_4_ * -fVar430;
      auVar51._28_4_ = auVar415._28_4_;
      auVar52._4_4_ = fVar346 * auVar122._4_4_;
      auVar52._0_4_ = fVar340 * auVar122._0_4_;
      auVar52._8_4_ = fVar351 * auVar122._8_4_;
      auVar52._12_4_ = fVar356 * auVar122._12_4_;
      auVar52._16_4_ = fVar361 * auVar122._16_4_;
      auVar52._20_4_ = fVar366 * auVar122._20_4_;
      auVar52._24_4_ = fVar371 * auVar122._24_4_;
      auVar52._28_4_ = auVar122._28_4_;
      auVar122 = vsubps_avx(auVar51,auVar52);
      auVar21 = vsubps_avx(auVar330,auVar21);
      auVar331._8_4_ = 0x3f800000;
      auVar331._0_8_ = &DAT_3f8000003f800000;
      auVar331._12_4_ = 0x3f800000;
      auVar331._16_4_ = 0x3f800000;
      auVar331._20_4_ = 0x3f800000;
      auVar331._24_4_ = 0x3f800000;
      auVar331._28_4_ = 0x3f800000;
      auVar334 = ZEXT3264(auVar331);
      auVar53._4_4_ = fVar252 * auVar21._4_4_;
      auVar53._0_4_ = fVar230 * auVar21._0_4_;
      auVar53._8_4_ = fVar255 * auVar21._8_4_;
      auVar53._12_4_ = fVar298 * auVar21._12_4_;
      auVar53._16_4_ = fVar357 * auVar21._16_4_;
      auVar53._20_4_ = fVar419 * auVar21._20_4_;
      uVar7 = auVar21._28_4_;
      auVar53._24_4_ = fVar400 * auVar21._24_4_;
      auVar53._28_4_ = uVar7;
      auVar415 = vsubps_avx(auVar122,auVar53);
      auVar54._4_4_ = (float)local_8e0._4_4_ * -fVar417;
      auVar54._0_4_ = (float)local_8e0._0_4_ * -fVar407;
      auVar54._8_4_ = fStack_8d8 * -fVar421;
      auVar54._12_4_ = fStack_8d4 * -fVar424;
      auVar54._16_4_ = fStack_8d0 * -fVar426;
      auVar54._20_4_ = fStack_8cc * -fVar428;
      auVar54._24_4_ = fStack_8c8 * -fVar430;
      auVar54._28_4_ = uVar96 ^ 0x80000000;
      auVar55._4_4_ = (float)local_8c0._4_4_ * fVar346;
      auVar55._0_4_ = (float)local_8c0._0_4_ * fVar340;
      auVar55._8_4_ = fStack_8b8 * fVar351;
      auVar55._12_4_ = fStack_8b4 * fVar356;
      auVar55._16_4_ = fStack_8b0 * fVar361;
      auVar55._20_4_ = fStack_8ac * fVar366;
      auVar55._24_4_ = fStack_8a8 * fVar371;
      auVar55._28_4_ = uVar7;
      auVar122 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = (float)local_ac0._4_4_ * fVar252;
      auVar56._0_4_ = (float)local_ac0._0_4_ * fVar230;
      auVar56._8_4_ = fStack_ab8 * fVar255;
      auVar56._12_4_ = fStack_ab4 * fVar298;
      auVar56._16_4_ = fStack_ab0 * fVar357;
      auVar56._20_4_ = fStack_aac * fVar419;
      auVar56._24_4_ = fStack_aa8 * fVar400;
      auVar56._28_4_ = uVar7;
      auVar330 = vsubps_avx(auVar122,auVar56);
      auVar122 = vrcpps_avx(auVar330);
      fVar230 = auVar122._0_4_;
      fVar231 = auVar122._4_4_;
      auVar57._4_4_ = auVar330._4_4_ * fVar231;
      auVar57._0_4_ = auVar330._0_4_ * fVar230;
      fVar232 = auVar122._8_4_;
      auVar57._8_4_ = auVar330._8_4_ * fVar232;
      fVar252 = auVar122._12_4_;
      auVar57._12_4_ = auVar330._12_4_ * fVar252;
      fVar256 = auVar122._16_4_;
      auVar57._16_4_ = auVar330._16_4_ * fVar256;
      fVar268 = auVar122._20_4_;
      auVar57._20_4_ = auVar330._20_4_ * fVar268;
      fVar255 = auVar122._24_4_;
      auVar57._24_4_ = auVar330._24_4_ * fVar255;
      auVar57._28_4_ = fStack_aa4;
      auVar24 = vsubps_avx(auVar331,auVar57);
      auVar126._8_4_ = 0x7fffffff;
      auVar126._0_8_ = 0x7fffffff7fffffff;
      auVar126._12_4_ = 0x7fffffff;
      auVar126._16_4_ = 0x7fffffff;
      auVar126._20_4_ = 0x7fffffff;
      auVar126._24_4_ = 0x7fffffff;
      auVar126._28_4_ = 0x7fffffff;
      auVar122 = vandps_avx(auVar330,auVar126);
      auVar21 = vcmpps_avx(auVar122,auVar413,1);
      auVar58._4_4_ = (fVar231 + fVar231 * auVar24._4_4_) * -auVar415._4_4_;
      auVar58._0_4_ = (fVar230 + fVar230 * auVar24._0_4_) * -auVar415._0_4_;
      auVar58._8_4_ = (fVar232 + fVar232 * auVar24._8_4_) * -auVar415._8_4_;
      auVar58._12_4_ = (fVar252 + fVar252 * auVar24._12_4_) * -auVar415._12_4_;
      auVar58._16_4_ = (fVar256 + fVar256 * auVar24._16_4_) * -auVar415._16_4_;
      auVar58._20_4_ = (fVar268 + fVar268 * auVar24._20_4_) * -auVar415._20_4_;
      auVar58._24_4_ = (fVar255 + fVar255 * auVar24._24_4_) * -auVar415._24_4_;
      auVar58._28_4_ = auVar415._28_4_ ^ 0x80000000;
      auVar122 = vcmpps_avx(auVar330,ZEXT832(0) << 0x20,1);
      auVar122 = vorps_avx(auVar21,auVar122);
      auVar122 = vblendvps_avx(auVar58,auVar382,auVar122);
      _local_6c0 = vmaxps_avx(auVar329,auVar122);
      auVar122 = vcmpps_avx(auVar330,ZEXT832(0) << 0x20,6);
      auVar122 = vorps_avx(auVar21,auVar122);
      auVar122 = vblendvps_avx(auVar58,auVar391,auVar122);
      auVar129 = vandps_avx(auVar129,local_420);
      local_280 = vminps_avx(auVar287,auVar122);
      auVar122 = vcmpps_avx(_local_6c0,local_280,2);
      auVar21 = auVar129 & auVar122;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        auVar248 = ZEXT3264(auVar331);
        auVar379 = ZEXT3264(local_820);
      }
      else {
        auVar21 = vminps_avx(local_920,auVar162);
        auVar287 = vminps_avx(_local_7e0,local_800);
        auVar21 = vminps_avx(auVar21,auVar287);
        auVar20 = vsubps_avx(auVar21,auVar20);
        auVar129 = vandps_avx(auVar122,auVar129);
        auVar95._4_4_ = local_620[1];
        auVar95._0_4_ = local_620[0];
        auVar95._8_4_ = local_620[2];
        auVar95._12_4_ = local_620[3];
        auVar95._16_4_ = fStack_610;
        auVar95._20_4_ = fStack_60c;
        auVar95._24_4_ = fStack_608;
        auVar95._28_4_ = fStack_604;
        auVar122 = vminps_avx(auVar95,auVar331);
        auVar122 = vmaxps_avx(auVar122,ZEXT832(0) << 0x20);
        local_620[0] = fVar106 + fVar142 * (auVar122._0_4_ + 0.0) * 0.125;
        local_620[1] = fVar137 + fVar178 * (auVar122._4_4_ + 1.0) * 0.125;
        local_620[2] = fVar138 + fVar180 * (auVar122._8_4_ + 2.0) * 0.125;
        local_620[3] = fStack_c24 + fVar182 * (auVar122._12_4_ + 3.0) * 0.125;
        fStack_610 = fVar106 + fVar142 * (auVar122._16_4_ + 4.0) * 0.125;
        fStack_60c = fVar137 + fVar178 * (auVar122._20_4_ + 5.0) * 0.125;
        fStack_608 = fVar138 + fVar180 * (auVar122._24_4_ + 6.0) * 0.125;
        fStack_604 = fStack_c24 + auVar122._28_4_ + 7.0;
        auVar94._4_4_ = local_640[1];
        auVar94._0_4_ = local_640[0];
        auVar94._8_4_ = local_640[2];
        auVar94._12_4_ = local_640[3];
        auVar94._16_4_ = fStack_630;
        auVar94._20_4_ = fStack_62c;
        auVar94._24_4_ = fStack_628;
        auVar94._28_4_ = fStack_624;
        auVar122 = vminps_avx(auVar94,auVar331);
        auVar122 = vmaxps_avx(auVar122,ZEXT832(0) << 0x20);
        local_640[0] = fVar106 + fVar142 * (auVar122._0_4_ + 0.0) * 0.125;
        local_640[1] = fVar137 + fVar178 * (auVar122._4_4_ + 1.0) * 0.125;
        local_640[2] = fVar138 + fVar180 * (auVar122._8_4_ + 2.0) * 0.125;
        local_640[3] = fStack_c24 + fVar182 * (auVar122._12_4_ + 3.0) * 0.125;
        fStack_630 = fVar106 + fVar142 * (auVar122._16_4_ + 4.0) * 0.125;
        fStack_62c = fVar137 + fVar178 * (auVar122._20_4_ + 5.0) * 0.125;
        fStack_628 = fVar138 + fVar180 * (auVar122._24_4_ + 6.0) * 0.125;
        fStack_624 = fStack_c24 + auVar122._28_4_ + 7.0;
        auVar60._4_4_ = auVar20._4_4_ * 0.99999976;
        auVar60._0_4_ = auVar20._0_4_ * 0.99999976;
        auVar60._8_4_ = auVar20._8_4_ * 0.99999976;
        auVar60._12_4_ = auVar20._12_4_ * 0.99999976;
        auVar60._16_4_ = auVar20._16_4_ * 0.99999976;
        auVar60._20_4_ = auVar20._20_4_ * 0.99999976;
        auVar60._24_4_ = auVar20._24_4_ * 0.99999976;
        auVar60._28_4_ = 0x3f7ffffc;
        auVar122 = vmaxps_avx(ZEXT832(0) << 0x20,auVar60);
        auVar61._4_4_ = auVar122._4_4_ * auVar122._4_4_;
        auVar61._0_4_ = auVar122._0_4_ * auVar122._0_4_;
        auVar61._8_4_ = auVar122._8_4_ * auVar122._8_4_;
        auVar61._12_4_ = auVar122._12_4_ * auVar122._12_4_;
        auVar61._16_4_ = auVar122._16_4_ * auVar122._16_4_;
        auVar61._20_4_ = auVar122._20_4_ * auVar122._20_4_;
        auVar61._24_4_ = auVar122._24_4_ * auVar122._24_4_;
        auVar61._28_4_ = auVar122._28_4_;
        auVar20 = vsubps_avx(auVar23,auVar61);
        auVar62._4_4_ = auVar20._4_4_ * fVar427 * 4.0;
        auVar62._0_4_ = auVar20._0_4_ * fVar425 * 4.0;
        auVar62._8_4_ = auVar20._8_4_ * fVar429 * 4.0;
        auVar62._12_4_ = auVar20._12_4_ * fVar183 * 4.0;
        auVar62._16_4_ = auVar20._16_4_ * fVar184 * 4.0;
        auVar62._20_4_ = auVar20._20_4_ * fVar185 * 4.0;
        auVar62._24_4_ = auVar20._24_4_ * fVar384 * 4.0;
        auVar62._28_4_ = auVar122._28_4_;
        auVar21 = vsubps_avx(auVar43,auVar62);
        _local_860 = ZEXT432(0) << 0x20;
        auVar122 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,5);
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) {
          _local_760 = ZEXT832(0) << 0x20;
          auVar225 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar244 = ZEXT828(0) << 0x20;
          auVar334 = ZEXT864(0) << 0x20;
          auVar202._8_4_ = 0x7f800000;
          auVar202._0_8_ = 0x7f8000007f800000;
          auVar202._12_4_ = 0x7f800000;
          auVar202._16_4_ = 0x7f800000;
          auVar202._20_4_ = 0x7f800000;
          auVar202._24_4_ = 0x7f800000;
          auVar202._28_4_ = 0x7f800000;
          auVar261._8_4_ = 0xff800000;
          auVar261._0_8_ = 0xff800000ff800000;
          auVar261._12_4_ = 0xff800000;
          auVar261._16_4_ = 0xff800000;
          auVar261._20_4_ = 0xff800000;
          auVar261._24_4_ = 0xff800000;
          auVar261._28_4_ = 0xff800000;
          _local_740 = _local_760;
        }
        else {
          auVar329 = vsqrtps_avx(auVar21);
          auVar245._0_4_ = fVar425 + fVar425;
          auVar245._4_4_ = fVar427 + fVar427;
          auVar245._8_4_ = fVar429 + fVar429;
          auVar245._12_4_ = fVar183 + fVar183;
          auVar245._16_4_ = fVar184 + fVar184;
          auVar245._20_4_ = fVar185 + fVar185;
          auVar245._24_4_ = fVar384 + fVar384;
          auVar245._28_4_ = fVar143 + fVar143;
          auVar287 = vrcpps_avx(auVar245);
          fVar143 = auVar287._0_4_;
          fVar230 = auVar287._4_4_;
          auVar63._4_4_ = auVar245._4_4_ * fVar230;
          auVar63._0_4_ = auVar245._0_4_ * fVar143;
          fVar231 = auVar287._8_4_;
          auVar63._8_4_ = auVar245._8_4_ * fVar231;
          fVar232 = auVar287._12_4_;
          auVar63._12_4_ = auVar245._12_4_ * fVar232;
          fVar252 = auVar287._16_4_;
          auVar63._16_4_ = auVar245._16_4_ * fVar252;
          fVar256 = auVar287._20_4_;
          auVar63._20_4_ = auVar245._20_4_ * fVar256;
          fVar268 = auVar287._24_4_;
          auVar63._24_4_ = auVar245._24_4_ * fVar268;
          auVar63._28_4_ = auVar245._28_4_;
          auVar23 = vsubps_avx(auVar331,auVar63);
          fVar143 = fVar143 + fVar143 * auVar23._0_4_;
          fVar230 = fVar230 + fVar230 * auVar23._4_4_;
          fVar231 = fVar231 + fVar231 * auVar23._8_4_;
          fVar232 = fVar232 + fVar232 * auVar23._12_4_;
          fVar252 = fVar252 + fVar252 * auVar23._16_4_;
          fVar256 = fVar256 + fVar256 * auVar23._20_4_;
          fVar268 = fVar268 + fVar268 * auVar23._24_4_;
          fVar255 = auVar287._28_4_ + auVar23._28_4_;
          auVar262._0_8_ = local_240._0_8_ ^ 0x8000000080000000;
          auVar262._8_4_ = -local_240._8_4_;
          auVar262._12_4_ = -local_240._12_4_;
          auVar262._16_4_ = -local_240._16_4_;
          auVar262._20_4_ = -local_240._20_4_;
          auVar262._24_4_ = -local_240._24_4_;
          auVar262._28_4_ = -local_240._28_4_;
          auVar287 = vsubps_avx(auVar262,auVar329);
          fVar367 = auVar287._0_4_ * fVar143;
          fVar419 = auVar287._4_4_ * fVar230;
          auVar64._4_4_ = fVar419;
          auVar64._0_4_ = fVar367;
          fVar250 = auVar287._8_4_ * fVar231;
          auVar64._8_4_ = fVar250;
          fVar392 = auVar287._12_4_ * fVar232;
          auVar64._12_4_ = fVar392;
          fVar400 = auVar287._16_4_ * fVar252;
          auVar64._16_4_ = fVar400;
          fVar402 = auVar287._20_4_ * fVar256;
          auVar64._20_4_ = fVar402;
          fVar404 = auVar287._24_4_ * fVar268;
          auVar64._24_4_ = fVar404;
          auVar64._28_4_ = fVar422;
          auVar329 = vsubps_avx(auVar329,local_240);
          fVar143 = auVar329._0_4_ * fVar143;
          fVar230 = auVar329._4_4_ * fVar230;
          auVar65._4_4_ = fVar230;
          auVar65._0_4_ = fVar143;
          fVar231 = auVar329._8_4_ * fVar231;
          auVar65._8_4_ = fVar231;
          fVar232 = auVar329._12_4_ * fVar232;
          auVar65._12_4_ = fVar232;
          fVar252 = auVar329._16_4_ * fVar252;
          auVar65._16_4_ = fVar252;
          fVar256 = auVar329._20_4_ * fVar256;
          auVar65._20_4_ = fVar256;
          fVar268 = auVar329._24_4_ * fVar268;
          auVar65._24_4_ = fVar268;
          auVar65._28_4_ = fVar397;
          fVar288 = (fVar367 * fVar254 + fVar431) * fVar257;
          fVar290 = (fVar419 * fVar406 + fVar435) * fVar269;
          fVar298 = (fVar250 * fVar139 + fVar436) * fVar271;
          fVar324 = (fVar392 * fVar416 + fVar437) * fVar273;
          fVar336 = (fVar400 * fVar140 + fVar438) * fVar274;
          fVar357 = (fVar402 * fVar420 + fVar439) * fVar275;
          fVar362 = (fVar404 * fVar423 + fVar440) * fVar276;
          auVar229._0_4_ = fVar337 + fVar217 * fVar288;
          auVar229._4_4_ = fVar343 + fVar251 * fVar290;
          auVar229._8_4_ = fVar348 + fVar253 * fVar298;
          auVar229._12_4_ = fVar353 + fVar296 * fVar324;
          auVar229._16_4_ = fVar358 + fVar352 * fVar336;
          auVar229._20_4_ = fVar363 + fVar386 * fVar357;
          auVar229._24_4_ = fVar368 + fVar398 * fVar362;
          auVar229._28_4_ = fVar372 + auVar329._28_4_ + fVar441;
          auVar66._4_4_ = (float)local_ac0._4_4_ * fVar419;
          auVar66._0_4_ = (float)local_ac0._0_4_ * fVar367;
          auVar66._8_4_ = fStack_ab8 * fVar250;
          auVar66._12_4_ = fStack_ab4 * fVar392;
          auVar66._16_4_ = fStack_ab0 * fVar400;
          auVar66._20_4_ = fStack_aac * fVar402;
          auVar66._24_4_ = fStack_aa8 * fVar404;
          auVar66._28_4_ = fVar255;
          _local_aa0 = vsubps_avx(auVar66,auVar229);
          auVar246._0_4_ = fVar338 + fVar179 * fVar288;
          auVar246._4_4_ = fVar344 + fVar233 * fVar290;
          auVar246._8_4_ = fVar349 + fVar270 * fVar298;
          auVar246._12_4_ = fVar354 + fVar292 * fVar324;
          auVar246._16_4_ = fVar359 + fVar342 * fVar336;
          auVar246._20_4_ = fVar364 + fVar380 * fVar357;
          auVar246._24_4_ = fVar369 + fVar394 * fVar362;
          auVar246._28_4_ = fVar373 + fVar255;
          auVar67._4_4_ = (float)local_8c0._4_4_ * fVar419;
          auVar67._0_4_ = (float)local_8c0._0_4_ * fVar367;
          auVar67._8_4_ = fStack_8b8 * fVar250;
          auVar67._12_4_ = fStack_8b4 * fVar392;
          auVar67._16_4_ = fStack_8b0 * fVar400;
          auVar67._20_4_ = fStack_8ac * fVar402;
          auVar67._24_4_ = fStack_8a8 * fVar404;
          auVar67._28_4_ = fStack_c24;
          auVar23 = vsubps_avx(auVar67,auVar246);
          auVar263._0_4_ = fVar186 + fVar181 * fVar288;
          auVar263._4_4_ = fVar210 + fVar249 * fVar290;
          auVar263._8_4_ = fVar211 + fVar272 * fVar298;
          auVar263._12_4_ = fVar212 + fVar294 * fVar324;
          auVar263._16_4_ = fVar213 + fVar347 * fVar336;
          auVar263._20_4_ = fVar214 + fVar385 * fVar357;
          auVar263._24_4_ = fVar215 + fVar395 * fVar362;
          auVar263._28_4_ = fVar216 + auVar287._28_4_;
          auVar68._4_4_ = (float)local_8e0._4_4_ * fVar419;
          auVar68._0_4_ = (float)local_8e0._0_4_ * fVar367;
          auVar68._8_4_ = fStack_8d8 * fVar250;
          auVar68._12_4_ = fStack_8d4 * fVar392;
          auVar68._16_4_ = fStack_8d0 * fVar400;
          auVar68._20_4_ = fStack_8cc * fVar402;
          auVar68._24_4_ = fStack_8c8 * fVar404;
          auVar68._28_4_ = fStack_c24;
          local_940 = vsubps_avx(auVar68,auVar263);
          fVar257 = (fVar143 * fVar254 + fVar431) * fVar257;
          fVar269 = (fVar230 * fVar406 + fVar435) * fVar269;
          fVar271 = (fVar231 * fVar139 + fVar436) * fVar271;
          fVar273 = (fVar232 * fVar416 + fVar437) * fVar273;
          fVar274 = (fVar252 * fVar140 + fVar438) * fVar274;
          fVar275 = (fVar256 * fVar420 + fVar439) * fVar275;
          fVar276 = (fVar268 * fVar423 + fVar440) * fVar276;
          auVar311._0_4_ = fVar337 + fVar217 * fVar257;
          auVar311._4_4_ = fVar343 + fVar251 * fVar269;
          auVar311._8_4_ = fVar348 + fVar253 * fVar271;
          auVar311._12_4_ = fVar353 + fVar296 * fVar273;
          auVar311._16_4_ = fVar358 + fVar352 * fVar274;
          auVar311._20_4_ = fVar363 + fVar386 * fVar275;
          auVar311._24_4_ = fVar368 + fVar398 * fVar276;
          auVar311._28_4_ = fVar372 + fStack_c24;
          auVar69._4_4_ = (float)local_ac0._4_4_ * fVar230;
          auVar69._0_4_ = (float)local_ac0._0_4_ * fVar143;
          auVar69._8_4_ = fStack_ab8 * fVar231;
          auVar69._12_4_ = fStack_ab4 * fVar232;
          auVar69._16_4_ = fStack_ab0 * fVar252;
          auVar69._20_4_ = fStack_aac * fVar256;
          auVar69._24_4_ = fStack_aa8 * fVar268;
          auVar69._28_4_ = fStack_aa4;
          _local_860 = vsubps_avx(auVar69,auVar311);
          auVar312._0_4_ = fVar338 + fVar179 * fVar257;
          auVar312._4_4_ = fVar344 + fVar233 * fVar269;
          auVar312._8_4_ = fVar349 + fVar270 * fVar271;
          auVar312._12_4_ = fVar354 + fVar292 * fVar273;
          auVar312._16_4_ = fVar359 + fVar342 * fVar274;
          auVar312._20_4_ = fVar364 + fVar380 * fVar275;
          auVar312._24_4_ = fVar369 + fVar394 * fVar276;
          auVar312._28_4_ = fVar373 + local_860._28_4_;
          auVar70._4_4_ = (float)local_8c0._4_4_ * fVar230;
          auVar70._0_4_ = (float)local_8c0._0_4_ * fVar143;
          auVar70._8_4_ = fStack_8b8 * fVar231;
          auVar70._12_4_ = fStack_8b4 * fVar232;
          auVar70._16_4_ = fStack_8b0 * fVar252;
          auVar70._20_4_ = fStack_8ac * fVar256;
          auVar70._24_4_ = fStack_8a8 * fVar268;
          auVar70._28_4_ = fStack_aa4;
          _local_740 = vsubps_avx(auVar70,auVar312);
          auVar264._0_4_ = fVar186 + fVar181 * fVar257;
          auVar264._4_4_ = fVar210 + fVar249 * fVar269;
          auVar264._8_4_ = fVar211 + fVar272 * fVar271;
          auVar264._12_4_ = fVar212 + fVar294 * fVar273;
          auVar264._16_4_ = fVar213 + fVar347 * fVar274;
          auVar264._20_4_ = fVar214 + fVar385 * fVar275;
          auVar264._24_4_ = fVar215 + fVar395 * fVar276;
          auVar264._28_4_ = fVar216 + local_940._28_4_ + fVar441;
          auVar71._4_4_ = (float)local_8e0._4_4_ * fVar230;
          auVar71._0_4_ = (float)local_8e0._0_4_ * fVar143;
          auVar71._8_4_ = fStack_8d8 * fVar231;
          auVar71._12_4_ = fStack_8d4 * fVar232;
          auVar71._16_4_ = fStack_8d0 * fVar252;
          auVar71._20_4_ = fStack_8cc * fVar256;
          auVar71._24_4_ = fStack_8c8 * fVar268;
          auVar71._28_4_ = local_740._28_4_;
          _local_760 = vsubps_avx(auVar71,auVar264);
          auVar287 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,5);
          auVar203._8_4_ = 0x7f800000;
          auVar203._0_8_ = 0x7f8000007f800000;
          auVar203._12_4_ = 0x7f800000;
          auVar203._16_4_ = 0x7f800000;
          auVar203._20_4_ = 0x7f800000;
          auVar203._24_4_ = 0x7f800000;
          auVar203._28_4_ = 0x7f800000;
          auVar202 = vblendvps_avx(auVar203,auVar64,auVar287);
          auVar332._8_4_ = 0x7fffffff;
          auVar332._0_8_ = 0x7fffffff7fffffff;
          auVar332._12_4_ = 0x7fffffff;
          auVar332._16_4_ = 0x7fffffff;
          auVar332._20_4_ = 0x7fffffff;
          auVar332._24_4_ = 0x7fffffff;
          auVar332._28_4_ = 0x7fffffff;
          auVar21 = vandps_avx(auVar332,auVar42);
          auVar21 = vmaxps_avx(local_440,auVar21);
          auVar72._4_4_ = auVar21._4_4_ * 1.9073486e-06;
          auVar72._0_4_ = auVar21._0_4_ * 1.9073486e-06;
          auVar72._8_4_ = auVar21._8_4_ * 1.9073486e-06;
          auVar72._12_4_ = auVar21._12_4_ * 1.9073486e-06;
          auVar72._16_4_ = auVar21._16_4_ * 1.9073486e-06;
          auVar72._20_4_ = auVar21._20_4_ * 1.9073486e-06;
          auVar72._24_4_ = auVar21._24_4_ * 1.9073486e-06;
          auVar72._28_4_ = auVar21._28_4_;
          auVar21 = vandps_avx(auVar332,local_4c0);
          auVar329 = vcmpps_avx(auVar21,auVar72,1);
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
          auVar261 = vblendvps_avx(auVar265,auVar65,auVar287);
          auVar415 = auVar287 & auVar329;
          auVar21 = auVar22;
          if ((((((((auVar415 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar415 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar415 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar415 >> 0x7f,0) != '\0') ||
                (auVar415 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar415 >> 0xbf,0) != '\0') ||
              (auVar415 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar415[0x1f] < '\0') {
            auVar122 = vandps_avx(auVar329,auVar287);
            auVar152 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
            auVar415 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar329 = vcmpps_avx(auVar20,auVar415,2);
            auVar434._8_4_ = 0xff800000;
            auVar434._0_8_ = 0xff800000ff800000;
            auVar434._12_4_ = 0xff800000;
            auVar434._16_4_ = 0xff800000;
            auVar434._20_4_ = 0xff800000;
            auVar434._24_4_ = 0xff800000;
            auVar434._28_4_ = 0xff800000;
            auVar443._8_4_ = 0x7f800000;
            auVar443._0_8_ = 0x7f8000007f800000;
            auVar443._12_4_ = 0x7f800000;
            auVar443._16_4_ = 0x7f800000;
            auVar443._20_4_ = 0x7f800000;
            auVar443._24_4_ = 0x7f800000;
            auVar443._28_4_ = 0x7f800000;
            auVar20 = vblendvps_avx(auVar443,auVar434,auVar329);
            auVar159 = vpmovsxwd_avx(auVar152);
            auVar152 = vpunpckhwd_avx(auVar152,auVar152);
            auVar333._16_16_ = auVar152;
            auVar333._0_16_ = auVar159;
            auVar202 = vblendvps_avx(auVar202,auVar20,auVar333);
            auVar21 = vblendvps_avx(auVar434,auVar443,auVar329);
            auVar261 = vblendvps_avx(auVar261,auVar21,auVar333);
            auVar20 = vcmpps_avx(auVar415,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar177._0_4_ = auVar20._0_4_ ^ auVar122._0_4_;
            auVar177._4_4_ = auVar20._4_4_ ^ auVar122._4_4_;
            auVar177._8_4_ = auVar20._8_4_ ^ auVar122._8_4_;
            auVar177._12_4_ = auVar20._12_4_ ^ auVar122._12_4_;
            auVar177._16_4_ = auVar20._16_4_ ^ auVar122._16_4_;
            auVar177._20_4_ = auVar20._20_4_ ^ auVar122._20_4_;
            auVar177._24_4_ = auVar20._24_4_ ^ auVar122._24_4_;
            auVar177._28_4_ = auVar20._28_4_ ^ auVar122._28_4_;
            auVar122 = vorps_avx(auVar329,auVar177);
            auVar122 = vandps_avx(auVar287,auVar122);
          }
          auVar383 = ZEXT3264(auVar21);
          auVar225 = local_aa0._0_28_;
          auVar244 = auVar23._0_28_;
          auVar334 = ZEXT3264(local_940);
          local_a80 = auVar129;
        }
        _local_2e0 = _local_6c0;
        local_2c0 = vminps_avx(local_280,auVar202);
        auVar21 = vmaxps_avx(_local_6c0,auVar261);
        _local_2a0 = auVar21;
        auVar20 = vcmpps_avx(_local_6c0,local_2c0,2);
        local_780 = vandps_avx(auVar20,auVar129);
        auVar20 = vcmpps_avx(auVar21,local_280,2);
        local_700 = vandps_avx(auVar20,auVar129);
        auVar129 = vorps_avx(local_700,local_780);
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0x7f,0) == '\0') &&
              (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar129 >> 0xbf,0) == '\0') &&
            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar129[0x1f]) goto LAB_0107758e;
        local_960 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        local_680._0_4_ = auVar122._0_4_ ^ local_960._0_4_;
        local_680._4_4_ = auVar122._4_4_ ^ local_960._4_4_;
        local_680._8_4_ = auVar122._8_4_ ^ local_960._8_4_;
        local_680._12_4_ = auVar122._12_4_ ^ local_960._12_4_;
        local_680._16_4_ = auVar122._16_4_ ^ local_960._16_4_;
        local_680._20_4_ = auVar122._20_4_ ^ local_960._20_4_;
        local_680._24_4_ = auVar122._24_4_ ^ local_960._24_4_;
        local_680._28_4_ = auVar122._28_4_ ^ (uint)local_960._28_4_;
        auVar128._0_4_ =
             (float)local_ac0._0_4_ * auVar225._0_4_ +
             (float)local_8c0._0_4_ * auVar244._0_4_ + (float)local_8e0._0_4_ * auVar334._0_4_;
        auVar128._4_4_ =
             (float)local_ac0._4_4_ * auVar225._4_4_ +
             (float)local_8c0._4_4_ * auVar244._4_4_ + (float)local_8e0._4_4_ * auVar334._4_4_;
        auVar128._8_4_ =
             fStack_ab8 * auVar225._8_4_ + fStack_8b8 * auVar244._8_4_ + fStack_8d8 * auVar334._8_4_
        ;
        auVar128._12_4_ =
             fStack_ab4 * auVar225._12_4_ +
             fStack_8b4 * auVar244._12_4_ + fStack_8d4 * auVar334._12_4_;
        auVar128._16_4_ =
             fStack_ab0 * auVar225._16_4_ +
             fStack_8b0 * auVar244._16_4_ + fStack_8d0 * auVar334._16_4_;
        auVar128._20_4_ =
             fStack_aac * auVar225._20_4_ +
             fStack_8ac * auVar244._20_4_ + fStack_8cc * auVar334._20_4_;
        auVar128._24_4_ =
             fStack_aa8 * auVar225._24_4_ +
             fStack_8a8 * auVar244._24_4_ + fStack_8c8 * auVar334._24_4_;
        auVar128._28_4_ = local_960._28_4_ + fStack_aa4 + local_780._28_4_;
        auVar163._8_4_ = 0x7fffffff;
        auVar163._0_8_ = 0x7fffffff7fffffff;
        auVar163._12_4_ = 0x7fffffff;
        auVar163._16_4_ = 0x7fffffff;
        auVar163._20_4_ = 0x7fffffff;
        auVar163._24_4_ = 0x7fffffff;
        auVar163._28_4_ = 0x7fffffff;
        auVar129 = vandps_avx(auVar128,auVar163);
        auVar164._8_4_ = 0x3e99999a;
        auVar164._0_8_ = 0x3e99999a3e99999a;
        auVar164._12_4_ = 0x3e99999a;
        auVar164._16_4_ = 0x3e99999a;
        auVar164._20_4_ = 0x3e99999a;
        auVar164._24_4_ = 0x3e99999a;
        auVar164._28_4_ = 0x3e99999a;
        auVar129 = vcmpps_avx(auVar129,auVar164,1);
        auVar129 = vorps_avx(auVar129,local_680);
        auVar165._8_4_ = 3;
        auVar165._0_8_ = 0x300000003;
        auVar165._12_4_ = 3;
        auVar165._16_4_ = 3;
        auVar165._20_4_ = 3;
        auVar165._24_4_ = 3;
        auVar165._28_4_ = 3;
        auVar204._8_4_ = 2;
        auVar204._0_8_ = 0x200000002;
        auVar204._12_4_ = 2;
        auVar204._16_4_ = 2;
        auVar204._20_4_ = 2;
        auVar204._24_4_ = 2;
        auVar204._28_4_ = 2;
        auVar129 = vblendvps_avx(auVar204,auVar165,auVar129);
        local_660 = ZEXT432((uint)uVar105);
        local_6a0 = vpshufd_avx(ZEXT416((uint)uVar105),0);
        auVar152 = vpcmpgtd_avx(auVar129._16_16_,local_6a0);
        auStack_690 = auVar22._16_16_;
        auVar159 = vpcmpgtd_avx(auVar129._0_16_,local_6a0);
        auVar166._16_16_ = auVar152;
        auVar166._0_16_ = auVar159;
        auVar129 = vblendps_avx(ZEXT1632(auVar159),auVar166,0xf0);
        local_6e0 = vandnps_avx(auVar129,local_780);
        auVar248 = ZEXT3264(local_6e0);
        auVar122 = local_780 & ~auVar129;
        auStack_718 = auVar162._8_24_;
        local_720 = uVar105;
        local_7a0 = auVar129;
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) {
          auVar379 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar287 = local_700;
          fVar179 = (float)local_8e0._0_4_;
          fVar181 = (float)local_8e0._4_4_;
          fVar217 = fStack_8d8;
          fVar232 = fStack_8d4;
          fVar233 = fStack_8d0;
          fVar249 = fStack_8cc;
          fVar251 = fStack_8c8;
          fVar252 = (float)local_8c0._0_4_;
          fVar256 = (float)local_8c0._4_4_;
          fVar268 = fStack_8b8;
          fVar270 = fStack_8b4;
          fVar272 = fStack_8b0;
          fVar253 = fStack_8ac;
          fVar255 = fStack_8a8;
          fVar288 = (float)local_ac0._0_4_;
          fVar290 = (float)local_ac0._4_4_;
          fVar292 = fStack_ab8;
          fVar294 = fStack_ab4;
          fVar296 = fStack_ab0;
          fVar298 = fStack_aac;
          fVar324 = fStack_aa8;
        }
        else {
          local_840._4_4_ = (float)local_6c0._4_4_ + (float)local_9a0._4_4_;
          local_840._0_4_ = (float)local_6c0._0_4_ + (float)local_9a0._0_4_;
          fStack_838 = fStack_6b8 + fStack_998;
          fStack_834 = fStack_6b4 + fStack_994;
          fStack_830 = fStack_6b0 + fStack_990;
          fStack_82c = fStack_6ac + fStack_98c;
          fStack_828 = fStack_6a8 + fStack_988;
          fStack_824 = fStack_6a4 + fStack_984;
          auVar379 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_a40 = local_700;
          do {
            auVar236 = auVar379._0_16_;
            auVar167._8_4_ = 0x7f800000;
            auVar167._0_8_ = 0x7f8000007f800000;
            auVar167._12_4_ = 0x7f800000;
            auVar167._16_4_ = 0x7f800000;
            auVar167._20_4_ = 0x7f800000;
            auVar167._24_4_ = 0x7f800000;
            auVar167._28_4_ = 0x7f800000;
            auVar129 = auVar248._0_32_;
            auVar122 = vblendvps_avx(auVar167,_local_6c0,auVar129);
            auVar20 = vshufps_avx(auVar122,auVar122,0xb1);
            auVar20 = vminps_avx(auVar122,auVar20);
            auVar287 = vshufpd_avx(auVar20,auVar20,5);
            auVar20 = vminps_avx(auVar20,auVar287);
            auVar287 = vperm2f128_avx(auVar20,auVar20,1);
            auVar20 = vminps_avx(auVar20,auVar287);
            auVar122 = vcmpps_avx(auVar122,auVar20,0);
            auVar20 = auVar129 & auVar122;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0x7f,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0xbf,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar20[0x1f] < '\0') {
              auVar129 = vandps_avx(auVar122,auVar129);
            }
            local_800._0_8_ = uVar104;
            uVar97 = vmovmskps_avx(auVar129);
            uVar96 = 0;
            if (uVar97 != 0) {
              for (; (uVar97 >> uVar96 & 1) == 0; uVar96 = uVar96 + 1) {
              }
            }
            uVar105 = (ulong)uVar96;
            *(undefined4 *)(local_6e0 + uVar105 * 4) = 0;
            fVar143 = local_620[uVar105];
            uVar96 = *(uint *)(local_2e0 + uVar105 * 4);
            fVar179 = auVar149._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              fVar179 = sqrtf((float)local_980._0_4_);
              auVar236._8_4_ = 0x7fffffff;
              auVar236._0_8_ = 0x7fffffff7fffffff;
              auVar236._12_4_ = 0x7fffffff;
            }
            auVar383 = ZEXT464((uint)fVar143);
            auVar248 = ZEXT464(uVar96);
            auVar159 = vminps_avx(_local_ad0,_local_af0);
            auVar152 = vmaxps_avx(_local_ad0,_local_af0);
            auVar117 = vminps_avx(_local_ae0,_local_b00);
            auVar116 = vminps_avx(auVar159,auVar117);
            auVar159 = vmaxps_avx(_local_ae0,_local_b00);
            auVar117 = vmaxps_avx(auVar152,auVar159);
            auVar152 = vandps_avx(auVar116,auVar236);
            auVar159 = vandps_avx(auVar117,auVar236);
            auVar152 = vmaxps_avx(auVar152,auVar159);
            auVar159 = vmovshdup_avx(auVar152);
            auVar159 = vmaxss_avx(auVar159,auVar152);
            auVar152 = vshufpd_avx(auVar152,auVar152,1);
            auVar152 = vmaxss_avx(auVar152,auVar159);
            local_a80._0_4_ = auVar152._0_4_ * 1.9073486e-06;
            local_7c0._0_4_ = fVar179 * 1.9073486e-06;
            _local_7e0 = vshufps_avx(auVar117,auVar117,0xff);
            lVar101 = 5;
            do {
              local_ca0 = auVar248._0_4_;
              auVar152 = vshufps_avx(auVar248._0_16_,auVar248._0_16_,0);
              auVar111._0_4_ = auVar152._0_4_ * (float)local_970._0_4_ + 0.0;
              auVar111._4_4_ = auVar152._4_4_ * (float)local_970._4_4_ + 0.0;
              auVar111._8_4_ = auVar152._8_4_ * fStack_968 + 0.0;
              auVar111._12_4_ = auVar152._12_4_ * fStack_964 + 0.0;
              fVar230 = auVar383._0_4_;
              fVar217 = 1.0 - fVar230;
              fVar181 = fVar230 * 3.0;
              fVar143 = fVar181 + -5.0;
              auVar152 = ZEXT416((uint)(fVar230 * fVar230 * -fVar217 * 0.5));
              auVar152 = vshufps_avx(auVar152,auVar152,0);
              auVar159 = ZEXT416((uint)((fVar217 * fVar217 * (fVar217 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar159 = vshufps_avx(auVar159,auVar159,0);
              auVar117 = ZEXT416((uint)((fVar230 * fVar230 * fVar143 + 2.0) * 0.5));
              auVar117 = vshufps_avx(auVar117,auVar117,0);
              auVar116 = ZEXT416((uint)(fVar217 * fVar217 * -fVar230 * 0.5));
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              auVar191._0_4_ =
                   auVar116._0_4_ * (float)local_ad0._0_4_ +
                   auVar117._0_4_ * (float)local_af0._0_4_ +
                   auVar159._0_4_ * (float)local_ae0._0_4_ + auVar152._0_4_ * (float)local_b00._0_4_
              ;
              auVar191._4_4_ =
                   auVar116._4_4_ * (float)local_ad0._4_4_ +
                   auVar117._4_4_ * (float)local_af0._4_4_ +
                   auVar159._4_4_ * (float)local_ae0._4_4_ + auVar152._4_4_ * (float)local_b00._4_4_
              ;
              auVar191._8_4_ =
                   auVar116._8_4_ * fStack_ac8 +
                   auVar117._8_4_ * fStack_ae8 +
                   auVar159._8_4_ * fStack_ad8 + auVar152._8_4_ * fStack_af8;
              auVar191._12_4_ =
                   auVar116._12_4_ * fStack_ac4 +
                   auVar117._12_4_ * fStack_ae4 +
                   auVar159._12_4_ * fStack_ad4 + auVar152._12_4_ * fStack_af4;
              local_940._0_16_ = auVar191;
              auVar152 = vsubps_avx(auVar111,auVar191);
              _local_aa0 = auVar152;
              auVar152 = vdpps_avx(auVar152,auVar152,0x7f);
              fVar179 = fVar230 * -9.0 + 4.0;
              fVar231 = auVar152._0_4_;
              if (fVar231 < 0.0) {
                local_a60._0_4_ = fVar230 * 9.0;
                local_9c0._0_4_ = fVar143;
                local_900._0_16_ = ZEXT416((uint)fVar179);
                local_920._0_4_ = fVar217 * -2.0;
                fVar232 = sqrtf(fVar231);
                fVar249 = (float)local_a60._0_4_;
                fVar233 = (float)local_920._0_4_;
                fVar143 = (float)local_9c0._0_4_;
                auVar159 = local_900._0_16_;
              }
              else {
                auVar159 = vsqrtss_avx(auVar152,auVar152);
                fVar232 = auVar159._0_4_;
                fVar249 = fVar230 * 9.0;
                fVar233 = fVar217 * -2.0;
                auVar159 = ZEXT416((uint)fVar179);
              }
              auVar117 = ZEXT416((uint)((fVar230 * fVar230 + fVar230 * fVar233) * 0.5));
              auVar117 = vshufps_avx(auVar117,auVar117,0);
              auVar116 = ZEXT416((uint)(((fVar217 + fVar217) * (fVar181 + 2.0) +
                                        fVar217 * fVar217 * -3.0) * 0.5));
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              auVar196 = ZEXT416((uint)((fVar143 * (fVar230 + fVar230) + fVar230 * fVar181) * 0.5));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar155 = ZEXT416((uint)((fVar230 * (fVar217 + fVar217) - fVar217 * fVar217) * 0.5));
              auVar155 = vshufps_avx(auVar155,auVar155,0);
              auVar376._0_4_ =
                   (float)local_ad0._0_4_ * auVar155._0_4_ +
                   (float)local_af0._0_4_ * auVar196._0_4_ +
                   (float)local_b00._0_4_ * auVar117._0_4_ + (float)local_ae0._0_4_ * auVar116._0_4_
              ;
              auVar376._4_4_ =
                   (float)local_ad0._4_4_ * auVar155._4_4_ +
                   (float)local_af0._4_4_ * auVar196._4_4_ +
                   (float)local_b00._4_4_ * auVar117._4_4_ + (float)local_ae0._4_4_ * auVar116._4_4_
              ;
              auVar376._8_4_ =
                   fStack_ac8 * auVar155._8_4_ +
                   fStack_ae8 * auVar196._8_4_ +
                   fStack_af8 * auVar117._8_4_ + fStack_ad8 * auVar116._8_4_;
              auVar376._12_4_ =
                   fStack_ac4 * auVar155._12_4_ +
                   fStack_ae4 * auVar196._12_4_ +
                   fStack_af4 * auVar117._12_4_ + fStack_ad4 * auVar116._12_4_;
              auVar155 = vpermilps_avx(ZEXT416((uint)(fVar181 + -1.0)),0);
              auVar159 = vshufps_avx(auVar159,auVar159,0);
              auVar116 = vshufps_avx(ZEXT416((uint)(fVar249 + -5.0)),ZEXT416((uint)(fVar249 + -5.0))
                                     ,0);
              auVar117 = ZEXT416((uint)(fVar230 * -3.0 + 2.0));
              auVar196 = vshufps_avx(auVar117,auVar117,0);
              auVar117 = vdpps_avx(auVar376,auVar376,0x7f);
              auVar150._0_4_ =
                   (float)local_ad0._0_4_ * auVar196._0_4_ +
                   (float)local_af0._0_4_ * auVar116._0_4_ +
                   (float)local_ae0._0_4_ * auVar159._0_4_ + (float)local_b00._0_4_ * auVar155._0_4_
              ;
              auVar150._4_4_ =
                   (float)local_ad0._4_4_ * auVar196._4_4_ +
                   (float)local_af0._4_4_ * auVar116._4_4_ +
                   (float)local_ae0._4_4_ * auVar159._4_4_ + (float)local_b00._4_4_ * auVar155._4_4_
              ;
              auVar150._8_4_ =
                   fStack_ac8 * auVar196._8_4_ +
                   fStack_ae8 * auVar116._8_4_ +
                   fStack_ad8 * auVar159._8_4_ + fStack_af8 * auVar155._8_4_;
              auVar150._12_4_ =
                   fStack_ac4 * auVar196._12_4_ +
                   fStack_ae4 * auVar116._12_4_ +
                   fStack_ad4 * auVar159._12_4_ + fStack_af4 * auVar155._12_4_;
              auVar159 = vblendps_avx(auVar117,_DAT_01feba10,0xe);
              auVar116 = vrsqrtss_avx(auVar159,auVar159);
              fVar179 = auVar116._0_4_;
              fVar143 = auVar117._0_4_;
              auVar116 = vdpps_avx(auVar376,auVar150,0x7f);
              auVar196 = vshufps_avx(auVar117,auVar117,0);
              auVar151._0_4_ = auVar150._0_4_ * auVar196._0_4_;
              auVar151._4_4_ = auVar150._4_4_ * auVar196._4_4_;
              auVar151._8_4_ = auVar150._8_4_ * auVar196._8_4_;
              auVar151._12_4_ = auVar150._12_4_ * auVar196._12_4_;
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              auVar237._0_4_ = auVar376._0_4_ * auVar116._0_4_;
              auVar237._4_4_ = auVar376._4_4_ * auVar116._4_4_;
              auVar237._8_4_ = auVar376._8_4_ * auVar116._8_4_;
              auVar237._12_4_ = auVar376._12_4_ * auVar116._12_4_;
              auVar155 = vsubps_avx(auVar151,auVar237);
              auVar116 = vrcpss_avx(auVar159,auVar159);
              auVar159 = vmaxss_avx(ZEXT416((uint)local_a80._0_4_),
                                    ZEXT416((uint)((float)local_7c0._0_4_ * local_ca0)));
              auVar116 = ZEXT416((uint)(auVar116._0_4_ * (2.0 - fVar143 * auVar116._0_4_)));
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              uVar105 = CONCAT44(auVar376._4_4_,auVar376._0_4_);
              auVar306._0_8_ = uVar105 ^ 0x8000000080000000;
              auVar306._8_4_ = -auVar376._8_4_;
              auVar306._12_4_ = -auVar376._12_4_;
              auVar196 = ZEXT416((uint)(fVar179 * 1.5 + fVar143 * -0.5 * fVar179 * fVar179 * fVar179
                                       ));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar221._0_4_ = auVar196._0_4_ * auVar155._0_4_ * auVar116._0_4_;
              auVar221._4_4_ = auVar196._4_4_ * auVar155._4_4_ * auVar116._4_4_;
              auVar221._8_4_ = auVar196._8_4_ * auVar155._8_4_ * auVar116._8_4_;
              auVar221._12_4_ = auVar196._12_4_ * auVar155._12_4_ * auVar116._12_4_;
              auVar282._0_4_ = auVar376._0_4_ * auVar196._0_4_;
              auVar282._4_4_ = auVar376._4_4_ * auVar196._4_4_;
              auVar282._8_4_ = auVar376._8_4_ * auVar196._8_4_;
              auVar282._12_4_ = auVar376._12_4_ * auVar196._12_4_;
              if (fVar143 < 0.0) {
                local_a60._0_16_ = auVar221;
                fVar143 = sqrtf(fVar143);
                auVar221 = local_a60._0_16_;
              }
              else {
                auVar117 = vsqrtss_avx(auVar117,auVar117);
                fVar143 = auVar117._0_4_;
              }
              auVar117 = vdpps_avx(_local_aa0,auVar282,0x7f);
              fVar143 = ((float)local_a80._0_4_ / fVar143) * (fVar232 + 1.0) +
                        auVar159._0_4_ + fVar232 * (float)local_a80._0_4_;
              auVar116 = vdpps_avx(auVar306,auVar282,0x7f);
              auVar196 = vdpps_avx(_local_aa0,auVar221,0x7f);
              auVar155 = vdpps_avx(_local_970,auVar282,0x7f);
              auVar158 = vdpps_avx(_local_aa0,auVar306,0x7f);
              fVar179 = auVar116._0_4_ + auVar196._0_4_;
              fVar181 = auVar117._0_4_;
              auVar112._0_4_ = fVar181 * fVar181;
              auVar112._4_4_ = auVar117._4_4_ * auVar117._4_4_;
              auVar112._8_4_ = auVar117._8_4_ * auVar117._8_4_;
              auVar112._12_4_ = auVar117._12_4_ * auVar117._12_4_;
              auVar196 = vsubps_avx(auVar152,auVar112);
              auVar116 = vdpps_avx(_local_aa0,_local_970,0x7f);
              fVar217 = auVar158._0_4_ - fVar181 * fVar179;
              fVar232 = auVar116._0_4_ - fVar181 * auVar155._0_4_;
              auVar116 = vrsqrtss_avx(auVar196,auVar196);
              fVar233 = auVar196._0_4_;
              fVar181 = auVar116._0_4_;
              fVar181 = fVar181 * 1.5 + fVar233 * -0.5 * fVar181 * fVar181 * fVar181;
              if (fVar233 < 0.0) {
                local_a60._0_16_ = auVar155;
                local_9c0._0_4_ = fVar217;
                local_900._0_4_ = fVar232;
                local_920._0_4_ = fVar181;
                fVar233 = sqrtf(fVar233);
                fVar181 = (float)local_920._0_4_;
                fVar217 = (float)local_9c0._0_4_;
                fVar232 = (float)local_900._0_4_;
                auVar155 = local_a60._0_16_;
              }
              else {
                auVar116 = vsqrtss_avx(auVar196,auVar196);
                fVar233 = auVar116._0_4_;
              }
              auVar334 = ZEXT1664(auVar152);
              auVar158 = vpermilps_avx(local_940._0_16_,0xff);
              auVar19 = vpermilps_avx(auVar376,0xff);
              fVar217 = fVar217 * fVar181 - auVar19._0_4_;
              auVar238._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
              auVar238._8_4_ = auVar155._8_4_ ^ 0x80000000;
              auVar238._12_4_ = auVar155._12_4_ ^ 0x80000000;
              auVar259._0_4_ = -fVar217;
              auVar259._4_4_ = 0x80000000;
              auVar259._8_4_ = 0x80000000;
              auVar259._12_4_ = 0x80000000;
              auVar116 = vinsertps_avx(ZEXT416((uint)(fVar232 * fVar181)),auVar238,0x10);
              auVar196 = vmovsldup_avx(ZEXT416((uint)(fVar179 * fVar232 * fVar181 -
                                                     auVar155._0_4_ * fVar217)));
              auVar116 = vdivps_avx(auVar116,auVar196);
              auVar158 = ZEXT416((uint)(fVar233 - auVar158._0_4_));
              auVar155 = vinsertps_avx(auVar117,auVar158,0x10);
              auVar222._0_4_ = auVar155._0_4_ * auVar116._0_4_;
              auVar222._4_4_ = auVar155._4_4_ * auVar116._4_4_;
              auVar222._8_4_ = auVar155._8_4_ * auVar116._8_4_;
              auVar222._12_4_ = auVar155._12_4_ * auVar116._12_4_;
              auVar116 = vinsertps_avx(auVar259,ZEXT416((uint)fVar179),0x1c);
              auVar116 = vdivps_avx(auVar116,auVar196);
              auVar196 = vhaddps_avx(auVar222,auVar222);
              auVar192._0_4_ = auVar155._0_4_ * auVar116._0_4_;
              auVar192._4_4_ = auVar155._4_4_ * auVar116._4_4_;
              auVar192._8_4_ = auVar155._8_4_ * auVar116._8_4_;
              auVar192._12_4_ = auVar155._12_4_ * auVar116._12_4_;
              auVar116 = vhaddps_avx(auVar192,auVar192);
              fVar230 = fVar230 - auVar196._0_4_;
              local_ca0 = local_ca0 - auVar116._0_4_;
              auVar248 = ZEXT464((uint)local_ca0);
              auVar239._8_4_ = 0x7fffffff;
              auVar239._0_8_ = 0x7fffffff7fffffff;
              auVar239._12_4_ = 0x7fffffff;
              auVar379 = ZEXT1664(auVar239);
              auVar117 = vandps_avx(auVar117,auVar239);
              bVar59 = true;
              fVar179 = (float)local_8e0._0_4_;
              fVar181 = (float)local_8e0._4_4_;
              fVar217 = fStack_8d8;
              fVar232 = fStack_8d4;
              fVar233 = fStack_8d0;
              fVar249 = fStack_8cc;
              fVar251 = fStack_8c8;
              fVar252 = (float)local_8c0._0_4_;
              fVar256 = (float)local_8c0._4_4_;
              fVar268 = fStack_8b8;
              fVar270 = fStack_8b4;
              fVar272 = fStack_8b0;
              fVar253 = fStack_8ac;
              fVar255 = fStack_8a8;
              fVar288 = (float)local_ac0._0_4_;
              fVar290 = (float)local_ac0._4_4_;
              fVar292 = fStack_ab8;
              fVar294 = fStack_ab4;
              fVar296 = fStack_ab0;
              fVar298 = fStack_aac;
              fVar324 = fStack_aa8;
              if (auVar117._0_4_ < fVar143) {
                auVar117 = vandps_avx(auVar158,auVar239);
                if (auVar117._0_4_ <
                    (float)local_7e0._0_4_ * 1.9073486e-06 + auVar159._0_4_ + fVar143) {
                  local_ca0 = local_ca0 + (float)local_890._0_4_;
                  auVar248 = ZEXT464((uint)local_ca0);
                  if (local_ca0 < fVar141) {
                    bVar59 = false;
                    uVar100 = 0;
                  }
                  else {
                    fVar143 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar143 < local_ca0) {
                      bVar59 = false;
                      uVar100 = 0;
                    }
                    else {
                      bVar59 = false;
                      if (fVar230 < 0.0) {
                        uVar100 = 0;
                      }
                      else if (1.0 < fVar230) {
                        uVar100 = 0;
                        bVar59 = false;
                      }
                      else {
                        auVar152 = vrsqrtss_avx(auVar152,auVar152);
                        fVar336 = auVar152._0_4_;
                        pGVar10 = (context->scene->geometries).items[local_9f8].ptr;
                        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                          uVar100 = 0;
                        }
                        else {
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar152 = ZEXT416((uint)(fVar336 * 1.5 +
                                                     fVar231 * -0.5 * fVar336 * fVar336 * fVar336));
                            auVar152 = vshufps_avx(auVar152,auVar152,0);
                            auVar153._0_4_ = auVar152._0_4_ * (float)local_aa0._0_4_;
                            auVar153._4_4_ = auVar152._4_4_ * (float)local_aa0._4_4_;
                            auVar153._8_4_ = auVar152._8_4_ * fStack_a98;
                            auVar153._12_4_ = auVar152._12_4_ * fStack_a94;
                            auVar334 = ZEXT1664(auVar376);
                            auVar113._0_4_ = auVar376._0_4_ + auVar19._0_4_ * auVar153._0_4_;
                            auVar113._4_4_ = auVar376._4_4_ + auVar19._4_4_ * auVar153._4_4_;
                            auVar113._8_4_ = auVar376._8_4_ + auVar19._8_4_ * auVar153._8_4_;
                            auVar113._12_4_ = auVar376._12_4_ + auVar19._12_4_ * auVar153._12_4_;
                            auVar152 = vshufps_avx(auVar153,auVar153,0xc9);
                            auVar159 = vshufps_avx(auVar376,auVar376,0xc9);
                            auVar154._0_4_ = auVar159._0_4_ * auVar153._0_4_;
                            auVar154._4_4_ = auVar159._4_4_ * auVar153._4_4_;
                            auVar154._8_4_ = auVar159._8_4_ * auVar153._8_4_;
                            auVar154._12_4_ = auVar159._12_4_ * auVar153._12_4_;
                            auVar193._0_4_ = auVar376._0_4_ * auVar152._0_4_;
                            auVar193._4_4_ = auVar376._4_4_ * auVar152._4_4_;
                            auVar193._8_4_ = auVar376._8_4_ * auVar152._8_4_;
                            auVar193._12_4_ = auVar376._12_4_ * auVar152._12_4_;
                            auVar117 = vsubps_avx(auVar193,auVar154);
                            auVar152 = vshufps_avx(auVar117,auVar117,0xc9);
                            auVar159 = vshufps_avx(auVar113,auVar113,0xc9);
                            auVar194._0_4_ = auVar159._0_4_ * auVar152._0_4_;
                            auVar194._4_4_ = auVar159._4_4_ * auVar152._4_4_;
                            auVar194._8_4_ = auVar159._8_4_ * auVar152._8_4_;
                            auVar194._12_4_ = auVar159._12_4_ * auVar152._12_4_;
                            auVar152 = vshufps_avx(auVar117,auVar117,0xd2);
                            auVar114._0_4_ = auVar113._0_4_ * auVar152._0_4_;
                            auVar114._4_4_ = auVar113._4_4_ * auVar152._4_4_;
                            auVar114._8_4_ = auVar113._8_4_ * auVar152._8_4_;
                            auVar114._12_4_ = auVar113._12_4_ * auVar152._12_4_;
                            auVar152 = vsubps_avx(auVar194,auVar114);
                            pRVar14 = context->user;
                            local_570 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0)
                            ;
                            auStack_5d0 = vshufps_avx(auVar152,auVar152,0x55);
                            local_5b0 = vshufps_avx(auVar152,auVar152,0xaa);
                            local_590 = vshufps_avx(auVar152,auVar152,0);
                            local_5e0 = (RTCHitN  [16])auStack_5d0;
                            local_5c0 = local_5b0;
                            local_5a0 = local_590;
                            local_580 = local_570;
                            local_560 = ZEXT832(0) << 0x20;
                            local_540 = local_480._0_8_;
                            uStack_538 = local_480._8_8_;
                            uStack_530 = local_480._16_8_;
                            uStack_528 = local_480._24_8_;
                            local_520 = local_460._0_8_;
                            uStack_518 = local_460._8_8_;
                            uStack_510 = local_460._16_8_;
                            uStack_508 = local_460._24_8_;
                            local_a00[1] = local_960;
                            *local_a00 = local_960;
                            local_500 = pRVar14->instID[0];
                            uStack_4fc = local_500;
                            uStack_4f8 = local_500;
                            uStack_4f4 = local_500;
                            uStack_4f0 = local_500;
                            uStack_4ec = local_500;
                            uStack_4e8 = local_500;
                            uStack_4e4 = local_500;
                            local_4e0 = pRVar14->instPrimID[0];
                            uStack_4dc = local_4e0;
                            uStack_4d8 = local_4e0;
                            uStack_4d4 = local_4e0;
                            uStack_4d0 = local_4e0;
                            uStack_4cc = local_4e0;
                            uStack_4c8 = local_4e0;
                            uStack_4c4 = local_4e0;
                            *(float *)(ray + k * 4 + 0x100) = local_ca0;
                            local_b20 = *local_a08;
                            uStack_b18 = local_a08[1];
                            local_b10 = *local_a10;
                            uStack_b08 = local_a10[1];
                            local_9f0.valid = (int *)&local_b20;
                            local_9f0.geometryUserPtr = pGVar10->userPtr;
                            local_9f0.context = context->user;
                            local_9f0.hit = local_5e0;
                            local_9f0.N = 8;
                            local_9f0.ray = (RTCRayN *)ray;
                            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar334 = ZEXT1664(auVar376);
                              (*pGVar10->occlusionFilterN)(&local_9f0);
                              auVar379 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              fVar179 = (float)local_8e0._0_4_;
                              fVar181 = (float)local_8e0._4_4_;
                              fVar217 = fStack_8d8;
                              fVar232 = fStack_8d4;
                              fVar233 = fStack_8d0;
                              fVar249 = fStack_8cc;
                              fVar251 = fStack_8c8;
                              fVar252 = (float)local_8c0._0_4_;
                              fVar256 = (float)local_8c0._4_4_;
                              fVar268 = fStack_8b8;
                              fVar270 = fStack_8b4;
                              fVar272 = fStack_8b0;
                              fVar253 = fStack_8ac;
                              fVar255 = fStack_8a8;
                            }
                            auVar86._8_8_ = uStack_b18;
                            auVar86._0_8_ = local_b20;
                            auVar152 = vpcmpeqd_avx((undefined1  [16])0x0,auVar86);
                            auVar90._8_8_ = uStack_b08;
                            auVar90._0_8_ = local_b10;
                            auVar159 = vpcmpeqd_avx((undefined1  [16])0x0,auVar90);
                            auVar130._16_16_ = auVar159;
                            auVar130._0_16_ = auVar152;
                            auVar129 = local_960 & ~auVar130;
                            fVar288 = (float)local_ac0._0_4_;
                            fVar290 = (float)local_ac0._4_4_;
                            fVar292 = fStack_ab8;
                            fVar294 = fStack_ab4;
                            fVar296 = fStack_ab0;
                            fVar298 = fStack_aac;
                            fVar324 = fStack_aa8;
                            if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar129 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar129 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar129 >> 0x7f,0) == '\0') &&
                                  (auVar129 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar129 >> 0xbf,0) == '\0') &&
                                (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar129[0x1f]) {
                              auVar131._0_4_ = auVar152._0_4_ ^ local_960._0_4_;
                              auVar131._4_4_ = auVar152._4_4_ ^ local_960._4_4_;
                              auVar131._8_4_ = auVar152._8_4_ ^ local_960._8_4_;
                              auVar131._12_4_ = auVar152._12_4_ ^ local_960._12_4_;
                              auVar131._16_4_ = auVar159._0_4_ ^ local_960._16_4_;
                              auVar131._20_4_ = auVar159._4_4_ ^ local_960._20_4_;
                              auVar131._24_4_ = auVar159._8_4_ ^ local_960._24_4_;
                              auVar131._28_4_ = auVar159._12_4_ ^ local_960._28_4_;
                            }
                            else {
                              p_Var15 = context->args->filter;
                              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar334 = ZEXT1664(auVar334._0_16_);
                                (*p_Var15)(&local_9f0);
                                auVar379 = ZEXT1664(CONCAT412(0x7fffffff,
                                                              CONCAT48(0x7fffffff,0x7fffffff7fffffff
                                                                      )));
                                fVar179 = (float)local_8e0._0_4_;
                                fVar181 = (float)local_8e0._4_4_;
                                fVar217 = fStack_8d8;
                                fVar232 = fStack_8d4;
                                fVar233 = fStack_8d0;
                                fVar249 = fStack_8cc;
                                fVar251 = fStack_8c8;
                                fVar252 = (float)local_8c0._0_4_;
                                fVar256 = (float)local_8c0._4_4_;
                                fVar268 = fStack_8b8;
                                fVar270 = fStack_8b4;
                                fVar272 = fStack_8b0;
                                fVar253 = fStack_8ac;
                                fVar255 = fStack_8a8;
                                fVar288 = (float)local_ac0._0_4_;
                                fVar290 = (float)local_ac0._4_4_;
                                fVar292 = fStack_ab8;
                                fVar294 = fStack_ab4;
                                fVar296 = fStack_ab0;
                                fVar298 = fStack_aac;
                                fVar324 = fStack_aa8;
                              }
                              auVar87._8_8_ = uStack_b18;
                              auVar87._0_8_ = local_b20;
                              auVar152 = vpcmpeqd_avx((undefined1  [16])0x0,auVar87);
                              auVar91._8_8_ = uStack_b08;
                              auVar91._0_8_ = local_b10;
                              auVar159 = vpcmpeqd_avx((undefined1  [16])0x0,auVar91);
                              auVar168._16_16_ = auVar159;
                              auVar168._0_16_ = auVar152;
                              auVar131._0_4_ = auVar152._0_4_ ^ local_960._0_4_;
                              auVar131._4_4_ = auVar152._4_4_ ^ local_960._4_4_;
                              auVar131._8_4_ = auVar152._8_4_ ^ local_960._8_4_;
                              auVar131._12_4_ = auVar152._12_4_ ^ local_960._12_4_;
                              auVar131._16_4_ = auVar159._0_4_ ^ local_960._16_4_;
                              auVar131._20_4_ = auVar159._4_4_ ^ local_960._20_4_;
                              auVar131._24_4_ = auVar159._8_4_ ^ local_960._24_4_;
                              auVar131._28_4_ = auVar159._12_4_ ^ local_960._28_4_;
                              auVar205._8_4_ = 0xff800000;
                              auVar205._0_8_ = 0xff800000ff800000;
                              auVar205._12_4_ = 0xff800000;
                              auVar205._16_4_ = 0xff800000;
                              auVar205._20_4_ = 0xff800000;
                              auVar205._24_4_ = 0xff800000;
                              auVar205._28_4_ = 0xff800000;
                              auVar129 = vblendvps_avx(auVar205,*(undefined1 (*) [32])
                                                                 (local_9f0.ray + 0x100),auVar168);
                              *(undefined1 (*) [32])(local_9f0.ray + 0x100) = auVar129;
                            }
                            auVar248 = ZEXT464((uint)local_ca0);
                            bVar79 = (auVar131 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar80 = (auVar131 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar78 = (auVar131 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar77 = SUB321(auVar131 >> 0x7f,0) != '\0';
                            bVar76 = (auVar131 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar75 = SUB321(auVar131 >> 0xbf,0) != '\0';
                            bVar73 = (auVar131 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar59 = auVar131[0x1f] < '\0';
                            uVar100 = (ulong)(((((((bVar79 || bVar80) || bVar78) || bVar77) ||
                                                bVar76) || bVar75) || bVar73) || bVar59);
                            if (((((((!bVar79 && !bVar80) && !bVar78) && !bVar77) && !bVar76) &&
                                 !bVar75) && !bVar73) && !bVar59) {
                              *(float *)(ray + k * 4 + 0x100) = fVar143;
                            }
                            bVar59 = false;
                            goto LAB_01078624;
                          }
                          uVar100 = 1;
                        }
                        bVar59 = false;
                      }
                    }
                  }
                }
              }
LAB_01078624:
              auVar383 = ZEXT464((uint)fVar230);
              bVar99 = (byte)uVar100;
              if (!bVar59) goto LAB_01078a82;
              lVar101 = lVar101 + -1;
            } while (lVar101 != 0);
            bVar99 = 0;
            fVar288 = (float)local_ac0._0_4_;
            fVar290 = (float)local_ac0._4_4_;
            fVar292 = fStack_ab8;
            fVar294 = fStack_ab4;
            fVar296 = fStack_ab0;
            fVar298 = fStack_aac;
            fVar324 = fStack_aa8;
LAB_01078a82:
            uVar100 = (ulong)(bVar99 & 1);
            uVar104 = CONCAT71(local_800._1_7_,local_800[0] | bVar99 & 1);
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar132._4_4_ = uVar7;
            auVar132._0_4_ = uVar7;
            auVar132._8_4_ = uVar7;
            auVar132._12_4_ = uVar7;
            auVar132._16_4_ = uVar7;
            auVar132._20_4_ = uVar7;
            auVar132._24_4_ = uVar7;
            auVar132._28_4_ = uVar7;
            auVar129 = vcmpps_avx(_local_840,auVar132,2);
            auVar122 = vandps_avx(auVar129,local_6e0);
            auVar248 = ZEXT3264(auVar122);
            auVar20 = local_6e0 & auVar129;
            uVar105 = local_720;
            auVar287 = local_a40;
            local_6e0 = auVar122;
          } while ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar20 >> 0x7f,0) != '\0') ||
                     (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar20 >> 0xbf,0) != '\0') ||
                   (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar20[0x1f] < '\0');
        }
        auVar133._0_4_ =
             fVar288 * (float)local_860._0_4_ +
             fVar252 * (float)local_740._0_4_ + fVar179 * (float)local_760._0_4_;
        auVar133._4_4_ =
             fVar290 * (float)local_860._4_4_ +
             fVar256 * (float)local_740._4_4_ + fVar181 * (float)local_760._4_4_;
        auVar133._8_4_ = fVar292 * fStack_858 + fVar268 * fStack_738 + fVar217 * fStack_758;
        auVar133._12_4_ = fVar294 * fStack_854 + fVar270 * fStack_734 + fVar232 * fStack_754;
        auVar133._16_4_ = fVar296 * fStack_850 + fVar272 * fStack_730 + fVar233 * fStack_750;
        auVar133._20_4_ = fVar298 * fStack_84c + fVar253 * fStack_72c + fVar249 * fStack_74c;
        auVar133._24_4_ = fVar324 * fStack_848 + fVar255 * fStack_728 + fVar251 * fStack_748;
        auVar133._28_4_ = auVar129._28_4_ + auVar129._28_4_ + auVar248._28_4_;
        auVar169._8_4_ = 0x7fffffff;
        auVar169._0_8_ = 0x7fffffff7fffffff;
        auVar169._12_4_ = 0x7fffffff;
        auVar169._16_4_ = 0x7fffffff;
        auVar169._20_4_ = 0x7fffffff;
        auVar169._24_4_ = 0x7fffffff;
        auVar169._28_4_ = 0x7fffffff;
        auVar129 = vandps_avx(auVar133,auVar169);
        auVar170._8_4_ = 0x3e99999a;
        auVar170._0_8_ = 0x3e99999a3e99999a;
        auVar170._12_4_ = 0x3e99999a;
        auVar170._16_4_ = 0x3e99999a;
        auVar170._20_4_ = 0x3e99999a;
        auVar170._24_4_ = 0x3e99999a;
        auVar170._28_4_ = 0x3e99999a;
        auVar129 = vcmpps_avx(auVar129,auVar170,1);
        auVar122 = vorps_avx(auVar129,local_680);
        auVar171._0_4_ = (float)local_9a0._0_4_ + auVar21._0_4_;
        auVar171._4_4_ = (float)local_9a0._4_4_ + auVar21._4_4_;
        auVar171._8_4_ = fStack_998 + auVar21._8_4_;
        auVar171._12_4_ = fStack_994 + auVar21._12_4_;
        auVar171._16_4_ = fStack_990 + auVar21._16_4_;
        auVar171._20_4_ = fStack_98c + auVar21._20_4_;
        auVar171._24_4_ = fStack_988 + auVar21._24_4_;
        auVar171._28_4_ = fStack_984 + auVar21._28_4_;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar206._4_4_ = uVar7;
        auVar206._0_4_ = uVar7;
        auVar206._8_4_ = uVar7;
        auVar206._12_4_ = uVar7;
        auVar206._16_4_ = uVar7;
        auVar206._20_4_ = uVar7;
        auVar206._24_4_ = uVar7;
        auVar206._28_4_ = uVar7;
        auVar129 = vcmpps_avx(auVar171,auVar206,2);
        _local_840 = vandps_avx(auVar129,auVar287);
        auVar172._8_4_ = 3;
        auVar172._0_8_ = 0x300000003;
        auVar172._12_4_ = 3;
        auVar172._16_4_ = 3;
        auVar172._20_4_ = 3;
        auVar172._24_4_ = 3;
        auVar172._28_4_ = 3;
        auVar207._8_4_ = 2;
        auVar207._0_8_ = 0x200000002;
        auVar207._12_4_ = 2;
        auVar207._16_4_ = 2;
        auVar207._20_4_ = 2;
        auVar207._24_4_ = 2;
        auVar207._28_4_ = 2;
        auVar129 = vblendvps_avx(auVar207,auVar172,auVar122);
        auVar152 = vpcmpgtd_avx(auVar129._16_16_,local_6a0);
        auVar159 = vpshufd_avx(local_660._0_16_,0);
        auVar159 = vpcmpgtd_avx(auVar129._0_16_,auVar159);
        auVar173._16_16_ = auVar152;
        auVar173._0_16_ = auVar159;
        _local_860 = vblendps_avx(ZEXT1632(auVar159),auVar173,0xf0);
        auVar129 = vandnps_avx(_local_860,_local_840);
        auVar122 = _local_840 & ~_local_860;
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0x7f,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar122 >> 0xbf,0) != '\0') ||
            (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar122[0x1f] < '\0') {
          local_920 = _local_2a0;
          local_7e0._4_4_ = (float)local_9a0._4_4_ + (float)local_2a0._4_4_;
          local_7e0._0_4_ = (float)local_9a0._0_4_ + (float)local_2a0._0_4_;
          fStack_7d8 = fStack_998 + fStack_298;
          fStack_7d4 = fStack_994 + fStack_294;
          fStack_7d0 = fStack_990 + fStack_290;
          fStack_7cc = fStack_98c + fStack_28c;
          fStack_7c8 = fStack_988 + fStack_288;
          fStack_7c4 = fStack_984 + fStack_284;
          do {
            auVar240 = auVar379._0_16_;
            auVar174._8_4_ = 0x7f800000;
            auVar174._0_8_ = 0x7f8000007f800000;
            auVar174._12_4_ = 0x7f800000;
            auVar174._16_4_ = 0x7f800000;
            auVar174._20_4_ = 0x7f800000;
            auVar174._24_4_ = 0x7f800000;
            auVar174._28_4_ = 0x7f800000;
            auVar122 = vblendvps_avx(auVar174,local_920,auVar129);
            auVar20 = vshufps_avx(auVar122,auVar122,0xb1);
            auVar20 = vminps_avx(auVar122,auVar20);
            auVar21 = vshufpd_avx(auVar20,auVar20,5);
            auVar20 = vminps_avx(auVar20,auVar21);
            auVar21 = vperm2f128_avx(auVar20,auVar20,1);
            auVar20 = vminps_avx(auVar20,auVar21);
            auVar20 = vcmpps_avx(auVar122,auVar20,0);
            auVar21 = auVar129 & auVar20;
            auVar122 = auVar129;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              auVar122 = vandps_avx(auVar20,auVar129);
            }
            local_800._0_8_ = uVar104;
            uVar97 = vmovmskps_avx(auVar122);
            uVar96 = 0;
            if (uVar97 != 0) {
              for (; (uVar97 >> uVar96 & 1) == 0; uVar96 = uVar96 + 1) {
              }
            }
            uVar105 = (ulong)uVar96;
            local_700 = auVar129;
            *(undefined4 *)(local_700 + uVar105 * 4) = 0;
            fVar143 = local_640[uVar105];
            uVar96 = *(uint *)(local_280 + uVar105 * 4);
            fVar179 = auVar17._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              fVar179 = sqrtf((float)local_980._0_4_);
              auVar240._8_4_ = 0x7fffffff;
              auVar240._0_8_ = 0x7fffffff7fffffff;
              auVar240._12_4_ = 0x7fffffff;
            }
            auVar383 = ZEXT464((uint)fVar143);
            auVar248 = ZEXT464(uVar96);
            auVar159 = vminps_avx(_local_ad0,_local_af0);
            auVar152 = vmaxps_avx(_local_ad0,_local_af0);
            auVar117 = vminps_avx(_local_ae0,_local_b00);
            auVar116 = vminps_avx(auVar159,auVar117);
            auVar159 = vmaxps_avx(_local_ae0,_local_b00);
            auVar117 = vmaxps_avx(auVar152,auVar159);
            auVar152 = vandps_avx(auVar116,auVar240);
            auVar159 = vandps_avx(auVar117,auVar240);
            auVar152 = vmaxps_avx(auVar152,auVar159);
            auVar159 = vmovshdup_avx(auVar152);
            auVar159 = vmaxss_avx(auVar159,auVar152);
            auVar152 = vshufpd_avx(auVar152,auVar152,1);
            auVar152 = vmaxss_avx(auVar152,auVar159);
            local_a80._0_4_ = auVar152._0_4_ * 1.9073486e-06;
            local_7c0._0_4_ = fVar179 * 1.9073486e-06;
            local_900._0_16_ = vshufps_avx(auVar117,auVar117,0xff);
            lVar101 = 5;
            do {
              local_ca0 = auVar248._0_4_;
              auVar152 = vshufps_avx(auVar248._0_16_,auVar248._0_16_,0);
              auVar115._0_4_ = auVar152._0_4_ * (float)local_970._0_4_ + 0.0;
              auVar115._4_4_ = auVar152._4_4_ * (float)local_970._4_4_ + 0.0;
              auVar115._8_4_ = auVar152._8_4_ * fStack_968 + 0.0;
              auVar115._12_4_ = auVar152._12_4_ * fStack_964 + 0.0;
              fVar230 = auVar383._0_4_;
              fVar217 = 1.0 - fVar230;
              fVar181 = fVar230 * 3.0;
              fVar143 = fVar181 + -5.0;
              auVar152 = ZEXT416((uint)(fVar230 * fVar230 * -fVar217 * 0.5));
              auVar152 = vshufps_avx(auVar152,auVar152,0);
              auVar159 = ZEXT416((uint)((fVar217 * fVar217 * (fVar217 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar159 = vshufps_avx(auVar159,auVar159,0);
              auVar117 = ZEXT416((uint)((fVar230 * fVar230 * fVar143 + 2.0) * 0.5));
              auVar117 = vshufps_avx(auVar117,auVar117,0);
              auVar116 = ZEXT416((uint)(fVar217 * fVar217 * -fVar230 * 0.5));
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              auVar195._0_4_ =
                   auVar116._0_4_ * (float)local_ad0._0_4_ +
                   auVar117._0_4_ * (float)local_af0._0_4_ +
                   auVar159._0_4_ * (float)local_ae0._0_4_ + auVar152._0_4_ * (float)local_b00._0_4_
              ;
              auVar195._4_4_ =
                   auVar116._4_4_ * (float)local_ad0._4_4_ +
                   auVar117._4_4_ * (float)local_af0._4_4_ +
                   auVar159._4_4_ * (float)local_ae0._4_4_ + auVar152._4_4_ * (float)local_b00._4_4_
              ;
              auVar195._8_4_ =
                   auVar116._8_4_ * fStack_ac8 +
                   auVar117._8_4_ * fStack_ae8 +
                   auVar159._8_4_ * fStack_ad8 + auVar152._8_4_ * fStack_af8;
              auVar195._12_4_ =
                   auVar116._12_4_ * fStack_ac4 +
                   auVar117._12_4_ * fStack_ae4 +
                   auVar159._12_4_ * fStack_ad4 + auVar152._12_4_ * fStack_af4;
              local_940._0_16_ = auVar195;
              auVar152 = vsubps_avx(auVar115,auVar195);
              _local_aa0 = auVar152;
              auVar152 = vdpps_avx(auVar152,auVar152,0x7f);
              fVar179 = fVar230 * -9.0 + 4.0;
              fVar231 = auVar152._0_4_;
              if (fVar231 < 0.0) {
                local_a40._0_4_ = fVar143;
                local_a60._0_16_ = ZEXT416((uint)fVar179);
                local_9c0._0_4_ = fVar217 * -2.0;
                fVar232 = sqrtf(fVar231);
                fVar233 = (float)local_9c0._0_4_;
                fVar143 = (float)local_a40._0_4_;
                auVar159 = local_a60._0_16_;
              }
              else {
                auVar159 = vsqrtss_avx(auVar152,auVar152);
                fVar232 = auVar159._0_4_;
                fVar233 = fVar217 * -2.0;
                auVar159 = ZEXT416((uint)fVar179);
              }
              auVar117 = ZEXT416((uint)((fVar230 * fVar230 + fVar230 * fVar233) * 0.5));
              auVar117 = vshufps_avx(auVar117,auVar117,0);
              auVar116 = ZEXT416((uint)(((fVar217 + fVar217) * (fVar181 + 2.0) +
                                        fVar217 * fVar217 * -3.0) * 0.5));
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              auVar196 = ZEXT416((uint)((fVar143 * (fVar230 + fVar230) + fVar230 * fVar181) * 0.5));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar155 = ZEXT416((uint)((fVar230 * (fVar217 + fVar217) - fVar217 * fVar217) * 0.5));
              auVar155 = vshufps_avx(auVar155,auVar155,0);
              auVar377._0_4_ =
                   (float)local_ad0._0_4_ * auVar155._0_4_ +
                   (float)local_af0._0_4_ * auVar196._0_4_ +
                   (float)local_b00._0_4_ * auVar117._0_4_ + (float)local_ae0._0_4_ * auVar116._0_4_
              ;
              auVar377._4_4_ =
                   (float)local_ad0._4_4_ * auVar155._4_4_ +
                   (float)local_af0._4_4_ * auVar196._4_4_ +
                   (float)local_b00._4_4_ * auVar117._4_4_ + (float)local_ae0._4_4_ * auVar116._4_4_
              ;
              auVar377._8_4_ =
                   fStack_ac8 * auVar155._8_4_ +
                   fStack_ae8 * auVar196._8_4_ +
                   fStack_af8 * auVar117._8_4_ + fStack_ad8 * auVar116._8_4_;
              auVar377._12_4_ =
                   fStack_ac4 * auVar155._12_4_ +
                   fStack_ae4 * auVar196._12_4_ +
                   fStack_af4 * auVar117._12_4_ + fStack_ad4 * auVar116._12_4_;
              auVar155 = vpermilps_avx(ZEXT416((uint)(fVar181 + -1.0)),0);
              auVar159 = vshufps_avx(auVar159,auVar159,0);
              auVar117 = ZEXT416((uint)(fVar230 * 9.0 + -5.0));
              auVar116 = vshufps_avx(auVar117,auVar117,0);
              auVar117 = ZEXT416((uint)(fVar230 * -3.0 + 2.0));
              auVar196 = vshufps_avx(auVar117,auVar117,0);
              auVar117 = vdpps_avx(auVar377,auVar377,0x7f);
              auVar156._0_4_ =
                   (float)local_ad0._0_4_ * auVar196._0_4_ +
                   (float)local_af0._0_4_ * auVar116._0_4_ +
                   (float)local_ae0._0_4_ * auVar159._0_4_ + (float)local_b00._0_4_ * auVar155._0_4_
              ;
              auVar156._4_4_ =
                   (float)local_ad0._4_4_ * auVar196._4_4_ +
                   (float)local_af0._4_4_ * auVar116._4_4_ +
                   (float)local_ae0._4_4_ * auVar159._4_4_ + (float)local_b00._4_4_ * auVar155._4_4_
              ;
              auVar156._8_4_ =
                   fStack_ac8 * auVar196._8_4_ +
                   fStack_ae8 * auVar116._8_4_ +
                   fStack_ad8 * auVar159._8_4_ + fStack_af8 * auVar155._8_4_;
              auVar156._12_4_ =
                   fStack_ac4 * auVar196._12_4_ +
                   fStack_ae4 * auVar116._12_4_ +
                   fStack_ad4 * auVar159._12_4_ + fStack_af4 * auVar155._12_4_;
              auVar159 = vblendps_avx(auVar117,_DAT_01feba10,0xe);
              auVar116 = vrsqrtss_avx(auVar159,auVar159);
              fVar179 = auVar116._0_4_;
              fVar143 = auVar117._0_4_;
              auVar116 = vdpps_avx(auVar377,auVar156,0x7f);
              auVar196 = vshufps_avx(auVar117,auVar117,0);
              auVar157._0_4_ = auVar156._0_4_ * auVar196._0_4_;
              auVar157._4_4_ = auVar156._4_4_ * auVar196._4_4_;
              auVar157._8_4_ = auVar156._8_4_ * auVar196._8_4_;
              auVar157._12_4_ = auVar156._12_4_ * auVar196._12_4_;
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              auVar241._0_4_ = auVar377._0_4_ * auVar116._0_4_;
              auVar241._4_4_ = auVar377._4_4_ * auVar116._4_4_;
              auVar241._8_4_ = auVar377._8_4_ * auVar116._8_4_;
              auVar241._12_4_ = auVar377._12_4_ * auVar116._12_4_;
              auVar155 = vsubps_avx(auVar157,auVar241);
              auVar116 = vrcpss_avx(auVar159,auVar159);
              auVar159 = vmaxss_avx(ZEXT416((uint)local_a80._0_4_),
                                    ZEXT416((uint)((float)local_7c0._0_4_ * local_ca0)));
              auVar116 = ZEXT416((uint)(auVar116._0_4_ * (2.0 - fVar143 * auVar116._0_4_)));
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              uVar105 = CONCAT44(auVar377._4_4_,auVar377._0_4_);
              auVar307._0_8_ = uVar105 ^ 0x8000000080000000;
              auVar307._8_4_ = -auVar377._8_4_;
              auVar307._12_4_ = -auVar377._12_4_;
              auVar196 = ZEXT416((uint)(fVar179 * 1.5 + fVar143 * -0.5 * fVar179 * fVar179 * fVar179
                                       ));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar223._0_4_ = auVar196._0_4_ * auVar155._0_4_ * auVar116._0_4_;
              auVar223._4_4_ = auVar196._4_4_ * auVar155._4_4_ * auVar116._4_4_;
              auVar223._8_4_ = auVar196._8_4_ * auVar155._8_4_ * auVar116._8_4_;
              auVar223._12_4_ = auVar196._12_4_ * auVar155._12_4_ * auVar116._12_4_;
              auVar283._0_4_ = auVar377._0_4_ * auVar196._0_4_;
              auVar283._4_4_ = auVar377._4_4_ * auVar196._4_4_;
              auVar283._8_4_ = auVar377._8_4_ * auVar196._8_4_;
              auVar283._12_4_ = auVar377._12_4_ * auVar196._12_4_;
              if (fVar143 < 0.0) {
                fVar143 = sqrtf(fVar143);
              }
              else {
                auVar117 = vsqrtss_avx(auVar117,auVar117);
                fVar143 = auVar117._0_4_;
              }
              auVar117 = vdpps_avx(_local_aa0,auVar283,0x7f);
              fVar143 = ((float)local_a80._0_4_ / fVar143) * (fVar232 + 1.0) +
                        auVar159._0_4_ + fVar232 * (float)local_a80._0_4_;
              auVar116 = vdpps_avx(auVar307,auVar283,0x7f);
              auVar196 = vdpps_avx(_local_aa0,auVar223,0x7f);
              auVar155 = vdpps_avx(_local_970,auVar283,0x7f);
              auVar158 = vdpps_avx(_local_aa0,auVar307,0x7f);
              fVar179 = auVar116._0_4_ + auVar196._0_4_;
              fVar181 = auVar117._0_4_;
              auVar118._0_4_ = fVar181 * fVar181;
              auVar118._4_4_ = auVar117._4_4_ * auVar117._4_4_;
              auVar118._8_4_ = auVar117._8_4_ * auVar117._8_4_;
              auVar118._12_4_ = auVar117._12_4_ * auVar117._12_4_;
              auVar196 = vsubps_avx(auVar152,auVar118);
              auVar116 = vdpps_avx(_local_aa0,_local_970,0x7f);
              fVar217 = auVar158._0_4_ - fVar181 * fVar179;
              fVar232 = auVar116._0_4_ - fVar181 * auVar155._0_4_;
              auVar116 = vrsqrtss_avx(auVar196,auVar196);
              fVar233 = auVar196._0_4_;
              fVar181 = auVar116._0_4_;
              fVar181 = fVar181 * 1.5 + fVar233 * -0.5 * fVar181 * fVar181 * fVar181;
              if (fVar233 < 0.0) {
                local_a40._0_4_ = fVar217;
                local_a60._0_4_ = fVar232;
                local_9c0._0_4_ = fVar181;
                fVar233 = sqrtf(fVar233);
                fVar181 = (float)local_9c0._0_4_;
                fVar217 = (float)local_a40._0_4_;
                fVar232 = (float)local_a60._0_4_;
              }
              else {
                auVar116 = vsqrtss_avx(auVar196,auVar196);
                fVar233 = auVar116._0_4_;
              }
              auVar334 = ZEXT1664(auVar152);
              auVar158 = vpermilps_avx(local_940._0_16_,0xff);
              auVar19 = vpermilps_avx(auVar377,0xff);
              fVar217 = fVar217 * fVar181 - auVar19._0_4_;
              auVar242._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
              auVar242._8_4_ = auVar155._8_4_ ^ 0x80000000;
              auVar242._12_4_ = auVar155._12_4_ ^ 0x80000000;
              auVar260._0_4_ = -fVar217;
              auVar260._4_4_ = 0x80000000;
              auVar260._8_4_ = 0x80000000;
              auVar260._12_4_ = 0x80000000;
              auVar116 = vinsertps_avx(ZEXT416((uint)(fVar232 * fVar181)),auVar242,0x10);
              auVar196 = vmovsldup_avx(ZEXT416((uint)(fVar179 * fVar232 * fVar181 -
                                                     auVar155._0_4_ * fVar217)));
              auVar116 = vdivps_avx(auVar116,auVar196);
              auVar158 = ZEXT416((uint)(fVar233 - auVar158._0_4_));
              auVar155 = vinsertps_avx(auVar117,auVar158,0x10);
              auVar224._0_4_ = auVar155._0_4_ * auVar116._0_4_;
              auVar224._4_4_ = auVar155._4_4_ * auVar116._4_4_;
              auVar224._8_4_ = auVar155._8_4_ * auVar116._8_4_;
              auVar224._12_4_ = auVar155._12_4_ * auVar116._12_4_;
              auVar116 = vinsertps_avx(auVar260,ZEXT416((uint)fVar179),0x1c);
              auVar116 = vdivps_avx(auVar116,auVar196);
              auVar196 = vhaddps_avx(auVar224,auVar224);
              auVar197._0_4_ = auVar155._0_4_ * auVar116._0_4_;
              auVar197._4_4_ = auVar155._4_4_ * auVar116._4_4_;
              auVar197._8_4_ = auVar155._8_4_ * auVar116._8_4_;
              auVar197._12_4_ = auVar155._12_4_ * auVar116._12_4_;
              auVar116 = vhaddps_avx(auVar197,auVar197);
              fVar230 = fVar230 - auVar196._0_4_;
              local_ca0 = local_ca0 - auVar116._0_4_;
              auVar248 = ZEXT464((uint)local_ca0);
              auVar243._8_4_ = 0x7fffffff;
              auVar243._0_8_ = 0x7fffffff7fffffff;
              auVar243._12_4_ = 0x7fffffff;
              auVar379 = ZEXT1664(auVar243);
              auVar117 = vandps_avx(auVar117,auVar243);
              bVar59 = true;
              if (auVar117._0_4_ < fVar143) {
                auVar117 = vandps_avx(auVar158,auVar243);
                if (auVar117._0_4_ <
                    (float)local_900._0_4_ * 1.9073486e-06 + auVar159._0_4_ + fVar143) {
                  local_ca0 = local_ca0 + (float)local_890._0_4_;
                  auVar248 = ZEXT464((uint)local_ca0);
                  if ((((fVar141 <= local_ca0) &&
                       (fVar143 = *(float *)(ray + k * 4 + 0x100), local_ca0 <= fVar143)) &&
                      (0.0 <= fVar230)) && (fVar230 <= 1.0)) {
                    auVar159 = vrsqrtss_avx(auVar152,auVar152);
                    fVar179 = auVar159._0_4_;
                    pGVar10 = (context->scene->geometries).items[local_9f8].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar100 = 1;
                      }
                      else {
                        auVar159 = ZEXT416((uint)(fVar179 * 1.5 +
                                                 fVar231 * -0.5 * fVar179 * fVar179 * fVar179));
                        auVar159 = vshufps_avx(auVar159,auVar159,0);
                        auVar160._0_4_ = auVar159._0_4_ * (float)local_aa0._0_4_;
                        auVar160._4_4_ = auVar159._4_4_ * (float)local_aa0._4_4_;
                        auVar160._8_4_ = auVar159._8_4_ * fStack_a98;
                        auVar160._12_4_ = auVar159._12_4_ * fStack_a94;
                        auVar119._0_4_ = auVar377._0_4_ + auVar19._0_4_ * auVar160._0_4_;
                        auVar119._4_4_ = auVar377._4_4_ + auVar19._4_4_ * auVar160._4_4_;
                        auVar119._8_4_ = auVar377._8_4_ + auVar19._8_4_ * auVar160._8_4_;
                        auVar119._12_4_ = auVar377._12_4_ + auVar19._12_4_ * auVar160._12_4_;
                        auVar159 = vshufps_avx(auVar160,auVar160,0xc9);
                        auVar117 = vshufps_avx(auVar377,auVar377,0xc9);
                        auVar161._0_4_ = auVar117._0_4_ * auVar160._0_4_;
                        auVar161._4_4_ = auVar117._4_4_ * auVar160._4_4_;
                        auVar161._8_4_ = auVar117._8_4_ * auVar160._8_4_;
                        auVar161._12_4_ = auVar117._12_4_ * auVar160._12_4_;
                        auVar198._0_4_ = auVar377._0_4_ * auVar159._0_4_;
                        auVar198._4_4_ = auVar377._4_4_ * auVar159._4_4_;
                        auVar198._8_4_ = auVar377._8_4_ * auVar159._8_4_;
                        auVar198._12_4_ = auVar377._12_4_ * auVar159._12_4_;
                        auVar116 = vsubps_avx(auVar198,auVar161);
                        auVar159 = vshufps_avx(auVar116,auVar116,0xc9);
                        auVar117 = vshufps_avx(auVar119,auVar119,0xc9);
                        auVar199._0_4_ = auVar117._0_4_ * auVar159._0_4_;
                        auVar199._4_4_ = auVar117._4_4_ * auVar159._4_4_;
                        auVar199._8_4_ = auVar117._8_4_ * auVar159._8_4_;
                        auVar199._12_4_ = auVar117._12_4_ * auVar159._12_4_;
                        auVar159 = vshufps_avx(auVar116,auVar116,0xd2);
                        auVar120._0_4_ = auVar119._0_4_ * auVar159._0_4_;
                        auVar120._4_4_ = auVar119._4_4_ * auVar159._4_4_;
                        auVar120._8_4_ = auVar119._8_4_ * auVar159._8_4_;
                        auVar120._12_4_ = auVar119._12_4_ * auVar159._12_4_;
                        auVar159 = vsubps_avx(auVar199,auVar120);
                        pRVar14 = context->user;
                        local_570 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
                        auStack_5d0 = vshufps_avx(auVar159,auVar159,0x55);
                        local_5b0 = vshufps_avx(auVar159,auVar159,0xaa);
                        local_590 = vshufps_avx(auVar159,auVar159,0);
                        local_5e0 = (RTCHitN  [16])auStack_5d0;
                        local_5c0 = local_5b0;
                        local_5a0 = local_590;
                        local_580 = local_570;
                        local_560 = ZEXT832(0) << 0x20;
                        local_540 = local_480._0_8_;
                        uStack_538 = local_480._8_8_;
                        uStack_530 = local_480._16_8_;
                        uStack_528 = local_480._24_8_;
                        local_520 = local_460._0_8_;
                        uStack_518 = local_460._8_8_;
                        uStack_510 = local_460._16_8_;
                        uStack_508 = local_460._24_8_;
                        local_a00[1] = local_960;
                        *local_a00 = local_960;
                        local_500 = pRVar14->instID[0];
                        uStack_4fc = local_500;
                        uStack_4f8 = local_500;
                        uStack_4f4 = local_500;
                        uStack_4f0 = local_500;
                        uStack_4ec = local_500;
                        uStack_4e8 = local_500;
                        uStack_4e4 = local_500;
                        local_4e0 = pRVar14->instPrimID[0];
                        uStack_4dc = local_4e0;
                        uStack_4d8 = local_4e0;
                        uStack_4d4 = local_4e0;
                        uStack_4d0 = local_4e0;
                        uStack_4cc = local_4e0;
                        uStack_4c8 = local_4e0;
                        uStack_4c4 = local_4e0;
                        *(float *)(ray + k * 4 + 0x100) = local_ca0;
                        local_b20 = *local_a08;
                        uStack_b18 = local_a08[1];
                        local_b10 = *local_a10;
                        uStack_b08 = local_a10[1];
                        local_9f0.valid = (int *)&local_b20;
                        local_9f0.geometryUserPtr = pGVar10->userPtr;
                        local_9f0.context = context->user;
                        local_9f0.hit = local_5e0;
                        local_9f0.N = 8;
                        local_9f0.ray = (RTCRayN *)ray;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar334 = ZEXT1664(auVar152);
                          (*pGVar10->occlusionFilterN)(&local_9f0);
                          auVar379 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar88._8_8_ = uStack_b18;
                        auVar88._0_8_ = local_b20;
                        auVar152 = vpcmpeqd_avx((undefined1  [16])0x0,auVar88);
                        auVar92._8_8_ = uStack_b08;
                        auVar92._0_8_ = local_b10;
                        auVar159 = vpcmpeqd_avx((undefined1  [16])0x0,auVar92);
                        auVar134._16_16_ = auVar159;
                        auVar134._0_16_ = auVar152;
                        auVar129 = local_960 & ~auVar134;
                        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar129 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar129 >> 0x7f,0) == '\0')
                              && (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar129 >> 0xbf,0) == '\0') &&
                            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar129[0x1f]) {
                          auVar135._0_4_ = auVar152._0_4_ ^ local_960._0_4_;
                          auVar135._4_4_ = auVar152._4_4_ ^ local_960._4_4_;
                          auVar135._8_4_ = auVar152._8_4_ ^ local_960._8_4_;
                          auVar135._12_4_ = auVar152._12_4_ ^ local_960._12_4_;
                          auVar135._16_4_ = auVar159._0_4_ ^ local_960._16_4_;
                          auVar135._20_4_ = auVar159._4_4_ ^ local_960._20_4_;
                          auVar135._24_4_ = auVar159._8_4_ ^ local_960._24_4_;
                          auVar135._28_4_ = auVar159._12_4_ ^ local_960._28_4_;
                        }
                        else {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar334 = ZEXT1664(auVar334._0_16_);
                            (*p_Var15)(&local_9f0);
                            auVar379 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar89._8_8_ = uStack_b18;
                          auVar89._0_8_ = local_b20;
                          auVar152 = vpcmpeqd_avx((undefined1  [16])0x0,auVar89);
                          auVar93._8_8_ = uStack_b08;
                          auVar93._0_8_ = local_b10;
                          auVar159 = vpcmpeqd_avx((undefined1  [16])0x0,auVar93);
                          auVar175._16_16_ = auVar159;
                          auVar175._0_16_ = auVar152;
                          auVar135._0_4_ = auVar152._0_4_ ^ local_960._0_4_;
                          auVar135._4_4_ = auVar152._4_4_ ^ local_960._4_4_;
                          auVar135._8_4_ = auVar152._8_4_ ^ local_960._8_4_;
                          auVar135._12_4_ = auVar152._12_4_ ^ local_960._12_4_;
                          auVar135._16_4_ = auVar159._0_4_ ^ local_960._16_4_;
                          auVar135._20_4_ = auVar159._4_4_ ^ local_960._20_4_;
                          auVar135._24_4_ = auVar159._8_4_ ^ local_960._24_4_;
                          auVar135._28_4_ = auVar159._12_4_ ^ local_960._28_4_;
                          auVar208._8_4_ = 0xff800000;
                          auVar208._0_8_ = 0xff800000ff800000;
                          auVar208._12_4_ = 0xff800000;
                          auVar208._16_4_ = 0xff800000;
                          auVar208._20_4_ = 0xff800000;
                          auVar208._24_4_ = 0xff800000;
                          auVar208._28_4_ = 0xff800000;
                          auVar129 = vblendvps_avx(auVar208,*(undefined1 (*) [32])
                                                             (local_9f0.ray + 0x100),auVar175);
                          *(undefined1 (*) [32])(local_9f0.ray + 0x100) = auVar129;
                        }
                        bVar79 = (auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar80 = (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar78 = (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar77 = SUB321(auVar135 >> 0x7f,0) != '\0';
                        bVar76 = (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar75 = SUB321(auVar135 >> 0xbf,0) != '\0';
                        bVar73 = (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar59 = auVar135[0x1f] < '\0';
                        uVar100 = (ulong)(((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76)
                                           || bVar75) || bVar73) || bVar59);
                        if (((((((!bVar79 && !bVar80) && !bVar78) && !bVar77) && !bVar76) && !bVar75
                             ) && !bVar73) && !bVar59) {
                          *(float *)(ray + k * 4 + 0x100) = fVar143;
                        }
                      }
                      auVar248 = ZEXT464((uint)local_ca0);
                      bVar59 = false;
                      goto LAB_01079366;
                    }
                  }
                  bVar59 = false;
                  uVar100 = 0;
                }
              }
LAB_01079366:
              auVar383 = ZEXT464((uint)fVar230);
              bVar99 = (byte)uVar100;
              if (!bVar59) goto LAB_01079706;
              lVar101 = lVar101 + -1;
            } while (lVar101 != 0);
            bVar99 = 0;
LAB_01079706:
            uVar100 = (ulong)(bVar99 & 1);
            uVar104 = CONCAT71(local_800._1_7_,local_800[0] | bVar99 & 1);
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar136._4_4_ = uVar7;
            auVar136._0_4_ = uVar7;
            auVar136._8_4_ = uVar7;
            auVar136._12_4_ = uVar7;
            auVar136._16_4_ = uVar7;
            auVar136._20_4_ = uVar7;
            auVar136._24_4_ = uVar7;
            auVar136._28_4_ = uVar7;
            auVar122 = vcmpps_avx(_local_7e0,auVar136,2);
            auVar129 = vandps_avx(auVar122,local_700);
            local_700 = local_700 & auVar122;
            uVar105 = local_720;
          } while ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_700 >> 0x7f,0) != '\0') ||
                     (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_700 >> 0xbf,0) != '\0') ||
                   (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_700[0x1f] < '\0');
        }
        auVar129 = vandps_avx(local_7a0,local_780);
        auVar122 = vandps_avx(_local_860,_local_840);
        auVar209._0_4_ = (float)local_9a0._0_4_ + local_2e0._0_4_;
        auVar209._4_4_ = (float)local_9a0._4_4_ + local_2e0._4_4_;
        auVar209._8_4_ = fStack_998 + local_2e0._8_4_;
        auVar209._12_4_ = fStack_994 + local_2e0._12_4_;
        auVar209._16_4_ = fStack_990 + local_2e0._16_4_;
        auVar209._20_4_ = fStack_98c + local_2e0._20_4_;
        auVar209._24_4_ = fStack_988 + local_2e0._24_4_;
        auVar209._28_4_ = fStack_984 + local_2e0._28_4_;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar247._4_4_ = uVar7;
        auVar247._0_4_ = uVar7;
        auVar247._8_4_ = uVar7;
        auVar247._12_4_ = uVar7;
        auVar247._16_4_ = uVar7;
        auVar247._20_4_ = uVar7;
        auVar247._24_4_ = uVar7;
        auVar247._28_4_ = uVar7;
        auVar20 = vcmpps_avx(auVar209,auVar247,2);
        auVar129 = vandps_avx(auVar20,auVar129);
        auVar266._0_4_ = (float)local_9a0._0_4_ + local_2a0._0_4_;
        auVar266._4_4_ = (float)local_9a0._4_4_ + local_2a0._4_4_;
        auVar266._8_4_ = fStack_998 + local_2a0._8_4_;
        auVar266._12_4_ = fStack_994 + local_2a0._12_4_;
        auVar266._16_4_ = fStack_990 + local_2a0._16_4_;
        auVar266._20_4_ = fStack_98c + local_2a0._20_4_;
        auVar266._24_4_ = fStack_988 + local_2a0._24_4_;
        auVar266._28_4_ = fStack_984 + local_2a0._28_4_;
        auVar20 = vcmpps_avx(auVar266,auVar247,2);
        auVar122 = vandps_avx(auVar20,auVar122);
        auVar122 = vorps_avx(auVar129,auVar122);
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0x7f,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar122 >> 0xbf,0) != '\0') ||
            (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar122[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar98 * 0x60) = auVar122;
          auVar129 = vblendvps_avx(_local_2a0,_local_2e0,auVar129);
          *(undefined1 (*) [32])(auStack_160 + uVar98 * 0x60) = auVar129;
          uVar8 = vmovlps_avx(local_880);
          *(undefined8 *)(afStack_140 + uVar98 * 0x18) = uVar8;
          auStack_138[uVar98 * 0x18] = (int)uVar105 + 1;
          uVar98 = (ulong)((int)uVar98 + 1);
        }
        auVar248 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar379 = ZEXT3264(local_820);
      }
    }
    do {
      uVar96 = (uint)uVar98;
      if (uVar96 == 0) {
        if ((uVar104 & 1) != 0) {
          return local_cc9;
        }
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar121._4_4_ = uVar7;
        auVar121._0_4_ = uVar7;
        auVar121._8_4_ = uVar7;
        auVar121._12_4_ = uVar7;
        auVar149 = vcmpps_avx(local_5f0,auVar121,2);
        uVar96 = vmovmskps_avx(auVar149);
        uVar96 = (uint)local_868 - 1 & (uint)local_868 & uVar96;
        local_cc9 = uVar96 != 0;
        if (!local_cc9) {
          return local_cc9;
        }
        goto LAB_01076984;
      }
      uVar98 = (ulong)(uVar96 - 1);
      lVar101 = uVar98 * 0x60;
      auVar129 = *(undefined1 (*) [32])(auStack_160 + lVar101);
      auVar127._0_4_ = (float)local_9a0._0_4_ + auVar129._0_4_;
      auVar127._4_4_ = (float)local_9a0._4_4_ + auVar129._4_4_;
      auVar127._8_4_ = fStack_998 + auVar129._8_4_;
      auVar127._12_4_ = fStack_994 + auVar129._12_4_;
      auVar127._16_4_ = fStack_990 + auVar129._16_4_;
      auVar127._20_4_ = fStack_98c + auVar129._20_4_;
      auVar127._24_4_ = fStack_988 + auVar129._24_4_;
      auVar127._28_4_ = fStack_984 + auVar129._28_4_;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar228._4_4_ = uVar7;
      auVar228._0_4_ = uVar7;
      auVar228._8_4_ = uVar7;
      auVar228._12_4_ = uVar7;
      auVar228._16_4_ = uVar7;
      auVar228._20_4_ = uVar7;
      auVar228._24_4_ = uVar7;
      auVar228._28_4_ = uVar7;
      auVar20 = vcmpps_avx(auVar127,auVar228,2);
      auVar122 = vandps_avx(auVar20,*(undefined1 (*) [32])(auStack_180 + lVar101));
      _local_5e0 = auVar122;
      auVar20 = *(undefined1 (*) [32])(auStack_180 + lVar101) & auVar20;
      bVar79 = (auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar80 = (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar77 = SUB321(auVar20 >> 0x7f,0) == '\0';
      bVar76 = (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar75 = SUB321(auVar20 >> 0xbf,0) == '\0';
      bVar73 = (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar59 = -1 < auVar20[0x1f];
      if (((((((!bVar79 || !bVar80) || !bVar78) || !bVar77) || !bVar76) || !bVar75) || !bVar73) ||
          !bVar59) {
        auVar201._8_4_ = 0x7f800000;
        auVar201._0_8_ = 0x7f8000007f800000;
        auVar201._12_4_ = 0x7f800000;
        auVar201._16_4_ = 0x7f800000;
        auVar201._20_4_ = 0x7f800000;
        auVar201._24_4_ = 0x7f800000;
        auVar201._28_4_ = 0x7f800000;
        auVar129 = vblendvps_avx(auVar201,auVar129,auVar122);
        auVar20 = vshufps_avx(auVar129,auVar129,0xb1);
        auVar20 = vminps_avx(auVar129,auVar20);
        auVar21 = vshufpd_avx(auVar20,auVar20,5);
        auVar20 = vminps_avx(auVar20,auVar21);
        auVar21 = vperm2f128_avx(auVar20,auVar20,1);
        auVar20 = vminps_avx(auVar20,auVar21);
        auVar129 = vcmpps_avx(auVar129,auVar20,0);
        auVar20 = auVar122 & auVar129;
        if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0x7f,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0xbf,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar20[0x1f] < '\0') {
          auVar122 = vandps_avx(auVar129,auVar122);
        }
        fVar143 = afStack_140[uVar98 * 0x18 + 1];
        uVar105 = (ulong)auStack_138[uVar98 * 0x18];
        uVar102 = vmovmskps_avx(auVar122);
        uVar97 = 0;
        if (uVar102 != 0) {
          for (; (uVar102 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
          }
        }
        fVar179 = afStack_140[uVar98 * 0x18];
        *(undefined4 *)(local_5e0 + (ulong)uVar97 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar101) = _local_5e0;
        uVar102 = uVar96 - 1;
        if ((((((((_local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_5e0 >> 0x7f,0) != '\0') ||
              (_local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_5e0 >> 0xbf,0) != '\0') ||
            (_local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_5e0[0x1f] < '\0') {
          uVar102 = uVar96;
        }
        auVar152 = vshufps_avx(ZEXT416((uint)(fVar143 - fVar179)),ZEXT416((uint)(fVar143 - fVar179))
                               ,0);
        local_2e0._4_4_ = fVar179 + auVar152._4_4_ * 0.14285715;
        local_2e0._0_4_ = fVar179 + auVar152._0_4_ * 0.0;
        fStack_2d8 = fVar179 + auVar152._8_4_ * 0.2857143;
        fStack_2d4 = fVar179 + auVar152._12_4_ * 0.42857146;
        fStack_2d0 = fVar179 + auVar152._0_4_ * 0.5714286;
        fStack_2cc = fVar179 + auVar152._4_4_ * 0.71428573;
        fStack_2c8 = fVar179 + auVar152._8_4_ * 0.8571429;
        fStack_2c4 = fVar179 + auVar152._12_4_;
        local_880._8_8_ = 0;
        local_880._0_8_ = *(ulong *)(local_2e0 + (ulong)uVar97 * 4);
        uVar98 = (ulong)uVar102;
      }
    } while (((((((bVar79 && bVar80) && bVar78) && bVar77) && bVar76) && bVar75) && bVar73) &&
             bVar59);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }